

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [16];
  Primitive PVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  Geometry *pGVar17;
  __int_type_conflict _Var18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  bool bVar109;
  bool bVar110;
  bool bVar111;
  bool bVar112;
  bool bVar113;
  bool bVar114;
  bool bVar115;
  bool bVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [28];
  undefined1 auVar131 [28];
  undefined1 auVar132 [28];
  undefined1 auVar133 [12];
  undefined1 auVar134 [28];
  undefined1 auVar135 [24];
  uint uVar136;
  uint uVar137;
  uint uVar138;
  ulong uVar139;
  ulong uVar140;
  uint uVar141;
  long lVar142;
  long lVar143;
  undefined1 auVar144 [8];
  float fVar145;
  float fVar169;
  float fVar172;
  vint4 bi_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar174;
  float fVar175;
  float fVar178;
  undefined1 auVar152 [32];
  float fVar170;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar150 [16];
  undefined1 auVar156 [32];
  undefined1 auVar151 [16];
  float fVar146;
  float fVar171;
  float fVar173;
  float fVar176;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar177;
  float fVar182;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  float fVar183;
  float fVar204;
  float fVar205;
  vint4 bi;
  undefined1 auVar189 [16];
  undefined1 auVar184 [16];
  float fVar207;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  float fVar206;
  float fVar208;
  float fVar209;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar188 [16];
  undefined1 auVar193 [32];
  float fVar210;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  float fVar221;
  float fVar223;
  vint4 bi_2;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  float fVar222;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar220 [64];
  float fVar228;
  float fVar241;
  float fVar243;
  vint4 ai_1;
  undefined1 auVar231 [16];
  float fVar245;
  undefined1 auVar232 [16];
  float fVar229;
  float fVar230;
  undefined1 auVar234 [16];
  undefined1 auVar233 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar242;
  float fVar244;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar261;
  float fVar264;
  vint4 ai_2;
  undefined1 auVar252 [16];
  float fVar266;
  undefined1 auVar253 [16];
  float fVar262;
  undefined1 auVar255 [16];
  float fVar263;
  float fVar265;
  float fVar267;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar268;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar269;
  float fVar280;
  float fVar282;
  undefined1 auVar271 [16];
  float fVar270;
  float fVar281;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [64];
  float fVar294;
  float fVar295;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar296;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  float fVar297;
  undefined1 auVar292 [32];
  float fVar298;
  undefined1 auVar293 [32];
  vint4 ai;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar308;
  float fVar309;
  undefined4 uVar310;
  float fVar316;
  float fVar317;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar318;
  undefined1 auVar315 [32];
  float fVar324;
  float fVar325;
  undefined1 auVar319 [16];
  float fVar326;
  float fVar327;
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar328 [16];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar333;
  float fVar334;
  undefined1 auVar332 [64];
  undefined1 auVar335 [16];
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar336 [32];
  float fVar341;
  float fVar350;
  undefined1 auVar342 [16];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [64];
  float fVar351;
  float fVar355;
  float fVar356;
  undefined1 auVar352 [16];
  float fVar357;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar358;
  float fVar359;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  undefined1 auVar361 [32];
  float fVar366;
  float fVar370;
  float fVar371;
  undefined1 auVar367 [16];
  float fVar372;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 uStack_928;
  RTCFilterFunctionNArguments local_910;
  undefined1 local_8e0 [8];
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [8];
  undefined8 uStack_8b8;
  undefined1 auStack_8b0 [8];
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 *local_7f8;
  undefined1 (*local_7f0) [16];
  undefined1 (*local_7e8) [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  LinearSpace3fa *local_630;
  Primitive *local_628;
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  uint local_4a0;
  uint local_49c;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined1 local_440 [32];
  float local_420 [4];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  RTCHitN local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar254 [16];
  undefined1 auVar343 [16];
  undefined1 auVar360 [16];
  
  PVar13 = prim[1];
  uVar139 = (ulong)(byte)PVar13;
  lVar21 = uVar139 * 0x25;
  fVar183 = *(float *)(prim + lVar21 + 0x12);
  auVar189 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar189 = vinsertps_avx(auVar189,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar215 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar215 = vinsertps_avx(auVar215,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar189 = vsubps_avx(auVar189,*(undefined1 (*) [16])(prim + lVar21 + 6));
  auVar184._0_4_ = fVar183 * auVar189._0_4_;
  auVar184._4_4_ = fVar183 * auVar189._4_4_;
  auVar184._8_4_ = fVar183 * auVar189._8_4_;
  auVar184._12_4_ = fVar183 * auVar189._12_4_;
  auVar299._0_4_ = fVar183 * auVar215._0_4_;
  auVar299._4_4_ = fVar183 * auVar215._4_4_;
  auVar299._8_4_ = fVar183 * auVar215._8_4_;
  auVar299._12_4_ = fVar183 * auVar215._12_4_;
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 4 + 6)));
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 5 + 6)));
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar216 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 6 + 6)));
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0xf + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + 6)));
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar139 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0x1a + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0x1b + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar139 * 0x1c + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vshufps_avx(auVar299,auVar299,0);
  auVar29 = vshufps_avx(auVar299,auVar299,0x55);
  auVar30 = vshufps_avx(auVar299,auVar299,0xaa);
  fVar183 = auVar30._0_4_;
  fVar204 = auVar30._4_4_;
  fVar205 = auVar30._8_4_;
  fVar207 = auVar30._12_4_;
  fVar249 = auVar29._0_4_;
  fVar261 = auVar29._4_4_;
  fVar264 = auVar29._8_4_;
  fVar266 = auVar29._12_4_;
  fVar228 = auVar28._0_4_;
  fVar241 = auVar28._4_4_;
  fVar243 = auVar28._8_4_;
  fVar245 = auVar28._12_4_;
  auVar342._0_4_ = fVar228 * auVar189._0_4_ + fVar249 * auVar215._0_4_ + fVar183 * auVar216._0_4_;
  auVar342._4_4_ = fVar241 * auVar189._4_4_ + fVar261 * auVar215._4_4_ + fVar204 * auVar216._4_4_;
  auVar342._8_4_ = fVar243 * auVar189._8_4_ + fVar264 * auVar215._8_4_ + fVar205 * auVar216._8_4_;
  auVar342._12_4_ =
       fVar245 * auVar189._12_4_ + fVar266 * auVar215._12_4_ + fVar207 * auVar216._12_4_;
  auVar352._0_4_ = fVar228 * auVar234._0_4_ + fVar249 * auVar23._0_4_ + auVar24._0_4_ * fVar183;
  auVar352._4_4_ = fVar241 * auVar234._4_4_ + fVar261 * auVar23._4_4_ + auVar24._4_4_ * fVar204;
  auVar352._8_4_ = fVar243 * auVar234._8_4_ + fVar264 * auVar23._8_4_ + auVar24._8_4_ * fVar205;
  auVar352._12_4_ = fVar245 * auVar234._12_4_ + fVar266 * auVar23._12_4_ + auVar24._12_4_ * fVar207;
  auVar300._0_4_ = fVar228 * auVar25._0_4_ + fVar249 * auVar26._0_4_ + auVar27._0_4_ * fVar183;
  auVar300._4_4_ = fVar241 * auVar25._4_4_ + fVar261 * auVar26._4_4_ + auVar27._4_4_ * fVar204;
  auVar300._8_4_ = fVar243 * auVar25._8_4_ + fVar264 * auVar26._8_4_ + auVar27._8_4_ * fVar205;
  auVar300._12_4_ = fVar245 * auVar25._12_4_ + fVar266 * auVar26._12_4_ + auVar27._12_4_ * fVar207;
  auVar28 = vshufps_avx(auVar184,auVar184,0);
  auVar29 = vshufps_avx(auVar184,auVar184,0x55);
  auVar30 = vshufps_avx(auVar184,auVar184,0xaa);
  fVar183 = auVar30._0_4_;
  fVar204 = auVar30._4_4_;
  fVar205 = auVar30._8_4_;
  fVar207 = auVar30._12_4_;
  fVar249 = auVar29._0_4_;
  fVar261 = auVar29._4_4_;
  fVar264 = auVar29._8_4_;
  fVar266 = auVar29._12_4_;
  fVar228 = auVar28._0_4_;
  fVar241 = auVar28._4_4_;
  fVar243 = auVar28._8_4_;
  fVar245 = auVar28._12_4_;
  auVar185._0_4_ = fVar228 * auVar189._0_4_ + fVar249 * auVar215._0_4_ + fVar183 * auVar216._0_4_;
  auVar185._4_4_ = fVar241 * auVar189._4_4_ + fVar261 * auVar215._4_4_ + fVar204 * auVar216._4_4_;
  auVar185._8_4_ = fVar243 * auVar189._8_4_ + fVar264 * auVar215._8_4_ + fVar205 * auVar216._8_4_;
  auVar185._12_4_ =
       fVar245 * auVar189._12_4_ + fVar266 * auVar215._12_4_ + fVar207 * auVar216._12_4_;
  auVar147._0_4_ = fVar228 * auVar234._0_4_ + auVar24._0_4_ * fVar183 + fVar249 * auVar23._0_4_;
  auVar147._4_4_ = fVar241 * auVar234._4_4_ + auVar24._4_4_ * fVar204 + fVar261 * auVar23._4_4_;
  auVar147._8_4_ = fVar243 * auVar234._8_4_ + auVar24._8_4_ * fVar205 + fVar264 * auVar23._8_4_;
  auVar147._12_4_ = fVar245 * auVar234._12_4_ + auVar24._12_4_ * fVar207 + fVar266 * auVar23._12_4_;
  auVar311._8_4_ = 0x7fffffff;
  auVar311._0_8_ = 0x7fffffff7fffffff;
  auVar311._12_4_ = 0x7fffffff;
  auVar189 = vandps_avx(auVar342,auVar311);
  auVar252._8_4_ = 0x219392ef;
  auVar252._0_8_ = 0x219392ef219392ef;
  auVar252._12_4_ = 0x219392ef;
  auVar189 = vcmpps_avx(auVar189,auVar252,1);
  auVar215 = vblendvps_avx(auVar342,auVar252,auVar189);
  auVar189 = vandps_avx(auVar352,auVar311);
  auVar189 = vcmpps_avx(auVar189,auVar252,1);
  auVar216 = vblendvps_avx(auVar352,auVar252,auVar189);
  auVar189 = vandps_avx(auVar311,auVar300);
  auVar189 = vcmpps_avx(auVar189,auVar252,1);
  auVar189 = vblendvps_avx(auVar300,auVar252,auVar189);
  auVar211._0_4_ = fVar228 * auVar25._0_4_ + fVar249 * auVar26._0_4_ + auVar27._0_4_ * fVar183;
  auVar211._4_4_ = fVar241 * auVar25._4_4_ + fVar261 * auVar26._4_4_ + auVar27._4_4_ * fVar204;
  auVar211._8_4_ = fVar243 * auVar25._8_4_ + fVar264 * auVar26._8_4_ + auVar27._8_4_ * fVar205;
  auVar211._12_4_ = fVar245 * auVar25._12_4_ + fVar266 * auVar26._12_4_ + auVar27._12_4_ * fVar207;
  auVar234 = vrcpps_avx(auVar215);
  fVar228 = auVar234._0_4_;
  auVar231._0_4_ = fVar228 * auVar215._0_4_;
  fVar241 = auVar234._4_4_;
  auVar231._4_4_ = fVar241 * auVar215._4_4_;
  fVar243 = auVar234._8_4_;
  auVar231._8_4_ = fVar243 * auVar215._8_4_;
  fVar245 = auVar234._12_4_;
  auVar231._12_4_ = fVar245 * auVar215._12_4_;
  auVar287._8_4_ = 0x3f800000;
  auVar287._0_8_ = &DAT_3f8000003f800000;
  auVar287._12_4_ = 0x3f800000;
  auVar215 = vsubps_avx(auVar287,auVar231);
  fVar228 = fVar228 + fVar228 * auVar215._0_4_;
  fVar241 = fVar241 + fVar241 * auVar215._4_4_;
  fVar243 = fVar243 + fVar243 * auVar215._8_4_;
  fVar245 = fVar245 + fVar245 * auVar215._12_4_;
  auVar215 = vrcpps_avx(auVar216);
  fVar249 = auVar215._0_4_;
  auVar271._0_4_ = fVar249 * auVar216._0_4_;
  fVar261 = auVar215._4_4_;
  auVar271._4_4_ = fVar261 * auVar216._4_4_;
  fVar264 = auVar215._8_4_;
  auVar271._8_4_ = fVar264 * auVar216._8_4_;
  fVar266 = auVar215._12_4_;
  auVar271._12_4_ = fVar266 * auVar216._12_4_;
  auVar215 = vsubps_avx(auVar287,auVar271);
  fVar249 = fVar249 + fVar249 * auVar215._0_4_;
  fVar261 = fVar261 + fVar261 * auVar215._4_4_;
  fVar264 = fVar264 + fVar264 * auVar215._8_4_;
  fVar266 = fVar266 + fVar266 * auVar215._12_4_;
  auVar215 = vrcpps_avx(auVar189);
  fVar269 = auVar215._0_4_;
  auVar301._0_4_ = fVar269 * auVar189._0_4_;
  fVar280 = auVar215._4_4_;
  auVar301._4_4_ = fVar280 * auVar189._4_4_;
  fVar282 = auVar215._8_4_;
  auVar301._8_4_ = fVar282 * auVar189._8_4_;
  fVar284 = auVar215._12_4_;
  auVar301._12_4_ = fVar284 * auVar189._12_4_;
  auVar189 = vsubps_avx(auVar287,auVar301);
  fVar269 = fVar269 + fVar269 * auVar189._0_4_;
  fVar280 = fVar280 + fVar280 * auVar189._4_4_;
  fVar282 = fVar282 + fVar282 * auVar189._8_4_;
  fVar284 = fVar284 + fVar284 * auVar189._12_4_;
  auVar189 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar21 + 0x16)) *
                           *(float *)(prim + lVar21 + 0x1a)));
  auVar216 = vshufps_avx(auVar189,auVar189,0);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar139 * 7 + 6);
  auVar189 = vpmovsxwd_avx(auVar189);
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + uVar139 * 0xb + 6);
  auVar215 = vpmovsxwd_avx(auVar215);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar234 = vsubps_avx(auVar215,auVar189);
  fVar183 = auVar216._0_4_;
  fVar204 = auVar216._4_4_;
  fVar205 = auVar216._8_4_;
  fVar207 = auVar216._12_4_;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar139 * 9 + 6);
  auVar215 = vpmovsxwd_avx(auVar216);
  auVar302._0_4_ = auVar234._0_4_ * fVar183 + auVar189._0_4_;
  auVar302._4_4_ = auVar234._4_4_ * fVar204 + auVar189._4_4_;
  auVar302._8_4_ = auVar234._8_4_ * fVar205 + auVar189._8_4_;
  auVar302._12_4_ = auVar234._12_4_ * fVar207 + auVar189._12_4_;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar139 * 0xd + 6);
  auVar216 = vpmovsxwd_avx(auVar234);
  auVar189 = vcvtdq2ps_avx(auVar215);
  auVar215 = vcvtdq2ps_avx(auVar216);
  auVar215 = vsubps_avx(auVar215,auVar189);
  auVar312._0_4_ = auVar215._0_4_ * fVar183 + auVar189._0_4_;
  auVar312._4_4_ = auVar215._4_4_ * fVar204 + auVar189._4_4_;
  auVar312._8_4_ = auVar215._8_4_ * fVar205 + auVar189._8_4_;
  auVar312._12_4_ = auVar215._12_4_ * fVar207 + auVar189._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar139 * 0x12 + 6);
  auVar189 = vpmovsxwd_avx(auVar23);
  uVar140 = (ulong)(uint)((int)(uVar139 * 5) << 2);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar139 * 2 + uVar140 + 6);
  auVar215 = vpmovsxwd_avx(auVar24);
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar215 = vsubps_avx(auVar215,auVar189);
  auVar319._0_4_ = auVar215._0_4_ * fVar183 + auVar189._0_4_;
  auVar319._4_4_ = auVar215._4_4_ * fVar204 + auVar189._4_4_;
  auVar319._8_4_ = auVar215._8_4_ * fVar205 + auVar189._8_4_;
  auVar319._12_4_ = auVar215._12_4_ * fVar207 + auVar189._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar140 + 6);
  auVar189 = vpmovsxwd_avx(auVar25);
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar139 * 0x18 + 6);
  auVar215 = vpmovsxwd_avx(auVar26);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar216 = vsubps_avx(auVar215,auVar189);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar139 * 0x1d + 6);
  auVar215 = vpmovsxwd_avx(auVar27);
  auVar328._0_4_ = auVar216._0_4_ * fVar183 + auVar189._0_4_;
  auVar328._4_4_ = auVar216._4_4_ * fVar204 + auVar189._4_4_;
  auVar328._8_4_ = auVar216._8_4_ * fVar205 + auVar189._8_4_;
  auVar328._12_4_ = auVar216._12_4_ * fVar207 + auVar189._12_4_;
  auVar189 = vcvtdq2ps_avx(auVar215);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar139 + (ulong)(byte)PVar13 * 0x20 + 6);
  auVar215 = vpmovsxwd_avx(auVar28);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar215 = vsubps_avx(auVar215,auVar189);
  auVar335._0_4_ = auVar215._0_4_ * fVar183 + auVar189._0_4_;
  auVar335._4_4_ = auVar215._4_4_ * fVar204 + auVar189._4_4_;
  auVar335._8_4_ = auVar215._8_4_ * fVar205 + auVar189._8_4_;
  auVar335._12_4_ = auVar215._12_4_ * fVar207 + auVar189._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar139) + 6);
  auVar189 = vpmovsxwd_avx(auVar29);
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar139 * 0x23 + 6);
  auVar215 = vpmovsxwd_avx(auVar30);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar215 = vsubps_avx(auVar215,auVar189);
  auVar288._0_4_ = auVar189._0_4_ + auVar215._0_4_ * fVar183;
  auVar288._4_4_ = auVar189._4_4_ + auVar215._4_4_ * fVar204;
  auVar288._8_4_ = auVar189._8_4_ + auVar215._8_4_ * fVar205;
  auVar288._12_4_ = auVar189._12_4_ + auVar215._12_4_ * fVar207;
  auVar189 = vsubps_avx(auVar302,auVar185);
  auVar303._0_4_ = fVar228 * auVar189._0_4_;
  auVar303._4_4_ = fVar241 * auVar189._4_4_;
  auVar303._8_4_ = fVar243 * auVar189._8_4_;
  auVar303._12_4_ = fVar245 * auVar189._12_4_;
  auVar189 = vsubps_avx(auVar312,auVar185);
  auVar186._0_4_ = fVar228 * auVar189._0_4_;
  auVar186._4_4_ = fVar241 * auVar189._4_4_;
  auVar186._8_4_ = fVar243 * auVar189._8_4_;
  auVar186._12_4_ = fVar245 * auVar189._12_4_;
  auVar189 = vsubps_avx(auVar319,auVar147);
  auVar232._0_4_ = fVar249 * auVar189._0_4_;
  auVar232._4_4_ = fVar261 * auVar189._4_4_;
  auVar232._8_4_ = fVar264 * auVar189._8_4_;
  auVar232._12_4_ = fVar266 * auVar189._12_4_;
  auVar189 = vsubps_avx(auVar328,auVar147);
  auVar148._0_4_ = fVar249 * auVar189._0_4_;
  auVar148._4_4_ = fVar261 * auVar189._4_4_;
  auVar148._8_4_ = fVar264 * auVar189._8_4_;
  auVar148._12_4_ = fVar266 * auVar189._12_4_;
  auVar189 = vsubps_avx(auVar335,auVar211);
  auVar253._0_4_ = fVar269 * auVar189._0_4_;
  auVar253._4_4_ = fVar280 * auVar189._4_4_;
  auVar253._8_4_ = fVar282 * auVar189._8_4_;
  auVar253._12_4_ = fVar284 * auVar189._12_4_;
  auVar189 = vsubps_avx(auVar288,auVar211);
  auVar212._0_4_ = fVar269 * auVar189._0_4_;
  auVar212._4_4_ = fVar280 * auVar189._4_4_;
  auVar212._8_4_ = fVar282 * auVar189._8_4_;
  auVar212._12_4_ = fVar284 * auVar189._12_4_;
  auVar189 = vpminsd_avx(auVar303,auVar186);
  auVar215 = vpminsd_avx(auVar232,auVar148);
  auVar189 = vmaxps_avx(auVar189,auVar215);
  auVar215 = vpminsd_avx(auVar253,auVar212);
  uVar310 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar313._4_4_ = uVar310;
  auVar313._0_4_ = uVar310;
  auVar313._8_4_ = uVar310;
  auVar313._12_4_ = uVar310;
  auVar215 = vmaxps_avx(auVar215,auVar313);
  auVar189 = vmaxps_avx(auVar189,auVar215);
  local_2f0._0_4_ = auVar189._0_4_ * 0.99999964;
  local_2f0._4_4_ = auVar189._4_4_ * 0.99999964;
  local_2f0._8_4_ = auVar189._8_4_ * 0.99999964;
  local_2f0._12_4_ = auVar189._12_4_ * 0.99999964;
  auVar189 = vpmaxsd_avx(auVar303,auVar186);
  auVar215 = vpmaxsd_avx(auVar232,auVar148);
  auVar189 = vminps_avx(auVar189,auVar215);
  auVar215 = vpmaxsd_avx(auVar253,auVar212);
  uVar310 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar213._4_4_ = uVar310;
  auVar213._0_4_ = uVar310;
  auVar213._8_4_ = uVar310;
  auVar213._12_4_ = uVar310;
  auVar215 = vminps_avx(auVar215,auVar213);
  auVar189 = vminps_avx(auVar189,auVar215);
  auVar149._0_4_ = auVar189._0_4_ * 1.0000004;
  auVar149._4_4_ = auVar189._4_4_ * 1.0000004;
  auVar149._8_4_ = auVar189._8_4_ * 1.0000004;
  auVar149._12_4_ = auVar189._12_4_ * 1.0000004;
  auVar189 = vpshufd_avx(ZEXT116((byte)PVar13),0);
  auVar215 = vpcmpgtd_avx(auVar189,_DAT_01ff0cf0);
  auVar189 = vcmpps_avx(local_2f0,auVar149,2);
  auVar189 = vandps_avx(auVar189,auVar215);
  uVar136 = vmovmskps_avx(auVar189);
  if (uVar136 != 0) {
    uVar136 = uVar136 & 0xff;
    local_630 = pre->ray_space + k;
    local_600 = mm_lookupmask_ps._16_8_;
    uStack_5f8 = mm_lookupmask_ps._24_8_;
    uStack_5f0 = mm_lookupmask_ps._16_8_;
    uStack_5e8 = mm_lookupmask_ps._24_8_;
    local_7e8 = (undefined1 (*) [32])&local_160;
    uVar141 = 1 << ((byte)k & 0x1f);
    local_7f0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar141 & 0xf) << 4));
    local_7f8 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar141 >> 4) * 0x10);
    local_628 = prim;
    do {
      lVar21 = 0;
      if (uVar136 != 0) {
        for (; (uVar136 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
        }
      }
      uVar14 = *(uint *)(local_628 + 2);
      uVar15 = *(uint *)(local_628 + lVar21 * 4 + 6);
      pGVar17 = (context->scene->geometries).items[uVar14].ptr;
      uVar139 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                                (ulong)uVar15 *
                                pGVar17[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar183 = (pGVar17->time_range).lower;
      fVar183 = pGVar17->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar183) /
                ((pGVar17->time_range).upper - fVar183));
      auVar189 = vroundss_avx(ZEXT416((uint)fVar183),ZEXT416((uint)fVar183),9);
      auVar189 = vminss_avx(auVar189,ZEXT416((uint)(pGVar17->fnumTimeSegments + -1.0)));
      auVar189 = vmaxss_avx(ZEXT816(0) << 0x20,auVar189);
      fVar183 = fVar183 - auVar189._0_4_;
      _Var18 = pGVar17[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar143 = (long)(int)auVar189._0_4_ * 0x38;
      lVar21 = *(long *)(_Var18 + 0x10 + lVar143);
      lVar142 = *(long *)(_Var18 + 0x38 + lVar143);
      lVar19 = *(long *)(_Var18 + 0x48 + lVar143);
      auVar189 = vshufps_avx(ZEXT416((uint)fVar183),ZEXT416((uint)fVar183),0);
      pfVar1 = (float *)(lVar142 + uVar139 * lVar19);
      fVar204 = auVar189._0_4_;
      fVar205 = auVar189._4_4_;
      fVar207 = auVar189._8_4_;
      fVar228 = auVar189._12_4_;
      pfVar2 = (float *)(lVar142 + (uVar139 + 1) * lVar19);
      pfVar3 = (float *)(lVar142 + (uVar139 + 2) * lVar19);
      pfVar4 = (float *)(lVar142 + lVar19 * (uVar139 + 3));
      lVar142 = *(long *)(_Var18 + lVar143);
      auVar189 = vshufps_avx(ZEXT416((uint)(1.0 - fVar183)),ZEXT416((uint)(1.0 - fVar183)),0);
      pfVar5 = (float *)(lVar142 + lVar21 * uVar139);
      fVar183 = auVar189._0_4_;
      fVar241 = auVar189._4_4_;
      fVar243 = auVar189._8_4_;
      fVar245 = auVar189._12_4_;
      pfVar6 = (float *)(lVar142 + lVar21 * (uVar139 + 1));
      pfVar7 = (float *)(lVar142 + lVar21 * (uVar139 + 2));
      pfVar8 = (float *)(lVar142 + lVar21 * (uVar139 + 3));
      uVar16 = (uint)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar21 = (long)(int)uVar16 * 0x44;
      fVar250 = fVar204 * *pfVar1 + fVar183 * *pfVar5;
      fVar262 = fVar205 * pfVar1[1] + fVar241 * pfVar5[1];
      auVar254._0_8_ = CONCAT44(fVar262,fVar250);
      auVar254._8_4_ = fVar207 * pfVar1[2] + fVar243 * pfVar5[2];
      auVar254._12_4_ = fVar228 * pfVar1[3] + fVar245 * pfVar5[3];
      fVar358 = fVar183 * *pfVar6 + fVar204 * *pfVar2;
      fVar362 = fVar241 * pfVar6[1] + fVar205 * pfVar2[1];
      auVar360._0_8_ = CONCAT44(fVar362,fVar358);
      auVar360._8_4_ = fVar243 * pfVar6[2] + fVar207 * pfVar2[2];
      auVar360._12_4_ = fVar245 * pfVar6[3] + fVar228 * pfVar2[3];
      local_680 = fVar183 * *pfVar7 + fVar204 * *pfVar3;
      fStack_67c = fVar241 * pfVar7[1] + fVar205 * pfVar3[1];
      auVar367._0_8_ = CONCAT44(fStack_67c,local_680);
      auVar367._8_4_ = fVar243 * pfVar7[2] + fVar207 * pfVar3[2];
      auVar367._12_4_ = fVar245 * pfVar7[3] + fVar228 * pfVar3[3];
      fVar341 = fVar183 * *pfVar8 + fVar204 * *pfVar4;
      fVar350 = fVar241 * pfVar8[1] + fVar205 * pfVar4[1];
      auVar343._0_8_ = CONCAT44(fVar350,fVar341);
      auVar343._8_4_ = fVar243 * pfVar8[2] + fVar207 * pfVar4[2];
      auVar343._12_4_ = fVar245 * pfVar8[3] + fVar228 * pfVar4[3];
      auVar189 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar234 = vinsertps_avx(auVar189,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar216 = vsubps_avx(auVar254,auVar234);
      auVar189 = vshufps_avx(auVar216,auVar216,0);
      auVar215 = vshufps_avx(auVar216,auVar216,0x55);
      auVar216 = vshufps_avx(auVar216,auVar216,0xaa);
      fVar183 = (local_630->vx).field_0.m128[0];
      fVar204 = (local_630->vx).field_0.m128[1];
      fVar205 = (local_630->vx).field_0.m128[2];
      fVar207 = (local_630->vx).field_0.m128[3];
      fVar228 = (local_630->vy).field_0.m128[0];
      fVar241 = (local_630->vy).field_0.m128[1];
      fVar243 = (local_630->vy).field_0.m128[2];
      fVar245 = (local_630->vy).field_0.m128[3];
      fVar249 = (local_630->vz).field_0.m128[0];
      fVar261 = (local_630->vz).field_0.m128[1];
      fVar264 = (local_630->vz).field_0.m128[2];
      fVar266 = (local_630->vz).field_0.m128[3];
      auVar233._0_8_ =
           CONCAT44(auVar189._4_4_ * fVar204 + auVar215._4_4_ * fVar241 + fVar261 * auVar216._4_4_,
                    auVar189._0_4_ * fVar183 + auVar215._0_4_ * fVar228 + fVar249 * auVar216._0_4_);
      auVar233._8_4_ =
           auVar189._8_4_ * fVar205 + auVar215._8_4_ * fVar243 + fVar264 * auVar216._8_4_;
      auVar233._12_4_ =
           auVar189._12_4_ * fVar207 + auVar215._12_4_ * fVar245 + fVar266 * auVar216._12_4_;
      auVar189 = vblendps_avx(auVar233,auVar254,8);
      auVar23 = vsubps_avx(auVar360,auVar234);
      auVar215 = vshufps_avx(auVar23,auVar23,0);
      auVar216 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar304._0_4_ = auVar215._0_4_ * fVar183 + auVar216._0_4_ * fVar228 + fVar249 * auVar23._0_4_
      ;
      auVar304._4_4_ = auVar215._4_4_ * fVar204 + auVar216._4_4_ * fVar241 + fVar261 * auVar23._4_4_
      ;
      auVar304._8_4_ = auVar215._8_4_ * fVar205 + auVar216._8_4_ * fVar243 + fVar264 * auVar23._8_4_
      ;
      auVar304._12_4_ =
           auVar215._12_4_ * fVar207 + auVar216._12_4_ * fVar245 + fVar266 * auVar23._12_4_;
      auVar215 = vblendps_avx(auVar304,auVar360,8);
      auVar24 = vsubps_avx(auVar367,auVar234);
      auVar216 = vshufps_avx(auVar24,auVar24,0);
      auVar23 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar314._0_4_ = auVar216._0_4_ * fVar183 + auVar23._0_4_ * fVar228 + auVar24._0_4_ * fVar249;
      auVar314._4_4_ = auVar216._4_4_ * fVar204 + auVar23._4_4_ * fVar241 + auVar24._4_4_ * fVar261;
      auVar314._8_4_ = auVar216._8_4_ * fVar205 + auVar23._8_4_ * fVar243 + auVar24._8_4_ * fVar264;
      auVar314._12_4_ =
           auVar216._12_4_ * fVar207 + auVar23._12_4_ * fVar245 + auVar24._12_4_ * fVar266;
      auVar216 = vblendps_avx(auVar314,auVar367,8);
      auVar24 = vsubps_avx(auVar343,auVar234);
      auVar234 = vshufps_avx(auVar24,auVar24,0);
      auVar23 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar187._0_4_ = auVar234._0_4_ * fVar183 + auVar23._0_4_ * fVar228 + fVar249 * auVar24._0_4_;
      auVar187._4_4_ = auVar234._4_4_ * fVar204 + auVar23._4_4_ * fVar241 + fVar261 * auVar24._4_4_;
      auVar187._8_4_ = auVar234._8_4_ * fVar205 + auVar23._8_4_ * fVar243 + fVar264 * auVar24._8_4_;
      auVar187._12_4_ =
           auVar234._12_4_ * fVar207 + auVar23._12_4_ * fVar245 + fVar266 * auVar24._12_4_;
      auVar234 = vblendps_avx(auVar187,auVar343,8);
      auVar255._8_4_ = 0x7fffffff;
      auVar255._0_8_ = 0x7fffffff7fffffff;
      auVar255._12_4_ = 0x7fffffff;
      auVar189 = vandps_avx(auVar189,auVar255);
      auVar215 = vandps_avx(auVar215,auVar255);
      auVar23 = vmaxps_avx(auVar189,auVar215);
      auVar189 = vandps_avx(auVar216,auVar255);
      auVar215 = vandps_avx(auVar234,auVar255);
      auVar189 = vmaxps_avx(auVar189,auVar215);
      auVar189 = vmaxps_avx(auVar23,auVar189);
      auVar215 = vmovshdup_avx(auVar189);
      auVar215 = vmaxss_avx(auVar215,auVar189);
      auVar189 = vshufpd_avx(auVar189,auVar189,1);
      auVar189 = vmaxss_avx(auVar189,auVar215);
      fVar245 = *(float *)(catmullrom_basis0 + lVar21 + 0x908);
      fVar249 = *(float *)(catmullrom_basis0 + lVar21 + 0x90c);
      fVar261 = *(float *)(catmullrom_basis0 + lVar21 + 0x910);
      fVar264 = *(float *)(catmullrom_basis0 + lVar21 + 0x914);
      fVar266 = *(float *)(catmullrom_basis0 + lVar21 + 0x918);
      fVar269 = *(float *)(catmullrom_basis0 + lVar21 + 0x91c);
      fVar280 = *(float *)(catmullrom_basis0 + lVar21 + 0x920);
      auVar215 = vshufps_avx(auVar314,auVar314,0);
      register0x00001250 = auVar215;
      _local_700 = auVar215;
      auVar216 = vshufps_avx(auVar314,auVar314,0x55);
      register0x00001290 = auVar216;
      _local_720 = auVar216;
      fVar183 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar21 + 0xd8c);
      fVar204 = *(float *)(catmullrom_basis0 + lVar21 + 0xd90);
      fVar205 = *(float *)(catmullrom_basis0 + lVar21 + 0xd94);
      fVar207 = *(float *)(catmullrom_basis0 + lVar21 + 0xd98);
      fVar228 = *(float *)(catmullrom_basis0 + lVar21 + 0xd9c);
      fVar241 = *(float *)(catmullrom_basis0 + lVar21 + 0xda0);
      fVar243 = *(float *)(catmullrom_basis0 + lVar21 + 0xda4);
      auVar130 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar21 + 0xd8c);
      auVar234 = vshufps_avx(auVar187,auVar187,0);
      register0x00001210 = auVar234;
      _local_560 = auVar234;
      fVar174 = auVar234._0_4_;
      fVar176 = auVar234._4_4_;
      fVar179 = auVar234._8_4_;
      fVar180 = auVar234._12_4_;
      fVar268 = auVar215._0_4_;
      fVar297 = auVar215._4_4_;
      fVar206 = auVar215._8_4_;
      fVar181 = auVar215._12_4_;
      auVar215 = vshufps_avx(auVar187,auVar187,0x55);
      register0x000014d0 = auVar215;
      _local_7a0 = auVar215;
      fVar175 = auVar215._0_4_;
      fVar178 = auVar215._4_4_;
      fVar230 = auVar215._8_4_;
      fVar242 = auVar215._12_4_;
      fVar210 = auVar216._0_4_;
      fVar221 = auVar216._4_4_;
      fVar223 = auVar216._8_4_;
      fVar225 = auVar216._12_4_;
      auVar215 = vshufps_avx(auVar367,auVar367,0xff);
      register0x00001450 = auVar215;
      _local_280 = auVar215;
      auVar216 = vshufps_avx(auVar343,auVar343,0xff);
      register0x00001390 = auVar216;
      _local_2a0 = auVar216;
      fVar244 = auVar216._0_4_;
      fVar294 = auVar216._4_4_;
      fVar295 = auVar216._8_4_;
      fVar296 = auVar216._12_4_;
      fVar229 = auVar215._0_4_;
      fVar208 = auVar215._4_4_;
      fVar324 = auVar215._8_4_;
      auVar216 = vshufps_avx(auVar304,auVar304,0);
      register0x00001310 = auVar216;
      _local_740 = auVar216;
      fVar282 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar21 + 0x484);
      fVar284 = *(float *)(catmullrom_basis0 + lVar21 + 0x488);
      fVar247 = *(float *)(catmullrom_basis0 + lVar21 + 0x48c);
      fVar337 = *(float *)(catmullrom_basis0 + lVar21 + 0x490);
      fVar286 = *(float *)(catmullrom_basis0 + lVar21 + 0x494);
      fVar338 = *(float *)(catmullrom_basis0 + lVar21 + 0x498);
      fVar177 = *(float *)(catmullrom_basis0 + lVar21 + 0x49c);
      auVar131 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar21 + 0x484);
      fVar251 = auVar216._0_4_;
      fVar263 = auVar216._4_4_;
      fVar265 = auVar216._8_4_;
      fVar267 = auVar216._12_4_;
      auVar216 = vshufps_avx(auVar304,auVar304,0x55);
      register0x000015d0 = auVar216;
      _local_8a0 = auVar216;
      fVar366 = auVar216._0_4_;
      fVar370 = auVar216._4_4_;
      fVar371 = auVar216._8_4_;
      fVar372 = auVar216._12_4_;
      auVar216 = vshufps_avx(auVar360,auVar360,0xff);
      register0x00001590 = auVar216;
      _local_2c0 = auVar216;
      fVar351 = auVar216._0_4_;
      fVar355 = auVar216._4_4_;
      fVar356 = auVar216._8_4_;
      fVar357 = auVar216._12_4_;
      auVar117._8_4_ = auVar233._8_4_;
      auVar117._0_8_ = auVar233._0_8_;
      auVar117._12_4_ = auVar233._12_4_;
      auVar216 = vshufps_avx(auVar117,auVar117,0);
      register0x00001350 = auVar216;
      _local_520 = auVar216;
      local_580 = *(float *)(catmullrom_basis0 + lVar21);
      fStack_57c = *(float *)(catmullrom_basis0 + lVar21 + 4);
      fStack_578 = *(float *)(catmullrom_basis0 + lVar21 + 8);
      fStack_574 = *(float *)(catmullrom_basis0 + lVar21 + 0xc);
      fStack_570 = *(float *)(catmullrom_basis0 + lVar21 + 0x10);
      fStack_56c = *(float *)(catmullrom_basis0 + lVar21 + 0x14);
      fStack_568 = *(float *)(catmullrom_basis0 + lVar21 + 0x18);
      fStack_564 = *(float *)(catmullrom_basis0 + lVar21 + 0x1c);
      fVar270 = auVar216._0_4_;
      fVar281 = auVar216._4_4_;
      fVar283 = auVar216._8_4_;
      fVar285 = auVar216._12_4_;
      auVar305._0_4_ =
           fVar270 * local_580 + fVar251 * fVar282 + fVar268 * fVar245 + fVar174 * fVar183;
      auVar305._4_4_ =
           fVar281 * fStack_57c + fVar263 * fVar284 + fVar297 * fVar249 + fVar176 * fVar204;
      auVar305._8_4_ =
           fVar283 * fStack_578 + fVar265 * fVar247 + fVar206 * fVar261 + fVar179 * fVar205;
      auVar305._12_4_ =
           fVar285 * fStack_574 + fVar267 * fVar337 + fVar181 * fVar264 + fVar180 * fVar207;
      auVar305._16_4_ =
           fVar270 * fStack_570 + fVar251 * fVar286 + fVar268 * fVar266 + fVar174 * fVar228;
      auVar305._20_4_ =
           fVar281 * fStack_56c + fVar263 * fVar338 + fVar297 * fVar269 + fVar176 * fVar241;
      auVar305._24_4_ =
           fVar283 * fStack_568 + fVar265 * fVar177 + fVar206 * fVar280 + fVar179 * fVar243;
      auVar305._28_4_ = fVar285 + fVar181 + fVar180 + 0.0;
      auVar216 = vshufps_avx(auVar117,auVar117,0x55);
      register0x00001290 = auVar216;
      _local_260 = auVar216;
      fVar298 = auVar216._0_4_;
      fVar222 = auVar216._4_4_;
      fVar224 = auVar216._8_4_;
      fVar226 = auVar216._12_4_;
      auVar344._0_4_ =
           fVar298 * local_580 + fVar366 * fVar282 + fVar210 * fVar245 + fVar175 * fVar183;
      auVar344._4_4_ =
           fVar222 * fStack_57c + fVar370 * fVar284 + fVar221 * fVar249 + fVar178 * fVar204;
      auVar344._8_4_ =
           fVar224 * fStack_578 + fVar371 * fVar247 + fVar223 * fVar261 + fVar230 * fVar205;
      auVar344._12_4_ =
           fVar226 * fStack_574 + fVar372 * fVar337 + fVar225 * fVar264 + fVar242 * fVar207;
      auVar344._16_4_ =
           fVar298 * fStack_570 + fVar366 * fVar286 + fVar210 * fVar266 + fVar175 * fVar228;
      auVar344._20_4_ =
           fVar222 * fStack_56c + fVar370 * fVar338 + fVar221 * fVar269 + fVar178 * fVar241;
      auVar344._24_4_ =
           fVar224 * fStack_568 + fVar371 * fVar177 + fVar223 * fVar280 + fVar230 * fVar243;
      auVar344._28_4_ = fVar225 + 0.0 + 0.0 + 0.0;
      auVar216 = vpermilps_avx(auVar254,0xff);
      register0x00001490 = auVar216;
      _local_2e0 = auVar216;
      fVar325 = auVar216._0_4_;
      fVar326 = auVar216._4_4_;
      fVar327 = auVar216._8_4_;
      auVar152._0_4_ =
           fVar351 * fVar282 + fVar229 * fVar245 + fVar244 * fVar183 + fVar325 * local_580;
      auVar152._4_4_ =
           fVar355 * fVar284 + fVar208 * fVar249 + fVar294 * fVar204 + fVar326 * fStack_57c;
      auVar152._8_4_ =
           fVar356 * fVar247 + fVar324 * fVar261 + fVar295 * fVar205 + fVar327 * fStack_578;
      auVar152._12_4_ =
           fVar357 * fVar337 + auVar215._12_4_ * fVar264 + fVar296 * fVar207 +
           auVar216._12_4_ * fStack_574;
      auVar152._16_4_ =
           fVar351 * fVar286 + fVar229 * fVar266 + fVar244 * fVar228 + fVar325 * fStack_570;
      auVar152._20_4_ =
           fVar355 * fVar338 + fVar208 * fVar269 + fVar294 * fVar241 + fVar326 * fStack_56c;
      auVar152._24_4_ =
           fVar356 * fVar177 + fVar324 * fVar280 + fVar295 * fVar243 + fVar327 * fStack_568;
      auVar152._28_4_ = 0;
      fVar282 = *(float *)(catmullrom_basis1 + lVar21 + 0x908);
      fVar284 = *(float *)(catmullrom_basis1 + lVar21 + 0x90c);
      fVar247 = *(float *)(catmullrom_basis1 + lVar21 + 0x910);
      fVar337 = *(float *)(catmullrom_basis1 + lVar21 + 0x914);
      fVar286 = *(float *)(catmullrom_basis1 + lVar21 + 0x918);
      fVar338 = *(float *)(catmullrom_basis1 + lVar21 + 0x91c);
      fVar177 = *(float *)(catmullrom_basis1 + lVar21 + 0x920);
      fVar339 = *(float *)(catmullrom_basis1 + lVar21 + 0xd8c);
      fVar182 = *(float *)(catmullrom_basis1 + lVar21 + 0xd90);
      fVar340 = *(float *)(catmullrom_basis1 + lVar21 + 0xd94);
      fVar333 = *(float *)(catmullrom_basis1 + lVar21 + 0xd98);
      fVar308 = *(float *)(catmullrom_basis1 + lVar21 + 0xd9c);
      fVar309 = *(float *)(catmullrom_basis1 + lVar21 + 0xda0);
      fVar246 = *(float *)(catmullrom_basis1 + lVar21 + 0xda4);
      fVar334 = *(float *)(catmullrom_basis1 + lVar21 + 0x484);
      fVar316 = *(float *)(catmullrom_basis1 + lVar21 + 0x488);
      fVar317 = *(float *)(catmullrom_basis1 + lVar21 + 0x48c);
      fVar248 = *(float *)(catmullrom_basis1 + lVar21 + 0x490);
      fVar318 = *(float *)(catmullrom_basis1 + lVar21 + 0x494);
      fVar145 = *(float *)(catmullrom_basis1 + lVar21 + 0x498);
      fVar170 = *(float *)(catmullrom_basis1 + lVar21 + 0x49c);
      fVar227 = *(float *)(catmullrom_basis1 + lVar21);
      fVar169 = *(float *)(catmullrom_basis1 + lVar21 + 4);
      fVar172 = *(float *)(catmullrom_basis1 + lVar21 + 8);
      fVar209 = *(float *)(catmullrom_basis1 + lVar21 + 0xc);
      fVar146 = *(float *)(catmullrom_basis1 + lVar21 + 0x10);
      fVar171 = *(float *)(catmullrom_basis1 + lVar21 + 0x14);
      fVar173 = *(float *)(catmullrom_basis1 + lVar21 + 0x18);
      auVar256._0_4_ = fVar270 * fVar227 + fVar251 * fVar334 + fVar282 * fVar268 + fVar339 * fVar174
      ;
      auVar256._4_4_ = fVar281 * fVar169 + fVar263 * fVar316 + fVar284 * fVar297 + fVar182 * fVar176
      ;
      auVar256._8_4_ = fVar283 * fVar172 + fVar265 * fVar317 + fVar247 * fVar206 + fVar340 * fVar179
      ;
      auVar256._12_4_ =
           fVar285 * fVar209 + fVar267 * fVar248 + fVar337 * fVar181 + fVar333 * fVar180;
      auVar256._16_4_ =
           fVar270 * fVar146 + fVar251 * fVar318 + fVar286 * fVar268 + fVar308 * fVar174;
      auVar256._20_4_ =
           fVar281 * fVar171 + fVar263 * fVar145 + fVar338 * fVar297 + fVar309 * fVar176;
      auVar256._24_4_ =
           fVar283 * fVar173 + fVar265 * fVar170 + fVar177 * fVar206 + fVar246 * fVar179;
      auVar256._28_4_ = fVar357 + fVar285 + 0.0 + 0.0;
      auVar235._0_4_ = fVar298 * fVar227 + fVar366 * fVar334 + fVar282 * fVar210 + fVar175 * fVar339
      ;
      auVar235._4_4_ = fVar222 * fVar169 + fVar370 * fVar316 + fVar284 * fVar221 + fVar178 * fVar182
      ;
      auVar235._8_4_ = fVar224 * fVar172 + fVar371 * fVar317 + fVar247 * fVar223 + fVar230 * fVar340
      ;
      auVar235._12_4_ =
           fVar226 * fVar209 + fVar372 * fVar248 + fVar337 * fVar225 + fVar242 * fVar333;
      auVar235._16_4_ =
           fVar298 * fVar146 + fVar366 * fVar318 + fVar286 * fVar210 + fVar175 * fVar308;
      auVar235._20_4_ =
           fVar222 * fVar171 + fVar370 * fVar145 + fVar338 * fVar221 + fVar178 * fVar309;
      auVar235._24_4_ =
           fVar224 * fVar173 + fVar371 * fVar170 + fVar177 * fVar223 + fVar230 * fVar246;
      auVar235._28_4_ = fVar226 + fVar285 + 0.0 + 0.0;
      local_7e0._0_4_ =
           fVar351 * fVar334 + fVar229 * fVar282 + fVar339 * fVar244 + fVar325 * fVar227;
      local_7e0._4_4_ =
           fVar355 * fVar316 + fVar208 * fVar284 + fVar182 * fVar294 + fVar326 * fVar169;
      fStack_7d8 = fVar356 * fVar317 + fVar324 * fVar247 + fVar340 * fVar295 + fVar327 * fVar172;
      fStack_7d4 = fVar357 * fVar248 + auVar215._12_4_ * fVar337 + fVar333 * fVar296 +
                   auVar216._12_4_ * fVar209;
      register0x00001450 =
           fVar351 * fVar318 + fVar229 * fVar286 + fVar308 * fVar244 + fVar325 * fVar146;
      register0x00001454 =
           fVar355 * fVar145 + fVar208 * fVar338 + fVar309 * fVar294 + fVar326 * fVar171;
      register0x00001458 =
           fVar356 * fVar170 + fVar324 * fVar177 + fVar246 * fVar295 + fVar327 * fVar173;
      register0x0000145c = fVar296 + fVar285 + 0.0 + fVar226;
      local_380 = vsubps_avx(auVar256,auVar305);
      auVar276 = vsubps_avx(auVar235,auVar344);
      fVar183 = local_380._0_4_;
      fVar204 = local_380._4_4_;
      auVar197._4_4_ = auVar344._4_4_ * fVar204;
      auVar197._0_4_ = auVar344._0_4_ * fVar183;
      fVar205 = local_380._8_4_;
      auVar197._8_4_ = auVar344._8_4_ * fVar205;
      fVar207 = local_380._12_4_;
      auVar197._12_4_ = auVar344._12_4_ * fVar207;
      fVar228 = local_380._16_4_;
      auVar197._16_4_ = auVar344._16_4_ * fVar228;
      fVar241 = local_380._20_4_;
      auVar197._20_4_ = auVar344._20_4_ * fVar241;
      fVar243 = local_380._24_4_;
      auVar197._24_4_ = auVar344._24_4_ * fVar243;
      auVar197._28_4_ = fVar226;
      fVar244 = auVar276._0_4_;
      fVar294 = auVar276._4_4_;
      auVar167._4_4_ = fVar294 * auVar305._4_4_;
      auVar167._0_4_ = fVar244 * auVar305._0_4_;
      fVar295 = auVar276._8_4_;
      auVar167._8_4_ = fVar295 * auVar305._8_4_;
      fVar296 = auVar276._12_4_;
      auVar167._12_4_ = fVar296 * auVar305._12_4_;
      fVar229 = auVar276._16_4_;
      auVar167._16_4_ = fVar229 * auVar305._16_4_;
      fVar208 = auVar276._20_4_;
      auVar167._20_4_ = fVar208 * auVar305._20_4_;
      fVar324 = auVar276._24_4_;
      auVar167._24_4_ = fVar324 * auVar305._24_4_;
      auVar167._28_4_ = auVar235._28_4_;
      auVar167 = vsubps_avx(auVar197,auVar167);
      auVar197 = vmaxps_avx(auVar152,_local_7e0);
      auVar156._4_4_ = auVar197._4_4_ * auVar197._4_4_ * (fVar204 * fVar204 + fVar294 * fVar294);
      auVar156._0_4_ = auVar197._0_4_ * auVar197._0_4_ * (fVar183 * fVar183 + fVar244 * fVar244);
      auVar156._8_4_ = auVar197._8_4_ * auVar197._8_4_ * (fVar205 * fVar205 + fVar295 * fVar295);
      auVar156._12_4_ = auVar197._12_4_ * auVar197._12_4_ * (fVar207 * fVar207 + fVar296 * fVar296);
      auVar156._16_4_ = auVar197._16_4_ * auVar197._16_4_ * (fVar228 * fVar228 + fVar229 * fVar229);
      auVar156._20_4_ = auVar197._20_4_ * auVar197._20_4_ * (fVar241 * fVar241 + fVar208 * fVar208);
      auVar156._24_4_ = auVar197._24_4_ * auVar197._24_4_ * (fVar243 * fVar243 + fVar324 * fVar324);
      auVar156._28_4_ = auVar256._28_4_ + auVar235._28_4_;
      auVar22._4_4_ = auVar167._4_4_ * auVar167._4_4_;
      auVar22._0_4_ = auVar167._0_4_ * auVar167._0_4_;
      auVar22._8_4_ = auVar167._8_4_ * auVar167._8_4_;
      auVar22._12_4_ = auVar167._12_4_ * auVar167._12_4_;
      auVar22._16_4_ = auVar167._16_4_ * auVar167._16_4_;
      auVar22._20_4_ = auVar167._20_4_ * auVar167._20_4_;
      auVar22._24_4_ = auVar167._24_4_ * auVar167._24_4_;
      auVar22._28_4_ = auVar167._28_4_;
      auVar197 = vcmpps_avx(auVar22,auVar156,2);
      auVar220 = ZEXT3264(auVar197);
      fVar229 = (float)(int)uVar16;
      _local_540 = ZEXT416((uint)fVar229);
      auVar215 = vshufps_avx(_local_540,_local_540,0);
      auVar236._16_16_ = auVar215;
      auVar236._0_16_ = auVar215;
      auVar167 = vcmpps_avx(_DAT_02020f40,auVar236,1);
      auVar240 = ZEXT3264(auVar167);
      auVar118._8_4_ = auVar233._8_4_;
      auVar118._0_8_ = auVar233._0_8_;
      auVar118._12_4_ = auVar233._12_4_;
      auVar215 = vpermilps_avx(auVar118,0xaa);
      register0x00001490 = auVar215;
      _local_840 = auVar215;
      auVar332 = ZEXT3264(_local_840);
      auVar216 = vpermilps_avx(auVar304,0xaa);
      register0x00001550 = auVar216;
      _local_320 = auVar216;
      auVar234 = vpermilps_avx(auVar314,0xaa);
      register0x00001590 = auVar234;
      _local_80 = auVar234;
      auVar23 = vpermilps_avx(auVar187,0xaa);
      register0x00001310 = auVar23;
      _local_6a0 = auVar23;
      auVar156 = auVar167 & auVar197;
      uVar141 = *(uint *)(ray + k * 4 + 0x60);
      auVar189 = ZEXT416((uint)(auVar189._0_4_ * 4.7683716e-07));
      local_7c0._0_16_ = auVar189;
      uStack_928 = auVar254._8_8_;
      fVar183 = fVar366;
      fVar204 = fVar370;
      fVar205 = fVar371;
      fVar207 = fVar372;
      fVar294 = fVar251;
      fVar295 = fVar263;
      fVar296 = fVar265;
      fVar228 = fVar175;
      fVar241 = fVar178;
      fVar243 = fVar230;
      fVar244 = fVar242;
      _local_6d0 = auVar343;
      _local_6c0 = auVar367;
      _local_6b0 = auVar360;
      if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar156 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar156 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar156 >> 0x7f,0) != '\0') ||
            (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar156 >> 0xbf,0) != '\0') ||
          (auVar156 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar156[0x1f] < '\0') {
        local_340 = vandps_avx(auVar197,auVar167);
        fVar324 = auVar215._0_4_;
        fVar325 = auVar215._4_4_;
        fVar326 = auVar215._8_4_;
        fVar327 = auVar215._12_4_;
        fVar351 = auVar216._0_4_;
        fVar355 = auVar216._4_4_;
        fVar356 = auVar216._8_4_;
        fVar357 = auVar216._12_4_;
        fVar359 = auVar234._0_4_;
        fVar363 = auVar234._4_4_;
        fVar364 = auVar234._8_4_;
        fVar365 = auVar234._12_4_;
        fVar228 = auVar23._0_4_;
        fVar241 = auVar23._4_4_;
        fVar243 = auVar23._8_4_;
        fVar244 = auVar23._12_4_;
        fVar208 = auVar167._28_4_ +
                  *(float *)(catmullrom_basis1 + lVar21 + 0x924) +
                  *(float *)(catmullrom_basis1 + lVar21 + 0x4a0);
        local_360._0_4_ =
             fVar324 * fVar227 + fVar351 * fVar334 + fVar359 * fVar282 + fVar339 * fVar228;
        local_360._4_4_ =
             fVar325 * fVar169 + fVar355 * fVar316 + fVar363 * fVar284 + fVar182 * fVar241;
        fStack_358 = fVar326 * fVar172 + fVar356 * fVar317 + fVar364 * fVar247 + fVar340 * fVar243;
        fStack_354 = fVar327 * fVar209 + fVar357 * fVar248 + fVar365 * fVar337 + fVar333 * fVar244;
        fStack_350 = fVar324 * fVar146 + fVar351 * fVar318 + fVar359 * fVar286 + fVar308 * fVar228;
        fStack_34c = fVar325 * fVar171 + fVar355 * fVar145 + fVar363 * fVar338 + fVar309 * fVar241;
        fStack_348 = fVar326 * fVar173 + fVar356 * fVar170 + fVar364 * fVar177 + fVar246 * fVar243;
        fStack_344 = local_340._28_4_ + fVar208;
        local_8e0._0_4_ = auVar131._0_4_;
        local_8e0._4_4_ = auVar131._4_4_;
        uStack_8d8._0_4_ = auVar131._8_4_;
        uStack_8d8._4_4_ = auVar131._12_4_;
        uStack_8d0._0_4_ = auVar131._16_4_;
        uStack_8d0._4_4_ = auVar131._20_4_;
        uStack_8c8._0_4_ = auVar131._24_4_;
        local_780._0_4_ = auVar130._0_4_;
        local_780._4_4_ = auVar130._4_4_;
        uStack_778._0_4_ = auVar130._8_4_;
        uStack_778._4_4_ = auVar130._12_4_;
        fStack_770 = auVar130._16_4_;
        fStack_76c = auVar130._20_4_;
        fStack_768 = auVar130._24_4_;
        fVar227 = fVar324 * local_580 +
                  fVar351 * (float)local_8e0._0_4_ +
                  fVar359 * fVar245 + fVar228 * (float)local_780._0_4_;
        fVar169 = fVar325 * fStack_57c +
                  fVar355 * (float)local_8e0._4_4_ +
                  fVar363 * fVar249 + fVar241 * (float)local_780._4_4_;
        fVar172 = fVar326 * fStack_578 +
                  fVar356 * (float)uStack_8d8 + fVar364 * fVar261 + fVar243 * (float)uStack_778;
        fVar146 = fVar327 * fStack_574 +
                  fVar357 * uStack_8d8._4_4_ + fVar365 * fVar264 + fVar244 * uStack_778._4_4_;
        fStack_670 = fVar324 * fStack_570 +
                     fVar351 * (float)uStack_8d0 + fVar359 * fVar266 + fVar228 * fStack_770;
        fStack_66c = fVar325 * fStack_56c +
                     fVar355 * uStack_8d0._4_4_ + fVar363 * fVar269 + fVar241 * fStack_76c;
        fStack_668 = fVar326 * fStack_568 +
                     fVar356 * (float)uStack_8c8 + fVar364 * fVar280 + fVar243 * fStack_768;
        fStack_664 = fStack_344 + fVar208 + local_340._28_4_ + auVar167._28_4_;
        fVar245 = *(float *)(catmullrom_basis0 + lVar21 + 0x1210);
        fVar249 = *(float *)(catmullrom_basis0 + lVar21 + 0x1214);
        fVar261 = *(float *)(catmullrom_basis0 + lVar21 + 0x1218);
        fVar264 = *(float *)(catmullrom_basis0 + lVar21 + 0x121c);
        fVar266 = *(float *)(catmullrom_basis0 + lVar21 + 0x1220);
        fVar269 = *(float *)(catmullrom_basis0 + lVar21 + 0x1224);
        fVar280 = *(float *)(catmullrom_basis0 + lVar21 + 0x1228);
        fVar282 = *(float *)(catmullrom_basis0 + lVar21 + 0x1694);
        fVar284 = *(float *)(catmullrom_basis0 + lVar21 + 0x1698);
        fVar247 = *(float *)(catmullrom_basis0 + lVar21 + 0x169c);
        fVar337 = *(float *)(catmullrom_basis0 + lVar21 + 0x16a0);
        fVar286 = *(float *)(catmullrom_basis0 + lVar21 + 0x16a4);
        fVar338 = *(float *)(catmullrom_basis0 + lVar21 + 0x16a8);
        fVar177 = *(float *)(catmullrom_basis0 + lVar21 + 0x16ac);
        fVar339 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b18);
        fVar182 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b1c);
        fVar340 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b20);
        fVar333 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b24);
        fVar308 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b28);
        fVar309 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b2c);
        fVar246 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b30);
        fVar334 = *(float *)(catmullrom_basis0 + lVar21 + 0x1f9c);
        fVar316 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fa0);
        fVar317 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fa4);
        fVar248 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fa8);
        fVar318 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fac);
        fVar145 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fb0);
        fVar170 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fb4);
        fVar171 = *(float *)(catmullrom_basis1 + lVar21 + 0x4a0) + 0.0;
        fVar209 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar21 + 0x1fb8);
        fVar173 = *(float *)(catmullrom_basis0 + lVar21 + 0x16b0) + fVar209;
        local_8e0._4_4_ =
             fVar281 * fVar249 + fVar263 * fVar284 + fVar297 * fVar182 + fVar176 * fVar316;
        local_8e0._0_4_ =
             fVar270 * fVar245 + fVar251 * fVar282 + fVar268 * fVar339 + fVar174 * fVar334;
        uStack_8d8._0_4_ =
             fVar283 * fVar261 + fVar265 * fVar247 + fVar206 * fVar340 + fVar179 * fVar317;
        uStack_8d8._4_4_ =
             fVar285 * fVar264 + fVar267 * fVar337 + fVar181 * fVar333 + fVar180 * fVar248;
        uStack_8d0._0_4_ =
             fVar270 * fVar266 + fVar251 * fVar286 + fVar268 * fVar308 + fVar174 * fVar318;
        uStack_8d0._4_4_ =
             fVar281 * fVar269 + fVar263 * fVar338 + fVar297 * fVar309 + fVar176 * fVar145;
        uStack_8c8._0_4_ =
             fVar283 * fVar280 + fVar265 * fVar177 + fVar206 * fVar246 + fVar179 * fVar170;
        uStack_8c8._4_4_ =
             *(float *)(catmullrom_basis0 + lVar21 + 0x16b0) +
             *(float *)(catmullrom_basis0 + lVar21 + 0x1fb8) + fVar171;
        auVar191._0_4_ =
             fVar298 * fVar245 + fVar366 * fVar282 + fVar210 * fVar339 + fVar175 * fVar334;
        auVar191._4_4_ =
             fVar222 * fVar249 + fVar370 * fVar284 + fVar221 * fVar182 + fVar178 * fVar316;
        auVar191._8_4_ =
             fVar224 * fVar261 + fVar371 * fVar247 + fVar223 * fVar340 + fVar230 * fVar317;
        auVar191._12_4_ =
             fVar226 * fVar264 + fVar372 * fVar337 + fVar225 * fVar333 + fVar242 * fVar248;
        auVar191._16_4_ =
             fVar298 * fVar266 + fVar366 * fVar286 + fVar210 * fVar308 + fVar175 * fVar318;
        auVar191._20_4_ =
             fVar222 * fVar269 + fVar370 * fVar338 + fVar221 * fVar309 + fVar178 * fVar145;
        auVar191._24_4_ =
             fVar224 * fVar280 + fVar371 * fVar177 + fVar223 * fVar246 + fVar230 * fVar170;
        auVar191._28_4_ = fVar209 + fVar171 + *(float *)(catmullrom_basis1 + lVar21 + 0x1c) + 0.0;
        auVar272._0_4_ =
             fVar324 * fVar245 + fVar351 * fVar282 + fVar359 * fVar339 + fVar228 * fVar334;
        auVar272._4_4_ =
             fVar325 * fVar249 + fVar355 * fVar284 + fVar363 * fVar182 + fVar241 * fVar316;
        auVar272._8_4_ =
             fVar326 * fVar261 + fVar356 * fVar247 + fVar364 * fVar340 + fVar243 * fVar317;
        auVar272._12_4_ =
             fVar327 * fVar264 + fVar357 * fVar337 + fVar365 * fVar333 + fVar244 * fVar248;
        auVar272._16_4_ =
             fVar324 * fVar266 + fVar351 * fVar286 + fVar359 * fVar308 + fVar228 * fVar318;
        auVar272._20_4_ =
             fVar325 * fVar269 + fVar355 * fVar338 + fVar363 * fVar309 + fVar241 * fVar145;
        auVar272._24_4_ =
             fVar326 * fVar280 + fVar356 * fVar177 + fVar364 * fVar246 + fVar243 * fVar170;
        auVar272._28_4_ = *(float *)(catmullrom_basis0 + lVar21 + 0x122c) + fVar173;
        fVar245 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b18);
        fVar249 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b1c);
        fVar261 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b20);
        fVar264 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b24);
        fVar266 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b28);
        fVar269 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b2c);
        fVar280 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b30);
        fVar282 = *(float *)(catmullrom_basis1 + lVar21 + 0x1f9c);
        fVar284 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fa0);
        fVar247 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fa4);
        fVar337 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fa8);
        fVar286 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fac);
        fVar338 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fb0);
        fVar177 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fb4);
        fVar339 = *(float *)(catmullrom_basis1 + lVar21 + 0x1694);
        fVar182 = *(float *)(catmullrom_basis1 + lVar21 + 0x1698);
        fVar340 = *(float *)(catmullrom_basis1 + lVar21 + 0x169c);
        fVar333 = *(float *)(catmullrom_basis1 + lVar21 + 0x16a0);
        fVar308 = *(float *)(catmullrom_basis1 + lVar21 + 0x16a4);
        fVar309 = *(float *)(catmullrom_basis1 + lVar21 + 0x16a8);
        fVar246 = *(float *)(catmullrom_basis1 + lVar21 + 0x16ac);
        fVar334 = *(float *)(catmullrom_basis1 + lVar21 + 0x1210);
        fVar316 = *(float *)(catmullrom_basis1 + lVar21 + 0x1214);
        fVar317 = *(float *)(catmullrom_basis1 + lVar21 + 0x1218);
        fVar248 = *(float *)(catmullrom_basis1 + lVar21 + 0x121c);
        fVar318 = *(float *)(catmullrom_basis1 + lVar21 + 0x1220);
        fVar145 = *(float *)(catmullrom_basis1 + lVar21 + 0x1224);
        fVar170 = *(float *)(catmullrom_basis1 + lVar21 + 0x1228);
        auVar289._0_4_ =
             fVar334 * fVar270 + fVar251 * fVar339 + fVar268 * fVar245 + fVar174 * fVar282;
        auVar289._4_4_ =
             fVar316 * fVar281 + fVar263 * fVar182 + fVar297 * fVar249 + fVar176 * fVar284;
        auVar289._8_4_ =
             fVar317 * fVar283 + fVar265 * fVar340 + fVar206 * fVar261 + fVar179 * fVar247;
        auVar289._12_4_ =
             fVar248 * fVar285 + fVar267 * fVar333 + fVar181 * fVar264 + fVar180 * fVar337;
        auVar289._16_4_ =
             fVar318 * fVar270 + fVar251 * fVar308 + fVar268 * fVar266 + fVar174 * fVar286;
        auVar289._20_4_ =
             fVar145 * fVar281 + fVar263 * fVar309 + fVar297 * fVar269 + fVar176 * fVar338;
        auVar289._24_4_ =
             fVar170 * fVar283 + fVar265 * fVar246 + fVar206 * fVar280 + fVar179 * fVar177;
        auVar289._28_4_ = fVar181 + fVar181 + fVar285 + fVar173;
        auVar320._0_4_ =
             fVar298 * fVar334 + fVar366 * fVar339 + fVar210 * fVar245 + fVar175 * fVar282;
        auVar320._4_4_ =
             fVar222 * fVar316 + fVar370 * fVar182 + fVar221 * fVar249 + fVar178 * fVar284;
        auVar320._8_4_ =
             fVar224 * fVar317 + fVar371 * fVar340 + fVar223 * fVar261 + fVar230 * fVar247;
        auVar320._12_4_ =
             fVar226 * fVar248 + fVar372 * fVar333 + fVar225 * fVar264 + fVar242 * fVar337;
        auVar320._16_4_ =
             fVar298 * fVar318 + fVar366 * fVar308 + fVar210 * fVar266 + fVar175 * fVar286;
        auVar320._20_4_ =
             fVar222 * fVar145 + fVar370 * fVar309 + fVar221 * fVar269 + fVar178 * fVar338;
        auVar320._24_4_ =
             fVar224 * fVar170 + fVar371 * fVar246 + fVar223 * fVar280 + fVar230 * fVar177;
        auVar320._28_4_ = fVar181 + fVar181 + fVar181 + fVar285;
        auVar219._0_4_ =
             fVar324 * fVar334 + fVar351 * fVar339 + fVar359 * fVar245 + fVar282 * fVar228;
        auVar219._4_4_ =
             fVar325 * fVar316 + fVar355 * fVar182 + fVar363 * fVar249 + fVar284 * fVar241;
        auVar219._8_4_ =
             fVar326 * fVar317 + fVar356 * fVar340 + fVar364 * fVar261 + fVar247 * fVar243;
        auVar219._12_4_ =
             fVar327 * fVar248 + fVar357 * fVar333 + fVar365 * fVar264 + fVar337 * fVar244;
        auVar219._16_4_ =
             fVar324 * fVar318 + fVar351 * fVar308 + fVar359 * fVar266 + fVar286 * fVar228;
        auVar219._20_4_ =
             fVar325 * fVar145 + fVar355 * fVar309 + fVar363 * fVar269 + fVar338 * fVar241;
        auVar219._24_4_ =
             fVar326 * fVar170 + fVar356 * fVar246 + fVar364 * fVar280 + fVar177 * fVar243;
        auVar219._28_4_ =
             *(float *)(catmullrom_basis1 + lVar21 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar21 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar21 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar21 + 0x1fb8);
        auVar257._8_4_ = 0x7fffffff;
        auVar257._0_8_ = 0x7fffffff7fffffff;
        auVar257._12_4_ = 0x7fffffff;
        auVar257._16_4_ = 0x7fffffff;
        auVar257._20_4_ = 0x7fffffff;
        auVar257._24_4_ = 0x7fffffff;
        auVar257._28_4_ = 0x7fffffff;
        auVar197 = vandps_avx(_local_8e0,auVar257);
        auVar167 = vandps_avx(auVar191,auVar257);
        auVar167 = vmaxps_avx(auVar197,auVar167);
        auVar197 = vandps_avx(auVar272,auVar257);
        auVar197 = vmaxps_avx(auVar167,auVar197);
        auVar189 = vpermilps_avx(auVar189,0);
        auVar273._16_16_ = auVar189;
        auVar273._0_16_ = auVar189;
        auVar197 = vcmpps_avx(auVar197,auVar273,1);
        auVar156 = vblendvps_avx(_local_8e0,local_380,auVar197);
        auVar22 = vblendvps_avx(auVar191,auVar276,auVar197);
        auVar197 = vandps_avx(auVar289,auVar257);
        auVar167 = vandps_avx(auVar320,auVar257);
        auVar236 = vmaxps_avx(auVar197,auVar167);
        auVar197 = vandps_avx(auVar219,auVar257);
        auVar197 = vmaxps_avx(auVar236,auVar197);
        auVar236 = vcmpps_avx(auVar197,auVar273,1);
        auVar197 = vblendvps_avx(auVar289,local_380,auVar236);
        auVar276 = vblendvps_avx(auVar320,auVar276,auVar236);
        fVar145 = auVar156._0_4_;
        fVar170 = auVar156._4_4_;
        fVar209 = auVar156._8_4_;
        fVar171 = auVar156._12_4_;
        fVar173 = auVar156._16_4_;
        fVar175 = auVar156._20_4_;
        fVar178 = auVar156._24_4_;
        fVar268 = -auVar156._28_4_;
        fVar230 = auVar197._0_4_;
        fVar242 = auVar197._4_4_;
        fVar244 = auVar197._8_4_;
        fVar174 = auVar197._12_4_;
        fVar176 = auVar197._16_4_;
        fVar179 = auVar197._20_4_;
        fVar180 = auVar197._24_4_;
        fVar228 = auVar22._0_4_;
        fVar249 = auVar22._4_4_;
        fVar269 = auVar22._8_4_;
        fVar247 = auVar22._12_4_;
        fVar177 = auVar22._16_4_;
        fVar333 = auVar22._20_4_;
        fVar334 = auVar22._24_4_;
        auVar153._0_4_ = fVar228 * fVar228 + fVar145 * fVar145;
        auVar153._4_4_ = fVar249 * fVar249 + fVar170 * fVar170;
        auVar153._8_4_ = fVar269 * fVar269 + fVar209 * fVar209;
        auVar153._12_4_ = fVar247 * fVar247 + fVar171 * fVar171;
        auVar153._16_4_ = fVar177 * fVar177 + fVar173 * fVar173;
        auVar153._20_4_ = fVar333 * fVar333 + fVar175 * fVar175;
        auVar153._24_4_ = fVar334 * fVar334 + fVar178 * fVar178;
        auVar153._28_4_ = auVar320._28_4_ + auVar156._28_4_;
        auVar156 = vrsqrtps_avx(auVar153);
        fVar241 = auVar156._0_4_;
        fVar243 = auVar156._4_4_;
        auVar31._4_4_ = fVar243 * 1.5;
        auVar31._0_4_ = fVar241 * 1.5;
        fVar245 = auVar156._8_4_;
        auVar31._8_4_ = fVar245 * 1.5;
        fVar261 = auVar156._12_4_;
        auVar31._12_4_ = fVar261 * 1.5;
        fVar264 = auVar156._16_4_;
        auVar31._16_4_ = fVar264 * 1.5;
        fVar266 = auVar156._20_4_;
        auVar31._20_4_ = fVar266 * 1.5;
        fVar280 = auVar156._24_4_;
        fVar318 = auVar167._28_4_;
        auVar31._24_4_ = fVar280 * 1.5;
        auVar31._28_4_ = fVar318;
        auVar32._4_4_ = fVar243 * fVar243 * fVar243 * auVar153._4_4_ * 0.5;
        auVar32._0_4_ = fVar241 * fVar241 * fVar241 * auVar153._0_4_ * 0.5;
        auVar32._8_4_ = fVar245 * fVar245 * fVar245 * auVar153._8_4_ * 0.5;
        auVar32._12_4_ = fVar261 * fVar261 * fVar261 * auVar153._12_4_ * 0.5;
        auVar32._16_4_ = fVar264 * fVar264 * fVar264 * auVar153._16_4_ * 0.5;
        auVar32._20_4_ = fVar266 * fVar266 * fVar266 * auVar153._20_4_ * 0.5;
        auVar32._24_4_ = fVar280 * fVar280 * fVar280 * auVar153._24_4_ * 0.5;
        auVar32._28_4_ = auVar153._28_4_;
        auVar167 = vsubps_avx(auVar31,auVar32);
        fVar241 = auVar167._0_4_;
        fVar261 = auVar167._4_4_;
        fVar280 = auVar167._8_4_;
        fVar337 = auVar167._12_4_;
        fVar339 = auVar167._16_4_;
        fVar308 = auVar167._20_4_;
        fVar316 = auVar167._24_4_;
        fVar243 = auVar276._0_4_;
        fVar264 = auVar276._4_4_;
        fVar282 = auVar276._8_4_;
        fVar286 = auVar276._12_4_;
        fVar182 = auVar276._16_4_;
        fVar309 = auVar276._20_4_;
        fVar317 = auVar276._24_4_;
        auVar154._0_4_ = fVar243 * fVar243 + fVar230 * fVar230;
        auVar154._4_4_ = fVar264 * fVar264 + fVar242 * fVar242;
        auVar154._8_4_ = fVar282 * fVar282 + fVar244 * fVar244;
        auVar154._12_4_ = fVar286 * fVar286 + fVar174 * fVar174;
        auVar154._16_4_ = fVar182 * fVar182 + fVar176 * fVar176;
        auVar154._20_4_ = fVar309 * fVar309 + fVar179 * fVar179;
        auVar154._24_4_ = fVar317 * fVar317 + fVar180 * fVar180;
        auVar154._28_4_ = auVar197._28_4_ + auVar167._28_4_;
        auVar197 = vrsqrtps_avx(auVar154);
        fVar245 = auVar197._0_4_;
        fVar266 = auVar197._4_4_;
        auVar33._4_4_ = fVar266 * 1.5;
        auVar33._0_4_ = fVar245 * 1.5;
        fVar284 = auVar197._8_4_;
        auVar33._8_4_ = fVar284 * 1.5;
        fVar338 = auVar197._12_4_;
        auVar33._12_4_ = fVar338 * 1.5;
        fVar340 = auVar197._16_4_;
        auVar33._16_4_ = fVar340 * 1.5;
        fVar246 = auVar197._20_4_;
        auVar33._20_4_ = fVar246 * 1.5;
        fVar248 = auVar197._24_4_;
        auVar33._24_4_ = fVar248 * 1.5;
        auVar33._28_4_ = fVar318;
        auVar34._4_4_ = fVar266 * fVar266 * fVar266 * auVar154._4_4_ * 0.5;
        auVar34._0_4_ = fVar245 * fVar245 * fVar245 * auVar154._0_4_ * 0.5;
        auVar34._8_4_ = fVar284 * fVar284 * fVar284 * auVar154._8_4_ * 0.5;
        auVar34._12_4_ = fVar338 * fVar338 * fVar338 * auVar154._12_4_ * 0.5;
        auVar34._16_4_ = fVar340 * fVar340 * fVar340 * auVar154._16_4_ * 0.5;
        auVar34._20_4_ = fVar246 * fVar246 * fVar246 * auVar154._20_4_ * 0.5;
        auVar34._24_4_ = fVar248 * fVar248 * fVar248 * auVar154._24_4_ * 0.5;
        auVar34._28_4_ = auVar154._28_4_;
        auVar197 = vsubps_avx(auVar33,auVar34);
        fVar245 = auVar197._0_4_;
        fVar266 = auVar197._4_4_;
        fVar284 = auVar197._8_4_;
        fVar338 = auVar197._12_4_;
        fVar340 = auVar197._16_4_;
        fVar246 = auVar197._20_4_;
        fVar248 = auVar197._24_4_;
        fVar228 = auVar152._0_4_ * fVar228 * fVar241;
        fVar249 = auVar152._4_4_ * fVar249 * fVar261;
        auVar35._4_4_ = fVar249;
        auVar35._0_4_ = fVar228;
        fVar269 = auVar152._8_4_ * fVar269 * fVar280;
        auVar35._8_4_ = fVar269;
        fVar247 = auVar152._12_4_ * fVar247 * fVar337;
        auVar35._12_4_ = fVar247;
        fVar177 = auVar152._16_4_ * fVar177 * fVar339;
        auVar35._16_4_ = fVar177;
        fVar333 = auVar152._20_4_ * fVar333 * fVar308;
        auVar35._20_4_ = fVar333;
        fVar334 = auVar152._24_4_ * fVar334 * fVar316;
        auVar35._24_4_ = fVar334;
        auVar35._28_4_ = fVar318;
        local_780._4_4_ = fVar249 + auVar305._4_4_;
        local_780._0_4_ = fVar228 + auVar305._0_4_;
        uStack_778._0_4_ = fVar269 + auVar305._8_4_;
        uStack_778._4_4_ = fVar247 + auVar305._12_4_;
        fStack_770 = fVar177 + auVar305._16_4_;
        fStack_76c = fVar333 + auVar305._20_4_;
        fStack_768 = fVar334 + auVar305._24_4_;
        fStack_764 = fVar318 + auVar305._28_4_;
        fVar228 = auVar152._0_4_ * fVar241 * -fVar145;
        fVar249 = auVar152._4_4_ * fVar261 * -fVar170;
        auVar36._4_4_ = fVar249;
        auVar36._0_4_ = fVar228;
        fVar269 = auVar152._8_4_ * fVar280 * -fVar209;
        auVar36._8_4_ = fVar269;
        fVar247 = auVar152._12_4_ * fVar337 * -fVar171;
        auVar36._12_4_ = fVar247;
        fVar177 = auVar152._16_4_ * fVar339 * -fVar173;
        auVar36._16_4_ = fVar177;
        fVar333 = auVar152._20_4_ * fVar308 * -fVar175;
        auVar36._20_4_ = fVar333;
        fVar334 = auVar152._24_4_ * fVar316 * -fVar178;
        auVar36._24_4_ = fVar334;
        auVar36._28_4_ = fVar268;
        local_8e0._4_4_ = auVar344._4_4_ + fVar249;
        local_8e0._0_4_ = auVar344._0_4_ + fVar228;
        uStack_8d8._0_4_ = auVar344._8_4_ + fVar269;
        uStack_8d8._4_4_ = auVar344._12_4_ + fVar247;
        uStack_8d0._0_4_ = auVar344._16_4_ + fVar177;
        uStack_8d0._4_4_ = auVar344._20_4_ + fVar333;
        uStack_8c8._0_4_ = auVar344._24_4_ + fVar334;
        uStack_8c8._4_4_ = auVar344._28_4_ + fVar268;
        fVar228 = fVar241 * 0.0 * auVar152._0_4_;
        fVar241 = fVar261 * 0.0 * auVar152._4_4_;
        auVar37._4_4_ = fVar241;
        auVar37._0_4_ = fVar228;
        fVar249 = fVar280 * 0.0 * auVar152._8_4_;
        auVar37._8_4_ = fVar249;
        fVar261 = fVar337 * 0.0 * auVar152._12_4_;
        auVar37._12_4_ = fVar261;
        fVar269 = fVar339 * 0.0 * auVar152._16_4_;
        auVar37._16_4_ = fVar269;
        fVar280 = fVar308 * 0.0 * auVar152._20_4_;
        auVar37._20_4_ = fVar280;
        fVar247 = fVar316 * 0.0 * auVar152._24_4_;
        auVar37._24_4_ = fVar247;
        auVar37._28_4_ = fVar357;
        auVar128._4_4_ = fVar169;
        auVar128._0_4_ = fVar227;
        auVar128._8_4_ = fVar172;
        auVar128._12_4_ = fVar146;
        auVar128._16_4_ = fStack_670;
        auVar128._20_4_ = fStack_66c;
        auVar128._24_4_ = fStack_668;
        auVar128._28_4_ = fStack_664;
        auVar290._0_4_ = fVar227 + fVar228;
        auVar290._4_4_ = fVar169 + fVar241;
        auVar290._8_4_ = fVar172 + fVar249;
        auVar290._12_4_ = fVar146 + fVar261;
        auVar290._16_4_ = fStack_670 + fVar269;
        auVar290._20_4_ = fStack_66c + fVar280;
        auVar290._24_4_ = fStack_668 + fVar247;
        auVar290._28_4_ = fStack_664 + fVar357;
        fVar228 = (float)local_7e0._0_4_ * fVar243 * fVar245;
        fVar241 = (float)local_7e0._4_4_ * fVar264 * fVar266;
        auVar38._4_4_ = fVar241;
        auVar38._0_4_ = fVar228;
        fVar243 = fStack_7d8 * fVar282 * fVar284;
        auVar38._8_4_ = fVar243;
        fVar249 = fStack_7d4 * fVar286 * fVar338;
        auVar38._12_4_ = fVar249;
        fVar261 = register0x00001450 * fVar182 * fVar340;
        auVar38._16_4_ = fVar261;
        fVar264 = register0x00001454 * fVar309 * fVar246;
        auVar38._20_4_ = fVar264;
        fVar269 = register0x00001458 * fVar317 * fVar248;
        auVar38._24_4_ = fVar269;
        auVar38._28_4_ = auVar276._28_4_;
        auVar305 = vsubps_avx(auVar305,auVar35);
        auVar329._0_4_ = auVar256._0_4_ + fVar228;
        auVar329._4_4_ = auVar256._4_4_ + fVar241;
        auVar329._8_4_ = auVar256._8_4_ + fVar243;
        auVar329._12_4_ = auVar256._12_4_ + fVar249;
        auVar329._16_4_ = auVar256._16_4_ + fVar261;
        auVar329._20_4_ = auVar256._20_4_ + fVar264;
        auVar329._24_4_ = auVar256._24_4_ + fVar269;
        auVar329._28_4_ = auVar256._28_4_ + auVar276._28_4_;
        fVar228 = (float)local_7e0._0_4_ * fVar245 * -fVar230;
        fVar241 = (float)local_7e0._4_4_ * fVar266 * -fVar242;
        auVar276._4_4_ = fVar241;
        auVar276._0_4_ = fVar228;
        fVar243 = fStack_7d8 * fVar284 * -fVar244;
        auVar276._8_4_ = fVar243;
        fVar249 = fStack_7d4 * fVar338 * -fVar174;
        auVar276._12_4_ = fVar249;
        fVar261 = register0x00001450 * fVar340 * -fVar176;
        auVar276._16_4_ = fVar261;
        fVar264 = register0x00001454 * fVar246 * -fVar179;
        auVar276._20_4_ = fVar264;
        fVar269 = register0x00001458 * fVar248 * -fVar180;
        auVar276._24_4_ = fVar269;
        auVar276._28_4_ = fVar365;
        auVar344 = vsubps_avx(auVar344,auVar36);
        auVar336._0_4_ = fVar228 + auVar235._0_4_;
        auVar336._4_4_ = fVar241 + auVar235._4_4_;
        auVar336._8_4_ = fVar243 + auVar235._8_4_;
        auVar336._12_4_ = fVar249 + auVar235._12_4_;
        auVar336._16_4_ = fVar261 + auVar235._16_4_;
        auVar336._20_4_ = fVar264 + auVar235._20_4_;
        auVar336._24_4_ = fVar269 + auVar235._24_4_;
        auVar336._28_4_ = fVar365 + auVar235._28_4_;
        fVar228 = fVar245 * 0.0 * (float)local_7e0._0_4_;
        fVar241 = fVar266 * 0.0 * (float)local_7e0._4_4_;
        auVar39._4_4_ = fVar241;
        auVar39._0_4_ = fVar228;
        fVar243 = fVar284 * 0.0 * fStack_7d8;
        auVar39._8_4_ = fVar243;
        fVar245 = fVar338 * 0.0 * fStack_7d4;
        auVar39._12_4_ = fVar245;
        fVar249 = fVar340 * 0.0 * register0x00001450;
        auVar39._16_4_ = fVar249;
        fVar261 = fVar246 * 0.0 * register0x00001454;
        auVar39._20_4_ = fVar261;
        fVar264 = fVar248 * 0.0 * register0x00001458;
        auVar39._24_4_ = fVar264;
        auVar39._28_4_ = fVar268;
        auVar32 = vsubps_avx(auVar128,auVar37);
        auVar368._0_4_ = (float)local_360._0_4_ + fVar228;
        auVar368._4_4_ = (float)local_360._4_4_ + fVar241;
        auVar368._8_4_ = fStack_358 + fVar243;
        auVar368._12_4_ = fStack_354 + fVar245;
        auVar368._16_4_ = fStack_350 + fVar249;
        auVar368._20_4_ = fStack_34c + fVar261;
        auVar368._24_4_ = fStack_348 + fVar264;
        auVar368._28_4_ = fStack_344 + fVar268;
        auVar197 = vsubps_avx(auVar256,auVar38);
        auVar167 = vsubps_avx(auVar235,auVar276);
        auVar276 = vsubps_avx(_local_360,auVar39);
        auVar156 = vsubps_avx(auVar336,auVar344);
        auVar22 = vsubps_avx(auVar368,auVar32);
        auVar40._4_4_ = auVar32._4_4_ * auVar156._4_4_;
        auVar40._0_4_ = auVar32._0_4_ * auVar156._0_4_;
        auVar40._8_4_ = auVar32._8_4_ * auVar156._8_4_;
        auVar40._12_4_ = auVar32._12_4_ * auVar156._12_4_;
        auVar40._16_4_ = auVar32._16_4_ * auVar156._16_4_;
        auVar40._20_4_ = auVar32._20_4_ * auVar156._20_4_;
        auVar40._24_4_ = auVar32._24_4_ * auVar156._24_4_;
        auVar40._28_4_ = fVar365;
        auVar41._4_4_ = auVar344._4_4_ * auVar22._4_4_;
        auVar41._0_4_ = auVar344._0_4_ * auVar22._0_4_;
        auVar41._8_4_ = auVar344._8_4_ * auVar22._8_4_;
        auVar41._12_4_ = auVar344._12_4_ * auVar22._12_4_;
        auVar41._16_4_ = auVar344._16_4_ * auVar22._16_4_;
        auVar41._20_4_ = auVar344._20_4_ * auVar22._20_4_;
        auVar41._24_4_ = auVar344._24_4_ * auVar22._24_4_;
        auVar41._28_4_ = auVar235._28_4_;
        auVar236 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = auVar305._4_4_ * auVar22._4_4_;
        auVar42._0_4_ = auVar305._0_4_ * auVar22._0_4_;
        auVar42._8_4_ = auVar305._8_4_ * auVar22._8_4_;
        auVar42._12_4_ = auVar305._12_4_ * auVar22._12_4_;
        auVar42._16_4_ = auVar305._16_4_ * auVar22._16_4_;
        auVar42._20_4_ = auVar305._20_4_ * auVar22._20_4_;
        auVar42._24_4_ = auVar305._24_4_ * auVar22._24_4_;
        auVar42._28_4_ = auVar22._28_4_;
        auVar31 = vsubps_avx(auVar329,auVar305);
        auVar43._4_4_ = auVar32._4_4_ * auVar31._4_4_;
        auVar43._0_4_ = auVar32._0_4_ * auVar31._0_4_;
        auVar43._8_4_ = auVar32._8_4_ * auVar31._8_4_;
        auVar43._12_4_ = auVar32._12_4_ * auVar31._12_4_;
        auVar43._16_4_ = auVar32._16_4_ * auVar31._16_4_;
        auVar43._20_4_ = auVar32._20_4_ * auVar31._20_4_;
        auVar43._24_4_ = auVar32._24_4_ * auVar31._24_4_;
        auVar43._28_4_ = auVar256._28_4_;
        auVar256 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar31._4_4_ * auVar344._4_4_;
        auVar44._0_4_ = auVar31._0_4_ * auVar344._0_4_;
        auVar44._8_4_ = auVar31._8_4_ * auVar344._8_4_;
        auVar44._12_4_ = auVar31._12_4_ * auVar344._12_4_;
        auVar44._16_4_ = auVar31._16_4_ * auVar344._16_4_;
        auVar44._20_4_ = auVar31._20_4_ * auVar344._20_4_;
        auVar44._24_4_ = auVar31._24_4_ * auVar344._24_4_;
        auVar44._28_4_ = auVar22._28_4_;
        auVar45._4_4_ = auVar305._4_4_ * auVar156._4_4_;
        auVar45._0_4_ = auVar305._0_4_ * auVar156._0_4_;
        auVar45._8_4_ = auVar305._8_4_ * auVar156._8_4_;
        auVar45._12_4_ = auVar305._12_4_ * auVar156._12_4_;
        auVar45._16_4_ = auVar305._16_4_ * auVar156._16_4_;
        auVar45._20_4_ = auVar305._20_4_ * auVar156._20_4_;
        auVar45._24_4_ = auVar305._24_4_ * auVar156._24_4_;
        auVar45._28_4_ = auVar156._28_4_;
        auVar156 = vsubps_avx(auVar45,auVar44);
        auVar155._0_4_ = auVar236._0_4_ * 0.0 + auVar156._0_4_ + auVar256._0_4_ * 0.0;
        auVar155._4_4_ = auVar236._4_4_ * 0.0 + auVar156._4_4_ + auVar256._4_4_ * 0.0;
        auVar155._8_4_ = auVar236._8_4_ * 0.0 + auVar156._8_4_ + auVar256._8_4_ * 0.0;
        auVar155._12_4_ = auVar236._12_4_ * 0.0 + auVar156._12_4_ + auVar256._12_4_ * 0.0;
        auVar155._16_4_ = auVar236._16_4_ * 0.0 + auVar156._16_4_ + auVar256._16_4_ * 0.0;
        auVar155._20_4_ = auVar236._20_4_ * 0.0 + auVar156._20_4_ + auVar256._20_4_ * 0.0;
        auVar155._24_4_ = auVar236._24_4_ * 0.0 + auVar156._24_4_ + auVar256._24_4_ * 0.0;
        auVar155._28_4_ = auVar156._28_4_ + auVar156._28_4_ + auVar256._28_4_;
        auVar31 = vcmpps_avx(auVar155,ZEXT432(0) << 0x20,2);
        auVar220 = ZEXT3264(auVar31);
        auVar197 = vblendvps_avx(auVar197,_local_780,auVar31);
        auVar167 = vblendvps_avx(auVar167,_local_8e0,auVar31);
        auVar276 = vblendvps_avx(auVar276,auVar290,auVar31);
        auVar156 = vblendvps_avx(auVar305,auVar329,auVar31);
        auVar22 = vblendvps_avx(auVar344,auVar336,auVar31);
        auVar236 = vblendvps_avx(auVar32,auVar368,auVar31);
        auVar256 = vblendvps_avx(auVar329,auVar305,auVar31);
        auVar305 = vblendvps_avx(auVar336,auVar344,auVar31);
        auVar189 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        auVar344 = vblendvps_avx(auVar368,auVar32,auVar31);
        auVar256 = vsubps_avx(auVar256,auVar197);
        auVar32 = vsubps_avx(auVar305,auVar167);
        auVar344 = vsubps_avx(auVar344,auVar276);
        auVar33 = vsubps_avx(auVar167,auVar22);
        fVar228 = auVar32._0_4_;
        fVar146 = auVar276._0_4_;
        fVar261 = auVar32._4_4_;
        fVar171 = auVar276._4_4_;
        auVar46._4_4_ = fVar171 * fVar261;
        auVar46._0_4_ = fVar146 * fVar228;
        fVar282 = auVar32._8_4_;
        fVar173 = auVar276._8_4_;
        auVar46._8_4_ = fVar173 * fVar282;
        fVar338 = auVar32._12_4_;
        fVar175 = auVar276._12_4_;
        auVar46._12_4_ = fVar175 * fVar338;
        fVar333 = auVar32._16_4_;
        fVar178 = auVar276._16_4_;
        auVar46._16_4_ = fVar178 * fVar333;
        fVar316 = auVar32._20_4_;
        fVar230 = auVar276._20_4_;
        auVar46._20_4_ = fVar230 * fVar316;
        fVar170 = auVar32._24_4_;
        fVar242 = auVar276._24_4_;
        auVar46._24_4_ = fVar242 * fVar170;
        auVar46._28_4_ = auVar305._28_4_;
        fVar241 = auVar167._0_4_;
        fVar206 = auVar344._0_4_;
        fVar264 = auVar167._4_4_;
        fVar181 = auVar344._4_4_;
        auVar47._4_4_ = fVar181 * fVar264;
        auVar47._0_4_ = fVar206 * fVar241;
        fVar284 = auVar167._8_4_;
        fVar210 = auVar344._8_4_;
        auVar47._8_4_ = fVar210 * fVar284;
        fVar177 = auVar167._12_4_;
        fVar298 = auVar344._12_4_;
        auVar47._12_4_ = fVar298 * fVar177;
        fVar308 = auVar167._16_4_;
        fVar221 = auVar344._16_4_;
        auVar47._16_4_ = fVar221 * fVar308;
        fVar317 = auVar167._20_4_;
        fVar222 = auVar344._20_4_;
        auVar47._20_4_ = fVar222 * fVar317;
        fVar227 = auVar167._24_4_;
        fVar223 = auVar344._24_4_;
        auVar47._24_4_ = fVar223 * fVar227;
        auVar47._28_4_ = auVar336._28_4_;
        auVar167 = vsubps_avx(auVar47,auVar46);
        fVar243 = auVar197._0_4_;
        fVar266 = auVar197._4_4_;
        auVar48._4_4_ = fVar181 * fVar266;
        auVar48._0_4_ = fVar206 * fVar243;
        fVar247 = auVar197._8_4_;
        auVar48._8_4_ = fVar210 * fVar247;
        fVar339 = auVar197._12_4_;
        auVar48._12_4_ = fVar298 * fVar339;
        fVar309 = auVar197._16_4_;
        auVar48._16_4_ = fVar221 * fVar309;
        fVar248 = auVar197._20_4_;
        auVar48._20_4_ = fVar222 * fVar248;
        fVar169 = auVar197._24_4_;
        auVar48._24_4_ = fVar223 * fVar169;
        auVar48._28_4_ = auVar336._28_4_;
        fVar245 = auVar256._0_4_;
        auVar361._0_4_ = fVar146 * fVar245;
        fVar269 = auVar256._4_4_;
        auVar361._4_4_ = fVar171 * fVar269;
        fVar337 = auVar256._8_4_;
        auVar361._8_4_ = fVar173 * fVar337;
        fVar182 = auVar256._12_4_;
        auVar361._12_4_ = fVar175 * fVar182;
        fVar246 = auVar256._16_4_;
        auVar361._16_4_ = fVar178 * fVar246;
        fVar318 = auVar256._20_4_;
        auVar361._20_4_ = fVar230 * fVar318;
        fVar172 = auVar256._24_4_;
        auVar361._24_4_ = fVar242 * fVar172;
        auVar361._28_4_ = 0;
        auVar305 = vsubps_avx(auVar361,auVar48);
        auVar49._4_4_ = fVar264 * fVar269;
        auVar49._0_4_ = fVar241 * fVar245;
        auVar49._8_4_ = fVar284 * fVar337;
        auVar49._12_4_ = fVar177 * fVar182;
        auVar49._16_4_ = fVar308 * fVar246;
        auVar49._20_4_ = fVar317 * fVar318;
        auVar49._24_4_ = fVar227 * fVar172;
        auVar49._28_4_ = auVar336._28_4_;
        auVar50._4_4_ = fVar266 * fVar261;
        auVar50._0_4_ = fVar243 * fVar228;
        auVar50._8_4_ = fVar247 * fVar282;
        auVar50._12_4_ = fVar339 * fVar338;
        auVar50._16_4_ = fVar309 * fVar333;
        auVar50._20_4_ = fVar248 * fVar316;
        auVar50._24_4_ = fVar169 * fVar170;
        auVar50._28_4_ = auVar368._28_4_;
        auVar34 = vsubps_avx(auVar50,auVar49);
        auVar35 = vsubps_avx(auVar276,auVar236);
        fVar249 = auVar34._28_4_ + auVar305._28_4_;
        auVar192._0_4_ = auVar34._0_4_ + auVar305._0_4_ * 0.0 + auVar167._0_4_ * 0.0;
        auVar192._4_4_ = auVar34._4_4_ + auVar305._4_4_ * 0.0 + auVar167._4_4_ * 0.0;
        auVar192._8_4_ = auVar34._8_4_ + auVar305._8_4_ * 0.0 + auVar167._8_4_ * 0.0;
        auVar192._12_4_ = auVar34._12_4_ + auVar305._12_4_ * 0.0 + auVar167._12_4_ * 0.0;
        auVar192._16_4_ = auVar34._16_4_ + auVar305._16_4_ * 0.0 + auVar167._16_4_ * 0.0;
        auVar192._20_4_ = auVar34._20_4_ + auVar305._20_4_ * 0.0 + auVar167._20_4_ * 0.0;
        auVar192._24_4_ = auVar34._24_4_ + auVar305._24_4_ * 0.0 + auVar167._24_4_ * 0.0;
        auVar192._28_4_ = fVar249 + auVar167._28_4_;
        fVar244 = auVar33._0_4_;
        fVar174 = auVar33._4_4_;
        auVar51._4_4_ = fVar174 * auVar236._4_4_;
        auVar51._0_4_ = fVar244 * auVar236._0_4_;
        fVar176 = auVar33._8_4_;
        auVar51._8_4_ = fVar176 * auVar236._8_4_;
        fVar179 = auVar33._12_4_;
        auVar51._12_4_ = fVar179 * auVar236._12_4_;
        fVar180 = auVar33._16_4_;
        auVar51._16_4_ = fVar180 * auVar236._16_4_;
        fVar268 = auVar33._20_4_;
        auVar51._20_4_ = fVar268 * auVar236._20_4_;
        fVar297 = auVar33._24_4_;
        auVar51._24_4_ = fVar297 * auVar236._24_4_;
        auVar51._28_4_ = fVar249;
        fVar249 = auVar35._0_4_;
        fVar280 = auVar35._4_4_;
        auVar52._4_4_ = auVar22._4_4_ * fVar280;
        auVar52._0_4_ = auVar22._0_4_ * fVar249;
        fVar286 = auVar35._8_4_;
        auVar52._8_4_ = auVar22._8_4_ * fVar286;
        fVar340 = auVar35._12_4_;
        auVar52._12_4_ = auVar22._12_4_ * fVar340;
        fVar334 = auVar35._16_4_;
        auVar52._16_4_ = auVar22._16_4_ * fVar334;
        fVar145 = auVar35._20_4_;
        auVar52._20_4_ = auVar22._20_4_ * fVar145;
        fVar209 = auVar35._24_4_;
        auVar52._24_4_ = auVar22._24_4_ * fVar209;
        auVar52._28_4_ = auVar34._28_4_;
        auVar305 = vsubps_avx(auVar52,auVar51);
        auVar33 = vsubps_avx(auVar197,auVar156);
        fVar224 = auVar33._0_4_;
        fVar225 = auVar33._4_4_;
        auVar53._4_4_ = fVar225 * auVar236._4_4_;
        auVar53._0_4_ = fVar224 * auVar236._0_4_;
        fVar226 = auVar33._8_4_;
        auVar53._8_4_ = fVar226 * auVar236._8_4_;
        fVar270 = auVar33._12_4_;
        auVar53._12_4_ = fVar270 * auVar236._12_4_;
        fVar281 = auVar33._16_4_;
        auVar53._16_4_ = fVar281 * auVar236._16_4_;
        fVar283 = auVar33._20_4_;
        auVar53._20_4_ = fVar283 * auVar236._20_4_;
        fVar285 = auVar33._24_4_;
        auVar53._24_4_ = fVar285 * auVar236._24_4_;
        auVar53._28_4_ = auVar236._28_4_;
        auVar54._4_4_ = auVar156._4_4_ * fVar280;
        auVar54._0_4_ = auVar156._0_4_ * fVar249;
        auVar54._8_4_ = auVar156._8_4_ * fVar286;
        auVar54._12_4_ = auVar156._12_4_ * fVar340;
        auVar54._16_4_ = auVar156._16_4_ * fVar334;
        auVar54._20_4_ = auVar156._20_4_ * fVar145;
        auVar54._24_4_ = auVar156._24_4_ * fVar209;
        auVar54._28_4_ = auVar167._28_4_;
        auVar167 = vsubps_avx(auVar53,auVar54);
        auVar55._4_4_ = auVar22._4_4_ * fVar225;
        auVar55._0_4_ = auVar22._0_4_ * fVar224;
        auVar55._8_4_ = auVar22._8_4_ * fVar226;
        auVar55._12_4_ = auVar22._12_4_ * fVar270;
        auVar55._16_4_ = auVar22._16_4_ * fVar281;
        auVar55._20_4_ = auVar22._20_4_ * fVar283;
        auVar55._24_4_ = auVar22._24_4_ * fVar285;
        auVar55._28_4_ = auVar236._28_4_;
        auVar56._4_4_ = auVar156._4_4_ * fVar174;
        auVar56._0_4_ = auVar156._0_4_ * fVar244;
        auVar56._8_4_ = auVar156._8_4_ * fVar176;
        auVar56._12_4_ = auVar156._12_4_ * fVar179;
        auVar56._16_4_ = auVar156._16_4_ * fVar180;
        auVar56._20_4_ = auVar156._20_4_ * fVar268;
        auVar56._24_4_ = auVar156._24_4_ * fVar297;
        auVar56._28_4_ = auVar156._28_4_;
        auVar156 = vsubps_avx(auVar56,auVar55);
        auVar168 = ZEXT864(0) << 0x20;
        auVar258._0_4_ = auVar305._0_4_ * 0.0 + auVar156._0_4_ + auVar167._0_4_ * 0.0;
        auVar258._4_4_ = auVar305._4_4_ * 0.0 + auVar156._4_4_ + auVar167._4_4_ * 0.0;
        auVar258._8_4_ = auVar305._8_4_ * 0.0 + auVar156._8_4_ + auVar167._8_4_ * 0.0;
        auVar258._12_4_ = auVar305._12_4_ * 0.0 + auVar156._12_4_ + auVar167._12_4_ * 0.0;
        auVar258._16_4_ = auVar305._16_4_ * 0.0 + auVar156._16_4_ + auVar167._16_4_ * 0.0;
        auVar258._20_4_ = auVar305._20_4_ * 0.0 + auVar156._20_4_ + auVar167._20_4_ * 0.0;
        auVar258._24_4_ = auVar305._24_4_ * 0.0 + auVar156._24_4_ + auVar167._24_4_ * 0.0;
        auVar258._28_4_ = auVar156._28_4_ + auVar156._28_4_ + auVar167._28_4_;
        auVar167 = vmaxps_avx(auVar192,auVar258);
        auVar167 = vcmpps_avx(auVar167,ZEXT832(0) << 0x20,2);
        auVar215 = vpackssdw_avx(auVar167._0_16_,auVar167._16_16_);
        auVar189 = vpand_avx(auVar215,auVar189);
        auVar215 = vpmovsxwd_avx(auVar189);
        auVar216 = vpunpckhwd_avx(auVar189,auVar189);
        auVar237._16_16_ = auVar216;
        auVar237._0_16_ = auVar215;
        if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar237 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar237 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar237 >> 0x7f,0) == '\0') &&
              (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar216 >> 0x3f,0) == '\0') &&
            (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar216[0xf]) {
LAB_01085e55:
          auVar349 = ZEXT3264(local_5c0);
          auVar203 = ZEXT3264(local_5e0);
          auVar279 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          auVar240 = ZEXT3264(auVar237);
        }
        else {
          auVar57._4_4_ = fVar280 * fVar261;
          auVar57._0_4_ = fVar249 * fVar228;
          auVar57._8_4_ = fVar286 * fVar282;
          auVar57._12_4_ = fVar340 * fVar338;
          auVar57._16_4_ = fVar334 * fVar333;
          auVar57._20_4_ = fVar145 * fVar316;
          auVar57._24_4_ = fVar209 * fVar170;
          auVar57._28_4_ = auVar216._12_4_;
          auVar345._0_4_ = fVar244 * fVar206;
          auVar345._4_4_ = fVar174 * fVar181;
          auVar345._8_4_ = fVar176 * fVar210;
          auVar345._12_4_ = fVar179 * fVar298;
          auVar345._16_4_ = fVar180 * fVar221;
          auVar345._20_4_ = fVar268 * fVar222;
          auVar345._24_4_ = fVar297 * fVar223;
          auVar345._28_4_ = 0;
          auVar167 = vsubps_avx(auVar345,auVar57);
          auVar58._4_4_ = fVar225 * fVar181;
          auVar58._0_4_ = fVar224 * fVar206;
          auVar58._8_4_ = fVar226 * fVar210;
          auVar58._12_4_ = fVar270 * fVar298;
          auVar58._16_4_ = fVar281 * fVar221;
          auVar58._20_4_ = fVar283 * fVar222;
          auVar58._24_4_ = fVar285 * fVar223;
          auVar58._28_4_ = auVar344._28_4_;
          auVar59._4_4_ = fVar280 * fVar269;
          auVar59._0_4_ = fVar249 * fVar245;
          auVar59._8_4_ = fVar286 * fVar337;
          auVar59._12_4_ = fVar340 * fVar182;
          auVar59._16_4_ = fVar334 * fVar246;
          auVar59._20_4_ = fVar145 * fVar318;
          auVar59._24_4_ = fVar209 * fVar172;
          auVar59._28_4_ = auVar35._28_4_;
          auVar22 = vsubps_avx(auVar59,auVar58);
          auVar60._4_4_ = fVar174 * fVar269;
          auVar60._0_4_ = fVar244 * fVar245;
          auVar60._8_4_ = fVar176 * fVar337;
          auVar60._12_4_ = fVar179 * fVar182;
          auVar60._16_4_ = fVar180 * fVar246;
          auVar60._20_4_ = fVar268 * fVar318;
          auVar60._24_4_ = fVar297 * fVar172;
          auVar60._28_4_ = auVar192._28_4_;
          auVar61._4_4_ = fVar225 * fVar261;
          auVar61._0_4_ = fVar224 * fVar228;
          auVar61._8_4_ = fVar226 * fVar282;
          auVar61._12_4_ = fVar270 * fVar338;
          auVar61._16_4_ = fVar281 * fVar333;
          auVar61._20_4_ = fVar283 * fVar316;
          auVar61._24_4_ = fVar285 * fVar170;
          auVar61._28_4_ = auVar32._28_4_;
          auVar236 = vsubps_avx(auVar61,auVar60);
          auVar306._0_4_ = auVar167._0_4_ * 0.0 + auVar236._0_4_ + auVar22._0_4_ * 0.0;
          auVar306._4_4_ = auVar167._4_4_ * 0.0 + auVar236._4_4_ + auVar22._4_4_ * 0.0;
          auVar306._8_4_ = auVar167._8_4_ * 0.0 + auVar236._8_4_ + auVar22._8_4_ * 0.0;
          auVar306._12_4_ = auVar167._12_4_ * 0.0 + auVar236._12_4_ + auVar22._12_4_ * 0.0;
          auVar306._16_4_ = auVar167._16_4_ * 0.0 + auVar236._16_4_ + auVar22._16_4_ * 0.0;
          auVar306._20_4_ = auVar167._20_4_ * 0.0 + auVar236._20_4_ + auVar22._20_4_ * 0.0;
          auVar306._24_4_ = auVar167._24_4_ * 0.0 + auVar236._24_4_ + auVar22._24_4_ * 0.0;
          auVar306._28_4_ = auVar32._28_4_ + auVar236._28_4_ + auVar192._28_4_;
          auVar156 = vrcpps_avx(auVar306);
          fVar228 = auVar156._0_4_;
          fVar245 = auVar156._4_4_;
          auVar62._4_4_ = auVar306._4_4_ * fVar245;
          auVar62._0_4_ = auVar306._0_4_ * fVar228;
          fVar249 = auVar156._8_4_;
          auVar62._8_4_ = auVar306._8_4_ * fVar249;
          fVar261 = auVar156._12_4_;
          auVar62._12_4_ = auVar306._12_4_ * fVar261;
          fVar269 = auVar156._16_4_;
          auVar62._16_4_ = auVar306._16_4_ * fVar269;
          fVar280 = auVar156._20_4_;
          auVar62._20_4_ = auVar306._20_4_ * fVar280;
          fVar282 = auVar156._24_4_;
          auVar62._24_4_ = auVar306._24_4_ * fVar282;
          auVar62._28_4_ = auVar35._28_4_;
          auVar346._8_4_ = 0x3f800000;
          auVar346._0_8_ = &DAT_3f8000003f800000;
          auVar346._12_4_ = 0x3f800000;
          auVar346._16_4_ = 0x3f800000;
          auVar346._20_4_ = 0x3f800000;
          auVar346._24_4_ = 0x3f800000;
          auVar346._28_4_ = 0x3f800000;
          auVar305 = vsubps_avx(auVar346,auVar62);
          fVar228 = auVar305._0_4_ * fVar228 + fVar228;
          fVar245 = auVar305._4_4_ * fVar245 + fVar245;
          fVar249 = auVar305._8_4_ * fVar249 + fVar249;
          fVar261 = auVar305._12_4_ * fVar261 + fVar261;
          fVar269 = auVar305._16_4_ * fVar269 + fVar269;
          fVar280 = auVar305._20_4_ * fVar280 + fVar280;
          fVar282 = auVar305._24_4_ * fVar282 + fVar282;
          auVar63._4_4_ =
               (auVar167._4_4_ * fVar266 + auVar22._4_4_ * fVar264 + auVar236._4_4_ * fVar171) *
               fVar245;
          auVar63._0_4_ =
               (auVar167._0_4_ * fVar243 + auVar22._0_4_ * fVar241 + auVar236._0_4_ * fVar146) *
               fVar228;
          auVar63._8_4_ =
               (auVar167._8_4_ * fVar247 + auVar22._8_4_ * fVar284 + auVar236._8_4_ * fVar173) *
               fVar249;
          auVar63._12_4_ =
               (auVar167._12_4_ * fVar339 + auVar22._12_4_ * fVar177 + auVar236._12_4_ * fVar175) *
               fVar261;
          auVar63._16_4_ =
               (auVar167._16_4_ * fVar309 + auVar22._16_4_ * fVar308 + auVar236._16_4_ * fVar178) *
               fVar269;
          auVar63._20_4_ =
               (auVar167._20_4_ * fVar248 + auVar22._20_4_ * fVar317 + auVar236._20_4_ * fVar230) *
               fVar280;
          auVar63._24_4_ =
               (auVar167._24_4_ * fVar169 + auVar22._24_4_ * fVar227 + auVar236._24_4_ * fVar242) *
               fVar282;
          auVar63._28_4_ = auVar197._28_4_ + auVar256._28_4_ + auVar276._28_4_;
          auVar215 = vpermilps_avx(ZEXT416(uVar141),0);
          auVar238._16_16_ = auVar215;
          auVar238._0_16_ = auVar215;
          auVar197 = vcmpps_avx(auVar238,auVar63,2);
          uVar310 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar274._4_4_ = uVar310;
          auVar274._0_4_ = uVar310;
          auVar274._8_4_ = uVar310;
          auVar274._12_4_ = uVar310;
          auVar274._16_4_ = uVar310;
          auVar274._20_4_ = uVar310;
          auVar274._24_4_ = uVar310;
          auVar274._28_4_ = uVar310;
          auVar167 = vcmpps_avx(auVar63,auVar274,2);
          auVar197 = vandps_avx(auVar167,auVar197);
          auVar215 = vpackssdw_avx(auVar197._0_16_,auVar197._16_16_);
          auVar189 = vpand_avx(auVar189,auVar215);
          auVar215 = vpmovsxwd_avx(auVar189);
          auVar216 = vpshufd_avx(auVar189,0xee);
          auVar216 = vpmovsxwd_avx(auVar216);
          auVar237._16_16_ = auVar216;
          auVar237._0_16_ = auVar215;
          auVar349 = ZEXT3264(local_5c0);
          auVar203 = ZEXT3264(local_5e0);
          if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar237 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar237 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar237 >> 0x7f,0) == '\0') &&
                (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar216 >> 0x3f,0) == '\0') &&
              (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar216[0xf]) goto LAB_01085e55;
          auVar197 = vcmpps_avx(ZEXT832(0) << 0x20,auVar306,4);
          auVar215 = vpackssdw_avx(auVar197._0_16_,auVar197._16_16_);
          auVar189 = vpand_avx(auVar189,auVar215);
          auVar215 = vpmovsxwd_avx(auVar189);
          auVar189 = vpunpckhwd_avx(auVar189,auVar189);
          auVar240 = ZEXT1664(auVar189);
          auVar291._16_16_ = auVar189;
          auVar291._0_16_ = auVar215;
          auVar279 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          if ((((((((auVar291 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar291 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar291 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar291 >> 0x7f,0) != '\0') ||
                (auVar291 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar189 >> 0x3f,0) != '\0') ||
              (auVar291 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar189[0xf] < '\0') {
            auVar239._0_4_ = auVar192._0_4_ * fVar228;
            auVar239._4_4_ = auVar192._4_4_ * fVar245;
            auVar239._8_4_ = auVar192._8_4_ * fVar249;
            auVar239._12_4_ = auVar192._12_4_ * fVar261;
            auVar239._16_4_ = auVar192._16_4_ * fVar269;
            auVar239._20_4_ = auVar192._20_4_ * fVar280;
            auVar239._24_4_ = auVar192._24_4_ * fVar282;
            auVar239._28_4_ = 0;
            auVar64._4_4_ = auVar258._4_4_ * fVar245;
            auVar64._0_4_ = auVar258._0_4_ * fVar228;
            auVar64._8_4_ = auVar258._8_4_ * fVar249;
            auVar64._12_4_ = auVar258._12_4_ * fVar261;
            auVar64._16_4_ = auVar258._16_4_ * fVar269;
            auVar64._20_4_ = auVar258._20_4_ * fVar280;
            auVar64._24_4_ = auVar258._24_4_ * fVar282;
            auVar64._28_4_ = auVar305._28_4_ + auVar156._28_4_;
            auVar275._8_4_ = 0x3f800000;
            auVar275._0_8_ = &DAT_3f8000003f800000;
            auVar275._12_4_ = 0x3f800000;
            auVar275._16_4_ = 0x3f800000;
            auVar275._20_4_ = 0x3f800000;
            auVar275._24_4_ = 0x3f800000;
            auVar275._28_4_ = 0x3f800000;
            auVar197 = vsubps_avx(auVar275,auVar239);
            auVar197 = vblendvps_avx(auVar197,auVar239,auVar31);
            auVar349 = ZEXT3264(auVar197);
            auVar197 = vsubps_avx(auVar275,auVar64);
            auVar240 = ZEXT3264(auVar197);
            _local_3a0 = vblendvps_avx(auVar197,auVar64,auVar31);
            auVar279 = ZEXT3264(auVar291);
            auVar203 = ZEXT3264(auVar63);
          }
        }
        auVar332 = ZEXT3264(_local_840);
        local_5c0 = auVar349._0_32_;
        local_5e0 = auVar203._0_32_;
        auVar276 = auVar279._0_32_;
        auVar197 = local_5e0;
        auVar167 = local_5c0;
        if ((((((((auVar276 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar276 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar276 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar276 >> 0x7f,0) == '\0') &&
              (auVar279 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar276 >> 0xbf,0) == '\0') &&
            (auVar279 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar279[0x1f]) {
LAB_010848d9:
          local_5c0 = auVar167;
          local_5e0 = auVar197;
          auVar343 = _local_6d0;
          auVar360 = _local_6b0;
          fVar229 = (float)local_540._0_4_;
        }
        else {
          auVar156 = vsubps_avx(_local_7e0,auVar152);
          fVar241 = auVar152._0_4_ + auVar349._0_4_ * auVar156._0_4_;
          fVar243 = auVar152._4_4_ + auVar349._4_4_ * auVar156._4_4_;
          fVar245 = auVar152._8_4_ + auVar349._8_4_ * auVar156._8_4_;
          fVar249 = auVar152._12_4_ + auVar349._12_4_ * auVar156._12_4_;
          fVar261 = auVar152._16_4_ + auVar349._16_4_ * auVar156._16_4_;
          fVar264 = auVar152._20_4_ + auVar349._20_4_ * auVar156._20_4_;
          fVar266 = auVar152._24_4_ + auVar349._24_4_ * auVar156._24_4_;
          fVar269 = auVar156._28_4_ + 0.0;
          fVar228 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar65._4_4_ = (fVar243 + fVar243) * fVar228;
          auVar65._0_4_ = (fVar241 + fVar241) * fVar228;
          auVar65._8_4_ = (fVar245 + fVar245) * fVar228;
          auVar65._12_4_ = (fVar249 + fVar249) * fVar228;
          auVar65._16_4_ = (fVar261 + fVar261) * fVar228;
          auVar65._20_4_ = (fVar264 + fVar264) * fVar228;
          auVar65._24_4_ = (fVar266 + fVar266) * fVar228;
          auVar65._28_4_ = fVar269 + fVar269;
          auVar156 = vcmpps_avx(local_5e0,auVar65,6);
          auVar22 = auVar276 & auVar156;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0x7f,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar22 >> 0xbf,0) != '\0') ||
              (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar22[0x1f] < '\0') {
            local_440 = vandps_avx(auVar156,auVar276);
            auVar220 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_4e0 = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
            fStack_4dc = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
            fStack_4d8 = (float)uStack_398 + (float)uStack_398 + -1.0;
            fStack_4d4 = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
            fStack_4d0 = (float)uStack_390 + (float)uStack_390 + -1.0;
            fStack_4cc = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
            fStack_4c8 = (float)uStack_388 + (float)uStack_388 + -1.0;
            fStack_4c4 = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
            local_3a0._4_4_ = fStack_4dc;
            local_3a0._0_4_ = local_4e0;
            uStack_398._0_4_ = fStack_4d8;
            uStack_398._4_4_ = fStack_4d4;
            uStack_390._0_4_ = fStack_4d0;
            uStack_390._4_4_ = fStack_4cc;
            auVar135 = _local_3a0;
            uStack_388._0_4_ = fStack_4c8;
            uStack_388._4_4_ = fStack_4c4;
            auVar276 = _local_3a0;
            local_4a0 = 0;
            uStack_488 = uStack_928;
            uStack_6a8 = auVar360._8_8_;
            uStack_478 = uStack_6a8;
            uStack_6b8 = auVar367._8_8_;
            uStack_468 = uStack_6b8;
            uStack_6c8 = auVar343._8_8_;
            uStack_458 = uStack_6c8;
            if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              auVar214._0_4_ = 1.0 / fVar229;
              auVar214._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar189 = vshufps_avx(auVar214,auVar214,0);
              local_420[0] = auVar189._0_4_ * (auVar349._0_4_ + 0.0);
              local_420[1] = auVar189._4_4_ * (auVar349._4_4_ + 1.0);
              local_420[2] = auVar189._8_4_ * (auVar349._8_4_ + 2.0);
              local_420[3] = auVar189._12_4_ * (auVar349._12_4_ + 3.0);
              fStack_410 = auVar189._0_4_ * (auVar349._16_4_ + 4.0);
              fStack_40c = auVar189._4_4_ * (auVar349._20_4_ + 5.0);
              fStack_408 = auVar189._8_4_ * (auVar349._24_4_ + 6.0);
              fStack_404 = auVar349._28_4_ + 7.0;
              uStack_390 = auVar135._16_8_;
              uStack_388 = auVar276._24_8_;
              local_400 = local_3a0;
              uStack_3f8 = uStack_398;
              uStack_3f0 = uStack_390;
              uStack_3e8 = uStack_388;
              local_3e0 = local_5e0;
              auVar193._8_4_ = 0x7f800000;
              auVar193._0_8_ = 0x7f8000007f800000;
              auVar193._12_4_ = 0x7f800000;
              auVar193._16_4_ = 0x7f800000;
              auVar193._20_4_ = 0x7f800000;
              auVar193._24_4_ = 0x7f800000;
              auVar193._28_4_ = 0x7f800000;
              auVar156 = vblendvps_avx(auVar193,local_5e0,local_440);
              auVar22 = vshufps_avx(auVar156,auVar156,0xb1);
              auVar22 = vminps_avx(auVar156,auVar22);
              auVar152 = vshufpd_avx(auVar22,auVar22,5);
              auVar22 = vminps_avx(auVar22,auVar152);
              auVar152 = vperm2f128_avx(auVar22,auVar22,1);
              auVar22 = vminps_avx(auVar22,auVar152);
              auVar22 = vcmpps_avx(auVar156,auVar22,0);
              auVar152 = local_440 & auVar22;
              auVar156 = local_440;
              if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar152 >> 0x7f,0) != '\0') ||
                    (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar152 >> 0xbf,0) != '\0') ||
                  (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar152[0x1f] < '\0') {
                auVar156 = vandps_avx(auVar22,local_440);
              }
              uVar137 = vmovmskps_avx(auVar156);
              uVar138 = 0;
              if (uVar137 != 0) {
                for (; (uVar137 >> uVar138 & 1) == 0; uVar138 = uVar138 + 1) {
                }
              }
              uVar139 = (ulong)uVar138;
              _local_3a0 = auVar276;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar228 = local_420[uVar139];
                fVar243 = 1.0 - fVar228;
                fVar241 = fVar228 * 3.0;
                auVar189 = ZEXT416((uint)((fVar243 * -2.0 * fVar228 + fVar228 * fVar228) * 0.5));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar215 = ZEXT416((uint)(((fVar243 + fVar243) * (fVar241 + 2.0) +
                                          fVar243 * fVar243 * -3.0) * 0.5));
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                auVar216 = ZEXT416((uint)(((fVar228 + fVar228) * (fVar241 + -5.0) +
                                          fVar228 * fVar241) * 0.5));
                auVar216 = vshufps_avx(auVar216,auVar216,0);
                uVar138 = *(uint *)((long)&local_400 + uVar139 * 4);
                auVar220 = ZEXT464(uVar138);
                auVar234 = ZEXT416((uint)((fVar228 * (fVar243 + fVar243) - fVar243 * fVar243) * 0.5)
                                  );
                auVar234 = vshufps_avx(auVar234,auVar234,0);
                auVar188._0_4_ =
                     auVar234._0_4_ * fVar250 +
                     auVar216._0_4_ * fVar358 +
                     auVar189._0_4_ * fVar341 + auVar215._0_4_ * local_680;
                auVar188._4_4_ =
                     auVar234._4_4_ * fVar262 +
                     auVar216._4_4_ * fVar362 +
                     auVar189._4_4_ * fVar350 + auVar215._4_4_ * fStack_67c;
                auVar188._8_4_ =
                     auVar234._8_4_ * auVar254._8_4_ +
                     auVar216._8_4_ * auVar360._8_4_ +
                     auVar189._8_4_ * auVar343._8_4_ + auVar215._8_4_ * auVar367._8_4_;
                auVar188._12_4_ =
                     auVar234._12_4_ * auVar254._12_4_ +
                     auVar216._12_4_ * auVar360._12_4_ +
                     auVar189._12_4_ * auVar343._12_4_ + auVar215._12_4_ * auVar367._12_4_;
                auVar240 = ZEXT464(*(uint *)(local_3e0 + uVar139 * 4));
                *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3e0 + uVar139 * 4);
                *(float *)(ray + k * 4 + 0x180) = auVar188._0_4_;
                uVar310 = vextractps_avx(auVar188,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar310;
                uVar310 = vextractps_avx(auVar188,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar310;
                *(float *)(ray + k * 4 + 0x1e0) = fVar228;
                *(uint *)(ray + k * 4 + 0x200) = uVar138;
                *(uint *)(ray + k * 4 + 0x220) = uVar15;
                *(uint *)(ray + k * 4 + 0x240) = uVar14;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                auVar189 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
                _uStack_870 = auVar189;
                _local_880 = auVar189;
                auVar189 = vshufps_avx(ZEXT416(uVar15),ZEXT416(uVar15),0);
                local_760._16_16_ = auVar189;
                local_760._0_16_ = auVar189;
                _auStack_8b0 = auVar235._16_16_;
                uStack_8b8 = uStack_6a8;
                local_8c0 = (undefined1  [8])auVar360._0_8_;
                uStack_778 = uStack_6c8;
                local_780 = (undefined1  [8])auVar343._0_8_;
                uStack_8d0 = *local_7f8;
                _local_8e0 = *local_7f0;
                uStack_8c8 = local_7f8[1];
                fStack_678 = auVar367._8_4_;
                fStack_674 = auVar367._12_4_;
                local_660 = local_440;
                local_500 = local_5c0;
                local_4c0 = local_5e0;
                local_49c = uVar16;
                local_490 = auVar254._0_8_;
                local_480 = auVar360._0_8_;
                local_470 = auVar367._0_8_;
                local_460 = auVar343._0_8_;
                do {
                  uVar310 = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_1e0 = local_420[uVar139];
                  local_1c0 = *(undefined4 *)((long)&local_400 + uVar139 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar139 * 4);
                  fVar204 = 1.0 - local_1e0;
                  fVar183 = local_1e0 * 3.0;
                  auVar189 = ZEXT416((uint)((fVar204 * -2.0 * local_1e0 + local_1e0 * local_1e0) *
                                           0.5));
                  auVar189 = vshufps_avx(auVar189,auVar189,0);
                  auVar215 = ZEXT416((uint)(((fVar204 + fVar204) * (fVar183 + 2.0) +
                                            fVar204 * fVar204 * -3.0) * 0.5));
                  auVar215 = vshufps_avx(auVar215,auVar215,0);
                  auVar216 = ZEXT416((uint)(((local_1e0 + local_1e0) * (fVar183 + -5.0) +
                                            local_1e0 * fVar183) * 0.5));
                  auVar216 = vshufps_avx(auVar216,auVar216,0);
                  local_910.context = context->user;
                  auVar234 = ZEXT416((uint)((local_1e0 * (fVar204 + fVar204) - fVar204 * fVar204) *
                                           0.5));
                  auVar234 = vshufps_avx(auVar234,auVar234,0);
                  auVar218._0_4_ =
                       auVar234._0_4_ * fVar250 +
                       auVar216._0_4_ * (float)local_8c0._0_4_ +
                       auVar189._0_4_ * (float)local_780._0_4_ + auVar215._0_4_ * local_680;
                  auVar218._4_4_ =
                       auVar234._4_4_ * fVar262 +
                       auVar216._4_4_ * (float)local_8c0._4_4_ +
                       auVar189._4_4_ * (float)local_780._4_4_ + auVar215._4_4_ * fStack_67c;
                  auVar218._8_4_ =
                       auVar234._8_4_ * auVar254._8_4_ +
                       auVar216._8_4_ * (float)uStack_8b8 +
                       auVar189._8_4_ * (float)uStack_778 + auVar215._8_4_ * fStack_678;
                  auVar218._12_4_ =
                       auVar234._12_4_ * auVar254._12_4_ +
                       auVar216._12_4_ * uStack_8b8._4_4_ +
                       auVar189._12_4_ * uStack_778._4_4_ + auVar215._12_4_ * fStack_674;
                  auStack_230 = vshufps_avx(auVar218,auVar218,0);
                  local_240[0] = (RTCHitN)auStack_230[0];
                  local_240[1] = (RTCHitN)auStack_230[1];
                  local_240[2] = (RTCHitN)auStack_230[2];
                  local_240[3] = (RTCHitN)auStack_230[3];
                  local_240[4] = (RTCHitN)auStack_230[4];
                  local_240[5] = (RTCHitN)auStack_230[5];
                  local_240[6] = (RTCHitN)auStack_230[6];
                  local_240[7] = (RTCHitN)auStack_230[7];
                  local_240[8] = (RTCHitN)auStack_230[8];
                  local_240[9] = (RTCHitN)auStack_230[9];
                  local_240[10] = (RTCHitN)auStack_230[10];
                  local_240[0xb] = (RTCHitN)auStack_230[0xb];
                  local_240[0xc] = (RTCHitN)auStack_230[0xc];
                  local_240[0xd] = (RTCHitN)auStack_230[0xd];
                  local_240[0xe] = (RTCHitN)auStack_230[0xe];
                  local_240[0xf] = (RTCHitN)auStack_230[0xf];
                  auStack_210 = vshufps_avx(auVar218,auVar218,0x55);
                  auVar240 = ZEXT1664(auStack_210);
                  local_220 = auStack_210;
                  auStack_1f0 = vshufps_avx(auVar218,auVar218,0xaa);
                  local_200 = auStack_1f0;
                  fStack_1dc = local_1e0;
                  fStack_1d8 = local_1e0;
                  fStack_1d4 = local_1e0;
                  fStack_1d0 = local_1e0;
                  fStack_1cc = local_1e0;
                  fStack_1c8 = local_1e0;
                  fStack_1c4 = local_1e0;
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_1a0 = local_760._0_8_;
                  uStack_198 = local_760._8_8_;
                  uStack_190 = local_760._16_8_;
                  uStack_188 = local_760._24_8_;
                  local_180 = local_880;
                  uStack_178 = uStack_878;
                  uStack_170 = uStack_870;
                  uStack_168 = uStack_868;
                  _local_860 = vcmpps_avx(auVar168._0_32_,auVar168._0_32_,0xf);
                  local_7e8[1] = _local_860;
                  *local_7e8 = _local_860;
                  local_160 = (local_910.context)->instID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_140 = (local_910.context)->instPrimID[0];
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  local_820 = local_8e0;
                  uStack_818 = uStack_8d8;
                  uStack_810 = uStack_8d0;
                  uStack_808 = uStack_8c8;
                  local_910.valid = (int *)&local_820;
                  local_910.geometryUserPtr = pGVar17->userPtr;
                  local_910.hit = local_240;
                  local_910.N = 8;
                  local_910.ray = (RTCRayN *)ray;
                  if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_7e0._0_4_ = uVar310;
                    auVar240 = ZEXT1664(auStack_210);
                    (*pGVar17->intersectionFilterN)(&local_910);
                    auVar332 = ZEXT3264(_local_840);
                    auVar203 = ZEXT3264(local_5e0);
                    auVar349 = ZEXT3264(local_5c0);
                    auVar168 = ZEXT1664(ZEXT816(0) << 0x40);
                    uVar310 = local_7e0._0_4_;
                    fVar251 = (float)local_740._0_4_;
                    fVar263 = (float)local_740._4_4_;
                    fVar265 = fStack_738;
                    fVar267 = fStack_734;
                    fVar294 = fStack_730;
                    fVar295 = fStack_72c;
                    fVar296 = fStack_728;
                  }
                  auVar122._8_8_ = uStack_818;
                  auVar122._0_8_ = local_820;
                  auVar189 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar122);
                  auVar126._8_8_ = uStack_808;
                  auVar126._0_8_ = uStack_810;
                  auVar215 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar126);
                  auVar164._16_16_ = auVar215;
                  auVar164._0_16_ = auVar189;
                  auVar197 = _local_860 & ~auVar164;
                  if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar197 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar197 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar197 >> 0x7f,0) == '\0') &&
                        (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar197 >> 0xbf,0) == '\0') &&
                      (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar197[0x1f]) {
                    auVar165._0_4_ = auVar189._0_4_ ^ local_860._0_4_;
                    auVar165._4_4_ = auVar189._4_4_ ^ local_860._4_4_;
                    auVar165._8_4_ = auVar189._8_4_ ^ local_860._8_4_;
                    auVar165._12_4_ = auVar189._12_4_ ^ local_860._12_4_;
                    auVar165._16_4_ = auVar215._0_4_ ^ local_860._16_4_;
                    auVar165._20_4_ = auVar215._4_4_ ^ local_860._20_4_;
                    auVar165._24_4_ = auVar215._8_4_ ^ local_860._24_4_;
                    auVar165._28_4_ = auVar215._12_4_ ^ local_860._28_4_;
                    fVar366 = (float)local_8a0._0_4_;
                    fVar370 = (float)local_8a0._4_4_;
                    fVar371 = fStack_898;
                    fVar372 = fStack_894;
                    fVar183 = fStack_890;
                    fVar204 = fStack_88c;
                    fVar205 = fStack_888;
                    fVar207 = fStack_884;
                  }
                  else {
                    p_Var20 = context->args->filter;
                    if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                      local_7e0._0_4_ = uVar310;
                      auVar240 = ZEXT1664(auVar240._0_16_);
                      (*p_Var20)(&local_910);
                      auVar332 = ZEXT3264(_local_840);
                      auVar203 = ZEXT3264(local_5e0);
                      auVar349 = ZEXT3264(local_5c0);
                      auVar168 = ZEXT1664(ZEXT816(0) << 0x40);
                      uVar310 = local_7e0._0_4_;
                      fVar251 = (float)local_740._0_4_;
                      fVar263 = (float)local_740._4_4_;
                      fVar265 = fStack_738;
                      fVar267 = fStack_734;
                      fVar294 = fStack_730;
                      fVar295 = fStack_72c;
                      fVar296 = fStack_728;
                    }
                    auVar123._8_8_ = uStack_818;
                    auVar123._0_8_ = local_820;
                    auVar189 = vpcmpeqd_avx((undefined1  [16])0x0,auVar123);
                    auVar127._8_8_ = uStack_808;
                    auVar127._0_8_ = uStack_810;
                    auVar215 = vpcmpeqd_avx((undefined1  [16])0x0,auVar127);
                    auVar201._16_16_ = auVar215;
                    auVar201._0_16_ = auVar189;
                    auVar165._0_4_ = auVar189._0_4_ ^ local_860._0_4_;
                    auVar165._4_4_ = auVar189._4_4_ ^ local_860._4_4_;
                    auVar165._8_4_ = auVar189._8_4_ ^ local_860._8_4_;
                    auVar165._12_4_ = auVar189._12_4_ ^ local_860._12_4_;
                    auVar165._16_4_ = auVar215._0_4_ ^ local_860._16_4_;
                    auVar165._20_4_ = auVar215._4_4_ ^ local_860._20_4_;
                    auVar165._24_4_ = auVar215._8_4_ ^ local_860._24_4_;
                    auVar165._28_4_ = auVar215._12_4_ ^ local_860._28_4_;
                    _local_860 = _local_860 & ~auVar201;
                    fVar366 = (float)local_8a0._0_4_;
                    fVar370 = (float)local_8a0._4_4_;
                    fVar371 = fStack_898;
                    fVar372 = fStack_894;
                    fVar183 = fStack_890;
                    fVar204 = fStack_88c;
                    fVar205 = fStack_888;
                    fVar207 = fStack_884;
                    if ((((((((_local_860 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             || (_local_860 >> 0x3f & (undefined1  [32])0x1) !=
                                (undefined1  [32])0x0) ||
                            (_local_860 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                           || SUB321(_local_860 >> 0x7f,0) != '\0') ||
                          (_local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(_local_860 >> 0xbf,0) != '\0') ||
                        (_local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        local_860[0x1f] < '\0') {
                      auVar197 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])local_910.hit);
                      *(undefined1 (*) [32])(local_910.ray + 0x180) = auVar197;
                      auVar197 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                          (local_910.hit + 0x20));
                      *(undefined1 (*) [32])(local_910.ray + 0x1a0) = auVar197;
                      auVar197 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                          (local_910.hit + 0x40));
                      *(undefined1 (*) [32])(local_910.ray + 0x1c0) = auVar197;
                      auVar197 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                          (local_910.hit + 0x60));
                      *(undefined1 (*) [32])(local_910.ray + 0x1e0) = auVar197;
                      auVar197 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                          (local_910.hit + 0x80));
                      *(undefined1 (*) [32])(local_910.ray + 0x200) = auVar197;
                      auVar197 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                          (local_910.hit + 0xa0));
                      *(undefined1 (*) [32])(local_910.ray + 0x220) = auVar197;
                      auVar197 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                          (local_910.hit + 0xc0));
                      *(undefined1 (*) [32])(local_910.ray + 0x240) = auVar197;
                      auVar197 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                          (local_910.hit + 0xe0));
                      *(undefined1 (*) [32])(local_910.ray + 0x260) = auVar197;
                      auVar197 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                          (local_910.hit + 0x100));
                      *(undefined1 (*) [32])(local_910.ray + 0x280) = auVar197;
                    }
                  }
                  auVar197 = auVar203._0_32_;
                  if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar165 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar165 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar165 >> 0x7f,0) == '\0') &&
                        (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar165 >> 0xbf,0) == '\0') &&
                      (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar165[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar310;
                  }
                  *(undefined4 *)(local_660 + uVar139 * 4) = 0;
                  uVar310 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar166._4_4_ = uVar310;
                  auVar166._0_4_ = uVar310;
                  auVar166._8_4_ = uVar310;
                  auVar166._12_4_ = uVar310;
                  auVar166._16_4_ = uVar310;
                  auVar166._20_4_ = uVar310;
                  auVar166._24_4_ = uVar310;
                  auVar166._28_4_ = uVar310;
                  auVar167 = vcmpps_avx(auVar197,auVar166,2);
                  auVar276 = vandps_avx(auVar167,local_660);
                  auVar167 = local_660 & auVar167;
                  bVar115 = (auVar167 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar116 = (auVar167 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar114 = (auVar167 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar113 = SUB321(auVar167 >> 0x7f,0) != '\0';
                  bVar112 = (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar111 = SUB321(auVar167 >> 0xbf,0) != '\0';
                  bVar110 = (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar109 = auVar167[0x1f] < '\0';
                  if (((((((bVar115 || bVar116) || bVar114) || bVar113) || bVar112) || bVar111) ||
                      bVar110) || bVar109) {
                    auVar202._8_4_ = 0x7f800000;
                    auVar202._0_8_ = 0x7f8000007f800000;
                    auVar202._12_4_ = 0x7f800000;
                    auVar202._16_4_ = 0x7f800000;
                    auVar202._20_4_ = 0x7f800000;
                    auVar202._24_4_ = 0x7f800000;
                    auVar202._28_4_ = 0x7f800000;
                    auVar167 = vblendvps_avx(auVar202,auVar197,auVar276);
                    auVar156 = vshufps_avx(auVar167,auVar167,0xb1);
                    auVar156 = vminps_avx(auVar167,auVar156);
                    auVar22 = vshufpd_avx(auVar156,auVar156,5);
                    auVar156 = vminps_avx(auVar156,auVar22);
                    auVar22 = vperm2f128_avx(auVar156,auVar156,1);
                    auVar240 = ZEXT3264(auVar22);
                    local_660 = vminps_avx(auVar156,auVar22);
                    auVar156 = vcmpps_avx(auVar167,local_660,0);
                    auVar22 = auVar276 & auVar156;
                    auVar167 = auVar276;
                    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar22 >> 0x7f,0) != '\0') ||
                          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar22 >> 0xbf,0) != '\0') ||
                        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar22[0x1f] < '\0') {
                      auVar167 = vandps_avx(auVar156,auVar276);
                    }
                    uVar137 = vmovmskps_avx(auVar167);
                    uVar138 = 0;
                    if (uVar137 != 0) {
                      for (; (uVar137 >> uVar138 & 1) == 0; uVar138 = uVar138 + 1) {
                      }
                    }
                    uVar139 = (ulong)uVar138;
                  }
                  auVar220 = ZEXT3264(local_660);
                  auVar167 = auVar349._0_32_;
                  local_660 = auVar276;
                } while (((((((bVar115 || bVar116) || bVar114) || bVar113) || bVar112) || bVar111)
                         || bVar110) || bVar109);
              }
              goto LAB_010848d9;
            }
          }
        }
        local_540._0_4_ = fVar229;
        _local_6b0 = auVar360;
        _local_6d0 = auVar343;
        fVar175 = (float)local_7a0._0_4_;
        fVar178 = (float)local_7a0._4_4_;
        fVar230 = fStack_798;
        fVar242 = fStack_794;
        fVar228 = fStack_790;
        fVar241 = fStack_78c;
        fVar243 = fStack_788;
        fVar244 = fStack_784;
        fVar229 = (float)local_540._0_4_;
      }
      local_540._0_4_ = fVar229;
      if (8 < (int)uVar16) {
        _local_840 = auVar332._0_32_;
        auVar189 = vpshufd_avx(ZEXT416(uVar16),0);
        local_340._0_16_ = auVar189;
        auVar189 = vshufps_avx(local_7c0._0_16_,local_7c0._0_16_,0);
        local_a0._16_16_ = auVar189;
        local_a0._0_16_ = auVar189;
        auVar189 = vpermilps_avx(ZEXT416(uVar141),0);
        local_c0._16_16_ = auVar189;
        local_c0._0_16_ = auVar189;
        auVar151._0_4_ = 1.0 / (float)local_540._0_4_;
        auVar151._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar189 = vshufps_avx(auVar151,auVar151,0);
        register0x00001210 = auVar189;
        _local_e0 = auVar189;
        auVar189 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
        local_100._16_16_ = auVar189;
        local_100._0_16_ = auVar189;
        auVar189 = vshufps_avx(ZEXT416(uVar15),ZEXT416(uVar15),0);
        local_120._16_16_ = auVar189;
        local_120._0_16_ = auVar189;
        auVar168 = ZEXT3264(local_120);
        lVar142 = 8;
        fVar245 = (float)local_720._0_4_;
        fVar249 = (float)local_720._4_4_;
        fVar261 = fStack_718;
        fVar264 = fStack_714;
        fVar266 = fStack_710;
        fVar269 = fStack_70c;
        fVar280 = fStack_708;
        do {
          pauVar9 = (undefined1 (*) [28])(catmullrom_basis0 + lVar142 * 4 + lVar21);
          fVar282 = *(float *)*pauVar9;
          fVar284 = *(float *)(*pauVar9 + 4);
          fVar247 = *(float *)(*pauVar9 + 8);
          fVar337 = *(float *)(*pauVar9 + 0xc);
          fVar286 = *(float *)(*pauVar9 + 0x10);
          fVar338 = *(float *)(*pauVar9 + 0x14);
          fVar177 = *(float *)(*pauVar9 + 0x18);
          auVar132 = *pauVar9;
          pauVar10 = (undefined1 (*) [28])(lVar21 + 0x22307f0 + lVar142 * 4);
          fVar339 = *(float *)*pauVar10;
          fVar182 = *(float *)(*pauVar10 + 4);
          fVar340 = *(float *)(*pauVar10 + 8);
          fVar333 = *(float *)(*pauVar10 + 0xc);
          fVar308 = *(float *)(*pauVar10 + 0x10);
          fVar309 = *(float *)(*pauVar10 + 0x14);
          fVar246 = *(float *)(*pauVar10 + 0x18);
          auVar131 = *pauVar10;
          pfVar1 = (float *)(lVar21 + 0x2230c74 + lVar142 * 4);
          local_680 = *pfVar1;
          fStack_67c = pfVar1[1];
          fStack_678 = pfVar1[2];
          fStack_674 = pfVar1[3];
          fStack_670 = pfVar1[4];
          fStack_66c = pfVar1[5];
          fStack_668 = pfVar1[6];
          fStack_664 = pfVar1[7];
          pauVar11 = (undefined1 (*) [32])(lVar21 + 0x22310f8 + lVar142 * 4);
          fVar334 = *(float *)*pauVar11;
          fVar316 = *(float *)(*pauVar11 + 4);
          fVar317 = *(float *)(*pauVar11 + 8);
          fVar248 = *(float *)(*pauVar11 + 0xc);
          fVar318 = *(float *)(*pauVar11 + 0x10);
          fVar145 = *(float *)(*pauVar11 + 0x14);
          fVar170 = *(float *)(*pauVar11 + 0x18);
          auVar130 = *(undefined1 (*) [28])*pauVar11;
          fVar169 = auVar240._28_4_;
          fVar227 = fVar169 + auVar220._28_4_;
          fVar180 = fVar169 + fVar169 + auVar168._28_4_;
          fVar297 = fVar169 + auVar332._28_4_ + fVar169;
          local_7c0._0_4_ =
               (float)local_520._0_4_ * fVar282 +
               fVar251 * fVar339 +
               (float)local_700._0_4_ * local_680 + (float)local_560._0_4_ * fVar334;
          local_7c0._4_4_ =
               (float)local_520._4_4_ * fVar284 +
               fVar263 * fVar182 +
               (float)local_700._4_4_ * fStack_67c + (float)local_560._4_4_ * fVar316;
          local_7c0._8_4_ =
               fStack_518 * fVar247 +
               fVar265 * fVar340 + fStack_6f8 * fStack_678 + fStack_558 * fVar317;
          local_7c0._12_4_ =
               fStack_514 * fVar337 +
               fVar267 * fVar333 + fStack_6f4 * fStack_674 + fStack_554 * fVar248;
          local_7c0._16_4_ =
               fStack_510 * fVar286 +
               fVar294 * fVar308 + fStack_6f0 * fStack_670 + fStack_550 * fVar318;
          local_7c0._20_4_ =
               fStack_50c * fVar338 +
               fVar295 * fVar309 + fStack_6ec * fStack_66c + fStack_54c * fVar145;
          local_7c0._24_4_ =
               fStack_508 * fVar177 +
               fVar296 * fVar246 + fStack_6e8 * fStack_668 + fStack_548 * fVar170;
          local_7c0._28_4_ = fVar227 + fVar180;
          auVar332 = ZEXT3264(local_7c0);
          auVar321._0_4_ =
               (float)local_260._0_4_ * fVar282 +
               fVar339 * fVar366 + fVar175 * fVar334 + fVar245 * local_680;
          auVar321._4_4_ =
               (float)local_260._4_4_ * fVar284 +
               fVar182 * fVar370 + fVar178 * fVar316 + fVar249 * fStack_67c;
          auVar321._8_4_ =
               fStack_258 * fVar247 + fVar340 * fVar371 + fVar230 * fVar317 + fVar261 * fStack_678;
          auVar321._12_4_ =
               fStack_254 * fVar337 + fVar333 * fVar372 + fVar242 * fVar248 + fVar264 * fStack_674;
          auVar321._16_4_ =
               fStack_250 * fVar286 + fVar308 * fVar183 + fVar228 * fVar318 + fVar266 * fStack_670;
          auVar321._20_4_ =
               fStack_24c * fVar338 + fVar309 * fVar204 + fVar241 * fVar145 + fVar269 * fStack_66c;
          auVar321._24_4_ =
               fStack_248 * fVar177 + fVar246 * fVar205 + fVar243 * fVar170 + fVar280 * fStack_668;
          auVar321._28_4_ = fVar180 + fVar297;
          fVar146 = fVar282 * (float)local_2e0._0_4_ +
                    fVar339 * (float)local_2c0._0_4_ +
                    local_680 * (float)local_280._0_4_ + fVar334 * (float)local_2a0._0_4_;
          fVar171 = fVar284 * (float)local_2e0._4_4_ +
                    fVar182 * (float)local_2c0._4_4_ +
                    fStack_67c * (float)local_280._4_4_ + fVar316 * (float)local_2a0._4_4_;
          fVar173 = fVar247 * fStack_2d8 +
                    fVar340 * fStack_2b8 + fStack_678 * fStack_278 + fVar317 * fStack_298;
          fVar229 = fVar337 * fStack_2d4 +
                    fVar333 * fStack_2b4 + fStack_674 * fStack_274 + fVar248 * fStack_294;
          fVar174 = fVar286 * fStack_2d0 +
                    fVar308 * fStack_2b0 + fStack_670 * fStack_270 + fVar318 * fStack_290;
          fVar176 = fVar338 * fStack_2cc +
                    fVar309 * fStack_2ac + fStack_66c * fStack_26c + fVar145 * fStack_28c;
          fVar179 = fVar177 * fStack_2c8 +
                    fVar246 * fStack_2a8 + fStack_668 * fStack_268 + fVar170 * fStack_288;
          fVar180 = fVar180 + fVar169 + fVar227;
          pfVar1 = (float *)(catmullrom_basis1 + lVar142 * 4 + lVar21);
          fVar337 = *pfVar1;
          fVar286 = pfVar1[1];
          fVar338 = pfVar1[2];
          fVar177 = pfVar1[3];
          fVar339 = pfVar1[4];
          fVar182 = pfVar1[5];
          fVar340 = pfVar1[6];
          pauVar10 = (undefined1 (*) [28])(lVar21 + 0x2232c10 + lVar142 * 4);
          fVar282 = *(float *)*pauVar10;
          fVar284 = *(float *)(*pauVar10 + 4);
          fVar247 = *(float *)(*pauVar10 + 8);
          fVar333 = *(float *)(*pauVar10 + 0xc);
          fVar308 = *(float *)(*pauVar10 + 0x10);
          fVar309 = *(float *)(*pauVar10 + 0x14);
          fVar246 = *(float *)(*pauVar10 + 0x18);
          auVar134 = *pauVar10;
          pfVar2 = (float *)(lVar21 + 0x2233094 + lVar142 * 4);
          fVar334 = *pfVar2;
          fVar316 = pfVar2[1];
          fVar317 = pfVar2[2];
          fVar248 = pfVar2[3];
          fVar318 = pfVar2[4];
          fVar145 = pfVar2[5];
          fVar170 = pfVar2[6];
          pauVar12 = (undefined1 (*) [16])(lVar21 + 0x2233518 + lVar142 * 4);
          fVar227 = *(float *)*pauVar12;
          fVar169 = *(float *)(*pauVar12 + 4);
          fVar172 = *(float *)(*pauVar12 + 8);
          auVar133 = *(undefined1 (*) [12])*pauVar12;
          fVar209 = *(float *)(*pauVar12 + 0xc);
          fStack_530 = *(float *)pauVar12[1];
          fStack_52c = *(float *)(pauVar12[1] + 4);
          fStack_528 = *(float *)(pauVar12[1] + 8);
          fStack_524 = *(float *)(pauVar12[1] + 0xc);
          fVar268 = fVar207 + fVar207 + *(float *)pauVar9[1];
          auVar292._0_4_ =
               (float)local_520._0_4_ * fVar337 +
               fVar251 * fVar282 +
               (float)local_700._0_4_ * fVar334 + (float)local_560._0_4_ * fVar227;
          auVar292._4_4_ =
               (float)local_520._4_4_ * fVar286 +
               fVar263 * fVar284 +
               (float)local_700._4_4_ * fVar316 + (float)local_560._4_4_ * fVar169;
          auVar292._8_4_ =
               fStack_518 * fVar338 +
               fVar265 * fVar247 + fStack_6f8 * fVar317 + fStack_558 * fVar172;
          auVar292._12_4_ =
               fStack_514 * fVar177 +
               fVar267 * fVar333 + fStack_6f4 * fVar248 + fStack_554 * fVar209;
          auVar292._16_4_ =
               fStack_510 * fVar339 +
               fVar294 * fVar308 + fStack_6f0 * fVar318 + fStack_550 * fStack_530;
          auVar292._20_4_ =
               fStack_50c * fVar182 +
               fVar295 * fVar309 + fStack_6ec * fVar145 + fStack_54c * fStack_52c;
          auVar292._24_4_ =
               fStack_508 * fVar340 +
               fVar296 * fVar246 + fStack_6e8 * fVar170 + fStack_548 * fStack_528;
          auVar292._28_4_ = fStack_524 + fVar207 + fVar268;
          auVar277._0_4_ =
               (float)local_260._0_4_ * fVar337 +
               fVar366 * fVar282 + fVar245 * fVar334 + fVar175 * fVar227;
          auVar277._4_4_ =
               (float)local_260._4_4_ * fVar286 +
               fVar370 * fVar284 + fVar249 * fVar316 + fVar178 * fVar169;
          auVar277._8_4_ =
               fStack_258 * fVar338 + fVar371 * fVar247 + fVar261 * fVar317 + fVar230 * fVar172;
          auVar277._12_4_ =
               fStack_254 * fVar177 + fVar372 * fVar333 + fVar264 * fVar248 + fVar242 * fVar209;
          auVar277._16_4_ =
               fStack_250 * fVar339 + fVar183 * fVar308 + fVar266 * fVar318 + fVar228 * fStack_530;
          auVar277._20_4_ =
               fStack_24c * fVar182 + fVar204 * fVar309 + fVar269 * fVar145 + fVar241 * fStack_52c;
          auVar277._24_4_ =
               fStack_248 * fVar340 + fVar205 * fVar246 + fVar280 * fVar170 + fVar243 * fStack_528;
          auVar277._28_4_ = fVar268 + fVar207 + fVar207 + fVar297;
          auVar307._0_4_ =
               fVar337 * (float)local_2e0._0_4_ +
               fVar282 * (float)local_2c0._0_4_ +
               fVar227 * (float)local_2a0._0_4_ + fVar334 * (float)local_280._0_4_;
          auVar307._4_4_ =
               fVar286 * (float)local_2e0._4_4_ +
               fVar284 * (float)local_2c0._4_4_ +
               fVar169 * (float)local_2a0._4_4_ + fVar316 * (float)local_280._4_4_;
          auVar307._8_4_ =
               fVar338 * fStack_2d8 +
               fVar247 * fStack_2b8 + fVar172 * fStack_298 + fVar317 * fStack_278;
          auVar307._12_4_ =
               fVar177 * fStack_2d4 +
               fVar333 * fStack_2b4 + fVar209 * fStack_294 + fVar248 * fStack_274;
          auVar307._16_4_ =
               fVar339 * fStack_2d0 +
               fVar308 * fStack_2b0 + fStack_530 * fStack_290 + fVar318 * fStack_270;
          auVar307._20_4_ =
               fVar182 * fStack_2cc +
               fVar309 * fStack_2ac + fStack_52c * fStack_28c + fVar145 * fStack_26c;
          auVar307._24_4_ =
               fVar340 * fStack_2c8 +
               fVar246 * fStack_2a8 + fStack_528 * fStack_288 + fVar170 * fStack_268;
          auVar307._28_4_ = fVar268 + fVar207 + fStack_524 + fVar207;
          auVar167 = vsubps_avx(auVar292,local_7c0);
          local_380 = vsubps_avx(auVar277,auVar321);
          auVar168 = ZEXT3264(local_380);
          fVar183 = auVar167._0_4_;
          fVar205 = auVar167._4_4_;
          auVar66._4_4_ = auVar321._4_4_ * fVar205;
          auVar66._0_4_ = auVar321._0_4_ * fVar183;
          fVar245 = auVar167._8_4_;
          auVar66._8_4_ = auVar321._8_4_ * fVar245;
          fVar261 = auVar167._12_4_;
          auVar66._12_4_ = auVar321._12_4_ * fVar261;
          fVar266 = auVar167._16_4_;
          auVar66._16_4_ = auVar321._16_4_ * fVar266;
          fVar280 = auVar167._20_4_;
          auVar66._20_4_ = auVar321._20_4_ * fVar280;
          fVar284 = auVar167._24_4_;
          auVar66._24_4_ = auVar321._24_4_ * fVar284;
          auVar66._28_4_ = fVar268;
          fVar204 = local_380._0_4_;
          fVar207 = local_380._4_4_;
          auVar67._4_4_ = local_7c0._4_4_ * fVar207;
          auVar67._0_4_ = local_7c0._0_4_ * fVar204;
          fVar249 = local_380._8_4_;
          auVar67._8_4_ = local_7c0._8_4_ * fVar249;
          fVar264 = local_380._12_4_;
          auVar67._12_4_ = local_7c0._12_4_ * fVar264;
          fVar269 = local_380._16_4_;
          auVar67._16_4_ = local_7c0._16_4_ * fVar269;
          fVar282 = local_380._20_4_;
          auVar67._20_4_ = local_7c0._20_4_ * fVar282;
          fVar247 = local_380._24_4_;
          auVar67._24_4_ = local_7c0._24_4_ * fVar247;
          auVar67._28_4_ = auVar277._28_4_;
          auVar276 = vsubps_avx(auVar66,auVar67);
          auVar119._4_4_ = fVar171;
          auVar119._0_4_ = fVar146;
          auVar119._8_4_ = fVar173;
          auVar119._12_4_ = fVar229;
          auVar119._16_4_ = fVar174;
          auVar119._20_4_ = fVar176;
          auVar119._24_4_ = fVar179;
          auVar119._28_4_ = fVar180;
          auVar197 = vmaxps_avx(auVar119,auVar307);
          auVar68._4_4_ = auVar197._4_4_ * auVar197._4_4_ * (fVar205 * fVar205 + fVar207 * fVar207);
          auVar68._0_4_ = auVar197._0_4_ * auVar197._0_4_ * (fVar183 * fVar183 + fVar204 * fVar204);
          auVar68._8_4_ = auVar197._8_4_ * auVar197._8_4_ * (fVar245 * fVar245 + fVar249 * fVar249);
          auVar68._12_4_ =
               auVar197._12_4_ * auVar197._12_4_ * (fVar261 * fVar261 + fVar264 * fVar264);
          auVar68._16_4_ =
               auVar197._16_4_ * auVar197._16_4_ * (fVar266 * fVar266 + fVar269 * fVar269);
          auVar68._20_4_ =
               auVar197._20_4_ * auVar197._20_4_ * (fVar280 * fVar280 + fVar282 * fVar282);
          auVar68._24_4_ =
               auVar197._24_4_ * auVar197._24_4_ * (fVar284 * fVar284 + fVar247 * fVar247);
          auVar68._28_4_ = auVar292._28_4_ + auVar277._28_4_;
          auVar69._4_4_ = auVar276._4_4_ * auVar276._4_4_;
          auVar69._0_4_ = auVar276._0_4_ * auVar276._0_4_;
          auVar69._8_4_ = auVar276._8_4_ * auVar276._8_4_;
          auVar69._12_4_ = auVar276._12_4_ * auVar276._12_4_;
          auVar69._16_4_ = auVar276._16_4_ * auVar276._16_4_;
          auVar69._20_4_ = auVar276._20_4_ * auVar276._20_4_;
          auVar69._24_4_ = auVar276._24_4_ * auVar276._24_4_;
          auVar69._28_4_ = auVar276._28_4_;
          auVar197 = vcmpps_avx(auVar69,auVar68,2);
          auVar220 = ZEXT3264(auVar197);
          local_4a0 = (uint)lVar142;
          auVar215 = vpshufd_avx(ZEXT416(local_4a0),0);
          auVar189 = vpor_avx(auVar215,_DAT_01ff0cf0);
          auVar215 = vpor_avx(auVar215,_DAT_02020ea0);
          auVar189 = vpcmpgtd_avx(local_340._0_16_,auVar189);
          auVar215 = vpcmpgtd_avx(local_340._0_16_,auVar215);
          register0x000012d0 = auVar215;
          _local_360 = auVar189;
          auVar240 = ZEXT3264(_local_360);
          auVar276 = _local_360 & auVar197;
          fVar366 = (float)local_8a0._0_4_;
          fVar370 = (float)local_8a0._4_4_;
          fVar371 = fStack_898;
          fVar372 = fStack_894;
          fVar183 = fStack_890;
          fVar204 = fStack_88c;
          fVar205 = fStack_888;
          fVar207 = fStack_884;
          fVar245 = (float)local_720._0_4_;
          fVar249 = (float)local_720._4_4_;
          fVar261 = fStack_718;
          fVar264 = fStack_714;
          fVar266 = fStack_710;
          fVar269 = fStack_70c;
          fVar280 = fStack_708;
          if ((((((((auVar276 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar276 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar276 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar276 >> 0x7f,0) != '\0') ||
                (auVar276 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar276 >> 0xbf,0) != '\0') ||
              (auVar276 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar276[0x1f] < '\0') {
            local_8e0._0_4_ = auVar134._0_4_;
            local_8e0._4_4_ = auVar134._4_4_;
            uStack_8d8._0_4_ = auVar134._8_4_;
            uStack_8d8._4_4_ = auVar134._12_4_;
            uStack_8d0._0_4_ = auVar134._16_4_;
            uStack_8d0._4_4_ = auVar134._20_4_;
            uStack_8c8._0_4_ = auVar134._24_4_;
            local_540._0_4_ = auVar133._0_4_;
            local_540._4_4_ = auVar133._4_4_;
            fStack_538 = auVar133._8_4_;
            local_580 = fVar337 * (float)local_840._0_4_ +
                        (float)local_320._0_4_ * (float)local_8e0._0_4_ +
                        (float)local_80._0_4_ * fVar334 +
                        (float)local_6a0._0_4_ * (float)local_540._0_4_;
            fStack_57c = fVar286 * (float)local_840._4_4_ +
                         (float)local_320._4_4_ * (float)local_8e0._4_4_ +
                         (float)local_80._4_4_ * fVar316 +
                         (float)local_6a0._4_4_ * (float)local_540._4_4_;
            fStack_578 = fVar338 * fStack_838 +
                         fStack_318 * (float)uStack_8d8 +
                         fStack_78 * fVar317 + fStack_698 * fStack_538;
            fStack_574 = fVar177 * fStack_834 +
                         fStack_314 * uStack_8d8._4_4_ + fStack_74 * fVar248 + fStack_694 * fVar209;
            fStack_570 = fVar339 * fStack_830 +
                         fStack_310 * (float)uStack_8d0 +
                         fStack_70 * fVar318 + fStack_690 * fStack_530;
            fStack_56c = fVar182 * fStack_82c +
                         fStack_30c * uStack_8d0._4_4_ +
                         fStack_6c * fVar145 + fStack_68c * fStack_52c;
            fStack_568 = fVar340 * fStack_828 +
                         fStack_308 * (float)uStack_8c8 +
                         fStack_68 * fVar170 + fStack_688 * fStack_528;
            fStack_564 = auVar321._28_4_ + local_380._28_4_ + fVar180 + 0.0;
            local_8c0._0_4_ = auVar131._0_4_;
            local_8c0._4_4_ = auVar131._4_4_;
            uStack_8b8._0_4_ = auVar131._8_4_;
            uStack_8b8._4_4_ = auVar131._12_4_;
            auStack_8b0._0_4_ = auVar131._16_4_;
            auStack_8b0._4_4_ = auVar131._20_4_;
            fStack_8a8 = auVar131._24_4_;
            local_780._0_4_ = auVar130._0_4_;
            local_780._4_4_ = auVar130._4_4_;
            uStack_778._0_4_ = auVar130._8_4_;
            uStack_778._4_4_ = auVar130._12_4_;
            fStack_770 = auVar130._16_4_;
            fStack_76c = auVar130._20_4_;
            fStack_768 = auVar130._24_4_;
            pfVar2 = (float *)(lVar21 + 0x2231e84 + lVar142 * 4);
            fVar282 = *pfVar2;
            fVar284 = pfVar2[1];
            fVar247 = pfVar2[2];
            fVar337 = pfVar2[3];
            fVar286 = pfVar2[4];
            fVar338 = pfVar2[5];
            fVar177 = pfVar2[6];
            pfVar3 = (float *)(lVar21 + 0x2232308 + lVar142 * 4);
            fVar339 = *pfVar3;
            fVar182 = pfVar3[1];
            fVar340 = pfVar3[2];
            fVar333 = pfVar3[3];
            fVar308 = pfVar3[4];
            fVar309 = pfVar3[5];
            fVar246 = pfVar3[6];
            fVar298 = pfVar1[7] + 0.0;
            pfVar4 = (float *)(lVar21 + 0x2231a00 + lVar142 * 4);
            fVar334 = *pfVar4;
            fVar316 = pfVar4[1];
            fVar317 = pfVar4[2];
            fVar248 = pfVar4[3];
            fVar318 = pfVar4[4];
            fVar145 = pfVar4[5];
            fVar170 = pfVar4[6];
            fVar181 = pfVar2[7] + pfVar3[7];
            fVar210 = pfVar3[7] + fVar298;
            fVar298 = pfVar1[7] + fStack_244 + fVar298;
            pfVar1 = (float *)(lVar21 + 0x223157c + lVar142 * 4);
            fVar227 = *pfVar1;
            fVar169 = pfVar1[1];
            fVar172 = pfVar1[2];
            fVar209 = pfVar1[3];
            fVar268 = pfVar1[4];
            fVar297 = pfVar1[5];
            fVar206 = pfVar1[6];
            auVar157._0_4_ =
                 (float)local_520._0_4_ * fVar227 +
                 fVar251 * fVar334 +
                 (float)local_700._0_4_ * fVar282 + (float)local_560._0_4_ * fVar339;
            auVar157._4_4_ =
                 (float)local_520._4_4_ * fVar169 +
                 fVar263 * fVar316 +
                 (float)local_700._4_4_ * fVar284 + (float)local_560._4_4_ * fVar182;
            auVar157._8_4_ =
                 fStack_518 * fVar172 +
                 fVar265 * fVar317 + fStack_6f8 * fVar247 + fStack_558 * fVar340;
            auVar157._12_4_ =
                 fStack_514 * fVar209 +
                 fVar267 * fVar248 + fStack_6f4 * fVar337 + fStack_554 * fVar333;
            auVar157._16_4_ =
                 fStack_510 * fVar268 +
                 fVar294 * fVar318 + fStack_6f0 * fVar286 + fStack_550 * fVar308;
            auVar157._20_4_ =
                 fStack_50c * fVar297 +
                 fVar295 * fVar145 + fStack_6ec * fVar338 + fStack_54c * fVar309;
            auVar157._24_4_ =
                 fStack_508 * fVar206 +
                 fVar296 * fVar170 + fStack_6e8 * fVar177 + fStack_548 * fVar246;
            auVar157._28_4_ = fVar181 + fVar210;
            auVar194._0_4_ =
                 fVar227 * (float)local_260._0_4_ +
                 (float)local_720._0_4_ * fVar282 + fVar175 * fVar339 +
                 fVar334 * (float)local_8a0._0_4_;
            auVar194._4_4_ =
                 fVar169 * (float)local_260._4_4_ +
                 (float)local_720._4_4_ * fVar284 + fVar178 * fVar182 +
                 fVar316 * (float)local_8a0._4_4_;
            auVar194._8_4_ =
                 fVar172 * fStack_258 +
                 fStack_718 * fVar247 + fVar230 * fVar340 + fVar317 * fStack_898;
            auVar194._12_4_ =
                 fVar209 * fStack_254 +
                 fStack_714 * fVar337 + fVar242 * fVar333 + fVar248 * fStack_894;
            auVar194._16_4_ =
                 fVar268 * fStack_250 +
                 fStack_710 * fVar286 + fVar228 * fVar308 + fVar318 * fStack_890;
            auVar194._20_4_ =
                 fVar297 * fStack_24c +
                 fStack_70c * fVar338 + fVar241 * fVar309 + fVar145 * fStack_88c;
            auVar194._24_4_ =
                 fVar206 * fStack_248 +
                 fStack_708 * fVar177 + fVar243 * fVar246 + fVar170 * fStack_888;
            auVar194._28_4_ = fVar210 + fVar298;
            auVar353._0_4_ =
                 fVar334 * (float)local_320._0_4_ +
                 (float)local_80._0_4_ * fVar282 + (float)local_6a0._0_4_ * fVar339 +
                 fVar227 * (float)local_840._0_4_;
            auVar353._4_4_ =
                 fVar316 * (float)local_320._4_4_ +
                 (float)local_80._4_4_ * fVar284 + (float)local_6a0._4_4_ * fVar182 +
                 fVar169 * (float)local_840._4_4_;
            auVar353._8_4_ =
                 fVar317 * fStack_318 + fStack_78 * fVar247 + fStack_698 * fVar340 +
                 fVar172 * fStack_838;
            auVar353._12_4_ =
                 fVar248 * fStack_314 + fStack_74 * fVar337 + fStack_694 * fVar333 +
                 fVar209 * fStack_834;
            auVar353._16_4_ =
                 fVar318 * fStack_310 + fStack_70 * fVar286 + fStack_690 * fVar308 +
                 fVar268 * fStack_830;
            auVar353._20_4_ =
                 fVar145 * fStack_30c + fStack_6c * fVar338 + fStack_68c * fVar309 +
                 fVar297 * fStack_82c;
            auVar353._24_4_ =
                 fVar170 * fStack_308 + fStack_68 * fVar177 + fStack_688 * fVar246 +
                 fVar206 * fStack_828;
            auVar353._28_4_ = pfVar4[7] + fVar181 + fVar298;
            pfVar1 = (float *)(lVar21 + 0x22342a4 + lVar142 * 4);
            fVar282 = *pfVar1;
            fVar284 = pfVar1[1];
            fVar247 = pfVar1[2];
            fVar337 = pfVar1[3];
            fVar286 = pfVar1[4];
            fVar338 = pfVar1[5];
            fVar177 = pfVar1[6];
            pfVar2 = (float *)(lVar21 + 0x2234728 + lVar142 * 4);
            fVar339 = *pfVar2;
            fVar182 = pfVar2[1];
            fVar340 = pfVar2[2];
            fVar333 = pfVar2[3];
            fVar308 = pfVar2[4];
            fVar309 = pfVar2[5];
            fVar246 = pfVar2[6];
            pfVar3 = (float *)(lVar21 + 0x2233e20 + lVar142 * 4);
            fVar334 = *pfVar3;
            fVar316 = pfVar3[1];
            fVar317 = pfVar3[2];
            fVar248 = pfVar3[3];
            fVar318 = pfVar3[4];
            fVar145 = pfVar3[5];
            fVar170 = pfVar3[6];
            pfVar4 = (float *)(lVar21 + 0x223399c + lVar142 * 4);
            fVar227 = *pfVar4;
            fVar169 = pfVar4[1];
            fVar172 = pfVar4[2];
            fVar209 = pfVar4[3];
            fVar251 = pfVar4[4];
            fVar263 = pfVar4[5];
            fVar265 = pfVar4[6];
            auVar322._0_4_ =
                 fVar227 * (float)local_520._0_4_ +
                 fVar334 * (float)local_740._0_4_ +
                 (float)local_700._0_4_ * fVar282 + (float)local_560._0_4_ * fVar339;
            auVar322._4_4_ =
                 fVar169 * (float)local_520._4_4_ +
                 fVar316 * (float)local_740._4_4_ +
                 (float)local_700._4_4_ * fVar284 + (float)local_560._4_4_ * fVar182;
            auVar322._8_4_ =
                 fVar172 * fStack_518 +
                 fVar317 * fStack_738 + fStack_6f8 * fVar247 + fStack_558 * fVar340;
            auVar322._12_4_ =
                 fVar209 * fStack_514 +
                 fVar248 * fStack_734 + fStack_6f4 * fVar337 + fStack_554 * fVar333;
            auVar322._16_4_ =
                 fVar251 * fStack_510 +
                 fVar318 * fStack_730 + fStack_6f0 * fVar286 + fStack_550 * fVar308;
            auVar322._20_4_ =
                 fVar263 * fStack_50c +
                 fVar145 * fStack_72c + fStack_6ec * fVar338 + fStack_54c * fVar309;
            auVar322._24_4_ =
                 fVar265 * fStack_508 +
                 fVar170 * fStack_728 + fStack_6e8 * fVar177 + fStack_548 * fVar246;
            auVar322._28_4_ = fVar244 + fVar244 + fStack_6e4 + fStack_244;
            auVar347._0_4_ =
                 (float)local_260._0_4_ * fVar227 +
                 fVar334 * (float)local_8a0._0_4_ +
                 (float)local_720._0_4_ * fVar282 + fVar175 * fVar339;
            auVar347._4_4_ =
                 (float)local_260._4_4_ * fVar169 +
                 fVar316 * (float)local_8a0._4_4_ +
                 (float)local_720._4_4_ * fVar284 + fVar178 * fVar182;
            auVar347._8_4_ =
                 fStack_258 * fVar172 +
                 fVar317 * fStack_898 + fStack_718 * fVar247 + fVar230 * fVar340;
            auVar347._12_4_ =
                 fStack_254 * fVar209 +
                 fVar248 * fStack_894 + fStack_714 * fVar337 + fVar242 * fVar333;
            auVar347._16_4_ =
                 fStack_250 * fVar251 +
                 fVar318 * fStack_890 + fStack_710 * fVar286 + fVar228 * fVar308;
            auVar347._20_4_ =
                 fStack_24c * fVar263 +
                 fVar145 * fStack_88c + fStack_70c * fVar338 + fVar241 * fVar309;
            auVar347._24_4_ =
                 fStack_248 * fVar265 +
                 fVar170 * fStack_888 + fStack_708 * fVar177 + fVar243 * fVar246;
            auVar347._28_4_ = fVar244 + fVar244 + fStack_504 + fVar244;
            auVar278._8_4_ = 0x7fffffff;
            auVar278._0_8_ = 0x7fffffff7fffffff;
            auVar278._12_4_ = 0x7fffffff;
            auVar278._16_4_ = 0x7fffffff;
            auVar278._20_4_ = 0x7fffffff;
            auVar278._24_4_ = 0x7fffffff;
            auVar278._28_4_ = 0x7fffffff;
            auVar276 = vandps_avx(auVar157,auVar278);
            auVar156 = vandps_avx(auVar194,auVar278);
            auVar156 = vmaxps_avx(auVar276,auVar156);
            auVar276 = vandps_avx(auVar353,auVar278);
            auVar156 = vmaxps_avx(auVar156,auVar276);
            auVar156 = vcmpps_avx(auVar156,local_a0,1);
            auVar22 = vblendvps_avx(auVar157,auVar167,auVar156);
            auVar158._0_4_ =
                 fVar227 * (float)local_840._0_4_ +
                 fVar334 * (float)local_320._0_4_ +
                 fVar339 * (float)local_6a0._0_4_ + (float)local_80._0_4_ * fVar282;
            auVar158._4_4_ =
                 fVar169 * (float)local_840._4_4_ +
                 fVar316 * (float)local_320._4_4_ +
                 fVar182 * (float)local_6a0._4_4_ + (float)local_80._4_4_ * fVar284;
            auVar158._8_4_ =
                 fVar172 * fStack_838 +
                 fVar317 * fStack_318 + fVar340 * fStack_698 + fStack_78 * fVar247;
            auVar158._12_4_ =
                 fVar209 * fStack_834 +
                 fVar248 * fStack_314 + fVar333 * fStack_694 + fStack_74 * fVar337;
            auVar158._16_4_ =
                 fVar251 * fStack_830 +
                 fVar318 * fStack_310 + fVar308 * fStack_690 + fStack_70 * fVar286;
            auVar158._20_4_ =
                 fVar263 * fStack_82c +
                 fVar145 * fStack_30c + fVar309 * fStack_68c + fStack_6c * fVar338;
            auVar158._24_4_ =
                 fVar265 * fStack_828 +
                 fVar170 * fStack_308 + fVar246 * fStack_688 + fStack_68 * fVar177;
            auVar158._28_4_ = auVar276._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar152 = vblendvps_avx(auVar194,local_380,auVar156);
            auVar276 = vandps_avx(auVar322,auVar278);
            auVar156 = vandps_avx(auVar347,auVar278);
            auVar235 = vmaxps_avx(auVar276,auVar156);
            auVar276 = vandps_avx(auVar158,auVar278);
            auVar276 = vmaxps_avx(auVar235,auVar276);
            local_880._0_4_ = auVar132._0_4_;
            local_880._4_4_ = auVar132._4_4_;
            uStack_878._0_4_ = auVar132._8_4_;
            uStack_878._4_4_ = auVar132._12_4_;
            uStack_870._0_4_ = auVar132._16_4_;
            uStack_870._4_4_ = auVar132._20_4_;
            uStack_868._0_4_ = auVar132._24_4_;
            auVar156 = vcmpps_avx(auVar276,local_a0,1);
            auVar276 = vblendvps_avx(auVar322,auVar167,auVar156);
            auVar159._0_4_ =
                 (float)local_840._0_4_ * (float)local_880._0_4_ +
                 (float)local_320._0_4_ * (float)local_8c0._0_4_ +
                 (float)local_80._0_4_ * local_680 + (float)local_6a0._0_4_ * (float)local_780._0_4_
            ;
            auVar159._4_4_ =
                 (float)local_840._4_4_ * (float)local_880._4_4_ +
                 (float)local_320._4_4_ * (float)local_8c0._4_4_ +
                 (float)local_80._4_4_ * fStack_67c +
                 (float)local_6a0._4_4_ * (float)local_780._4_4_;
            auVar159._8_4_ =
                 fStack_838 * (float)uStack_878 +
                 fStack_318 * (float)uStack_8b8 +
                 fStack_78 * fStack_678 + fStack_698 * (float)uStack_778;
            auVar159._12_4_ =
                 fStack_834 * uStack_878._4_4_ +
                 fStack_314 * uStack_8b8._4_4_ +
                 fStack_74 * fStack_674 + fStack_694 * uStack_778._4_4_;
            auVar159._16_4_ =
                 fStack_830 * (float)uStack_870 +
                 fStack_310 * (float)auStack_8b0._0_4_ +
                 fStack_70 * fStack_670 + fStack_690 * fStack_770;
            auVar159._20_4_ =
                 fStack_82c * uStack_870._4_4_ +
                 fStack_30c * (float)auStack_8b0._4_4_ +
                 fStack_6c * fStack_66c + fStack_68c * fStack_76c;
            auVar159._24_4_ =
                 fStack_828 * (float)uStack_868 +
                 fStack_308 * fStack_8a8 + fStack_68 * fStack_668 + fStack_688 * fStack_768;
            auVar159._28_4_ = auVar235._28_4_ + fStack_564 + fVar180 + 0.0;
            auVar156 = vblendvps_avx(auVar347,local_380,auVar156);
            fVar265 = auVar22._0_4_;
            fVar267 = auVar22._4_4_;
            fVar294 = auVar22._8_4_;
            fVar295 = auVar22._12_4_;
            fVar296 = auVar22._16_4_;
            fVar268 = auVar22._20_4_;
            fVar297 = auVar22._24_4_;
            fVar206 = auVar22._28_4_;
            fVar308 = auVar276._0_4_;
            fVar246 = auVar276._4_4_;
            fVar316 = auVar276._8_4_;
            fVar248 = auVar276._12_4_;
            fVar145 = auVar276._16_4_;
            fVar227 = auVar276._20_4_;
            fVar172 = auVar276._24_4_;
            fVar228 = auVar152._0_4_;
            fVar243 = auVar152._4_4_;
            fVar284 = auVar152._8_4_;
            fVar337 = auVar152._12_4_;
            fVar338 = auVar152._16_4_;
            fVar339 = auVar152._20_4_;
            fVar340 = auVar152._24_4_;
            auVar330._0_4_ = fVar228 * fVar228 + fVar265 * fVar265;
            auVar330._4_4_ = fVar243 * fVar243 + fVar267 * fVar267;
            auVar330._8_4_ = fVar284 * fVar284 + fVar294 * fVar294;
            auVar330._12_4_ = fVar337 * fVar337 + fVar295 * fVar295;
            auVar330._16_4_ = fVar338 * fVar338 + fVar296 * fVar296;
            auVar330._20_4_ = fVar339 * fVar339 + fVar268 * fVar268;
            auVar330._24_4_ = fVar340 * fVar340 + fVar297 * fVar297;
            auVar330._28_4_ = auVar167._28_4_ + fStack_244;
            auVar167 = vrsqrtps_avx(auVar330);
            fVar241 = auVar167._0_4_;
            fVar282 = auVar167._4_4_;
            auVar70._4_4_ = fVar282 * 1.5;
            auVar70._0_4_ = fVar241 * 1.5;
            fVar247 = auVar167._8_4_;
            auVar70._8_4_ = fVar247 * 1.5;
            fVar286 = auVar167._12_4_;
            auVar70._12_4_ = fVar286 * 1.5;
            fVar177 = auVar167._16_4_;
            auVar70._16_4_ = fVar177 * 1.5;
            fVar182 = auVar167._20_4_;
            auVar70._20_4_ = fVar182 * 1.5;
            fVar333 = auVar167._24_4_;
            auVar70._24_4_ = fVar333 * 1.5;
            auVar70._28_4_ = auVar347._28_4_;
            auVar71._4_4_ = fVar282 * fVar282 * fVar282 * auVar330._4_4_ * 0.5;
            auVar71._0_4_ = fVar241 * fVar241 * fVar241 * auVar330._0_4_ * 0.5;
            auVar71._8_4_ = fVar247 * fVar247 * fVar247 * auVar330._8_4_ * 0.5;
            auVar71._12_4_ = fVar286 * fVar286 * fVar286 * auVar330._12_4_ * 0.5;
            auVar71._16_4_ = fVar177 * fVar177 * fVar177 * auVar330._16_4_ * 0.5;
            auVar71._20_4_ = fVar182 * fVar182 * fVar182 * auVar330._20_4_ * 0.5;
            auVar71._24_4_ = fVar333 * fVar333 * fVar333 * auVar330._24_4_ * 0.5;
            auVar71._28_4_ = auVar330._28_4_;
            auVar22 = vsubps_avx(auVar70,auVar71);
            fVar175 = auVar22._0_4_;
            fVar178 = auVar22._4_4_;
            fVar230 = auVar22._8_4_;
            fVar242 = auVar22._12_4_;
            fVar244 = auVar22._16_4_;
            fVar251 = auVar22._20_4_;
            fVar263 = auVar22._24_4_;
            fVar241 = auVar156._0_4_;
            fVar282 = auVar156._4_4_;
            fVar247 = auVar156._8_4_;
            fVar286 = auVar156._12_4_;
            fVar177 = auVar156._16_4_;
            fVar182 = auVar156._20_4_;
            fVar333 = auVar156._24_4_;
            auVar315._0_4_ = fVar241 * fVar241 + fVar308 * fVar308;
            auVar315._4_4_ = fVar282 * fVar282 + fVar246 * fVar246;
            auVar315._8_4_ = fVar247 * fVar247 + fVar316 * fVar316;
            auVar315._12_4_ = fVar286 * fVar286 + fVar248 * fVar248;
            auVar315._16_4_ = fVar177 * fVar177 + fVar145 * fVar145;
            auVar315._20_4_ = fVar182 * fVar182 + fVar227 * fVar227;
            auVar315._24_4_ = fVar333 * fVar333 + fVar172 * fVar172;
            auVar315._28_4_ = auVar167._28_4_ + auVar276._28_4_;
            auVar167 = vrsqrtps_avx(auVar315);
            fVar309 = auVar167._0_4_;
            fVar334 = auVar167._4_4_;
            auVar72._4_4_ = fVar334 * 1.5;
            auVar72._0_4_ = fVar309 * 1.5;
            fVar317 = auVar167._8_4_;
            auVar72._8_4_ = fVar317 * 1.5;
            fVar318 = auVar167._12_4_;
            auVar72._12_4_ = fVar318 * 1.5;
            fVar170 = auVar167._16_4_;
            auVar72._16_4_ = fVar170 * 1.5;
            fVar169 = auVar167._20_4_;
            auVar72._20_4_ = fVar169 * 1.5;
            fVar209 = auVar167._24_4_;
            auVar72._24_4_ = fVar209 * 1.5;
            auVar72._28_4_ = auVar347._28_4_;
            auVar73._4_4_ = fVar334 * fVar334 * fVar334 * auVar315._4_4_ * 0.5;
            auVar73._0_4_ = fVar309 * fVar309 * fVar309 * auVar315._0_4_ * 0.5;
            auVar73._8_4_ = fVar317 * fVar317 * fVar317 * auVar315._8_4_ * 0.5;
            auVar73._12_4_ = fVar318 * fVar318 * fVar318 * auVar315._12_4_ * 0.5;
            auVar73._16_4_ = fVar170 * fVar170 * fVar170 * auVar315._16_4_ * 0.5;
            auVar73._20_4_ = fVar169 * fVar169 * fVar169 * auVar315._20_4_ * 0.5;
            auVar73._24_4_ = fVar209 * fVar209 * fVar209 * auVar315._24_4_ * 0.5;
            auVar73._28_4_ = auVar315._28_4_;
            auVar276 = vsubps_avx(auVar72,auVar73);
            fVar309 = auVar276._0_4_;
            fVar334 = auVar276._4_4_;
            fVar317 = auVar276._8_4_;
            fVar318 = auVar276._12_4_;
            fVar170 = auVar276._16_4_;
            fVar169 = auVar276._20_4_;
            fVar209 = auVar276._24_4_;
            fVar228 = fVar146 * fVar175 * fVar228;
            fVar243 = fVar171 * fVar178 * fVar243;
            auVar74._4_4_ = fVar243;
            auVar74._0_4_ = fVar228;
            fVar284 = fVar173 * fVar230 * fVar284;
            auVar74._8_4_ = fVar284;
            fVar337 = fVar229 * fVar242 * fVar337;
            auVar74._12_4_ = fVar337;
            fVar338 = fVar174 * fVar244 * fVar338;
            auVar74._16_4_ = fVar338;
            fVar339 = fVar176 * fVar251 * fVar339;
            auVar74._20_4_ = fVar339;
            fVar340 = fVar179 * fVar263 * fVar340;
            auVar74._24_4_ = fVar340;
            auVar74._28_4_ = auVar167._28_4_;
            local_880._4_4_ = fVar243 + local_7c0._4_4_;
            local_880._0_4_ = fVar228 + local_7c0._0_4_;
            uStack_878._0_4_ = fVar284 + local_7c0._8_4_;
            uStack_878._4_4_ = fVar337 + local_7c0._12_4_;
            uStack_870._0_4_ = fVar338 + local_7c0._16_4_;
            uStack_870._4_4_ = fVar339 + local_7c0._20_4_;
            uStack_868._0_4_ = fVar340 + local_7c0._24_4_;
            uStack_868._4_4_ = auVar167._28_4_ + local_7c0._28_4_;
            fVar228 = fVar146 * fVar175 * -fVar265;
            fVar243 = fVar171 * fVar178 * -fVar267;
            auVar75._4_4_ = fVar243;
            auVar75._0_4_ = fVar228;
            fVar284 = fVar173 * fVar230 * -fVar294;
            auVar75._8_4_ = fVar284;
            fVar337 = fVar229 * fVar242 * -fVar295;
            auVar75._12_4_ = fVar337;
            fVar338 = fVar174 * fVar244 * -fVar296;
            auVar75._16_4_ = fVar338;
            fVar339 = fVar176 * fVar251 * -fVar268;
            auVar75._20_4_ = fVar339;
            fVar340 = fVar179 * fVar263 * -fVar297;
            auVar75._24_4_ = fVar340;
            auVar75._28_4_ = -fVar206;
            local_8c0._4_4_ = auVar321._4_4_ + fVar243;
            local_8c0._0_4_ = auVar321._0_4_ + fVar228;
            uStack_8b8._0_4_ = auVar321._8_4_ + fVar284;
            uStack_8b8._4_4_ = auVar321._12_4_ + fVar337;
            auStack_8b0._0_4_ = auVar321._16_4_ + fVar338;
            auStack_8b0._4_4_ = auVar321._20_4_ + fVar339;
            fStack_8a8 = auVar321._24_4_ + fVar340;
            fStack_8a4 = auVar321._28_4_ + -fVar206;
            fVar228 = fVar175 * 0.0 * fVar146;
            fVar243 = fVar178 * 0.0 * fVar171;
            auVar76._4_4_ = fVar243;
            auVar76._0_4_ = fVar228;
            fVar284 = fVar230 * 0.0 * fVar173;
            auVar76._8_4_ = fVar284;
            fVar337 = fVar242 * 0.0 * fVar229;
            auVar76._12_4_ = fVar337;
            fVar338 = fVar244 * 0.0 * fVar174;
            auVar76._16_4_ = fVar338;
            fVar339 = fVar251 * 0.0 * fVar176;
            auVar76._20_4_ = fVar339;
            fVar340 = fVar263 * 0.0 * fVar179;
            auVar76._24_4_ = fVar340;
            auVar76._28_4_ = fVar206;
            auVar236 = vsubps_avx(local_7c0,auVar74);
            auVar369._0_4_ = fVar228 + auVar159._0_4_;
            auVar369._4_4_ = fVar243 + auVar159._4_4_;
            auVar369._8_4_ = fVar284 + auVar159._8_4_;
            auVar369._12_4_ = fVar337 + auVar159._12_4_;
            auVar369._16_4_ = fVar338 + auVar159._16_4_;
            auVar369._20_4_ = fVar339 + auVar159._20_4_;
            auVar369._24_4_ = fVar340 + auVar159._24_4_;
            auVar369._28_4_ = fVar206 + auVar159._28_4_;
            fVar228 = auVar307._0_4_ * fVar309 * fVar241;
            fVar241 = auVar307._4_4_ * fVar334 * fVar282;
            auVar77._4_4_ = fVar241;
            auVar77._0_4_ = fVar228;
            fVar243 = auVar307._8_4_ * fVar317 * fVar247;
            auVar77._8_4_ = fVar243;
            fVar282 = auVar307._12_4_ * fVar318 * fVar286;
            auVar77._12_4_ = fVar282;
            fVar284 = auVar307._16_4_ * fVar170 * fVar177;
            auVar77._16_4_ = fVar284;
            fVar247 = auVar307._20_4_ * fVar169 * fVar182;
            auVar77._20_4_ = fVar247;
            fVar337 = auVar307._24_4_ * fVar209 * fVar333;
            auVar77._24_4_ = fVar337;
            auVar77._28_4_ = fVar180;
            auVar31 = vsubps_avx(auVar321,auVar75);
            auVar354._0_4_ = auVar292._0_4_ + fVar228;
            auVar354._4_4_ = auVar292._4_4_ + fVar241;
            auVar354._8_4_ = auVar292._8_4_ + fVar243;
            auVar354._12_4_ = auVar292._12_4_ + fVar282;
            auVar354._16_4_ = auVar292._16_4_ + fVar284;
            auVar354._20_4_ = auVar292._20_4_ + fVar247;
            auVar354._24_4_ = auVar292._24_4_ + fVar337;
            auVar354._28_4_ = auVar292._28_4_ + fVar180;
            fVar228 = fVar309 * -fVar308 * auVar307._0_4_;
            fVar241 = fVar334 * -fVar246 * auVar307._4_4_;
            auVar78._4_4_ = fVar241;
            auVar78._0_4_ = fVar228;
            fVar243 = fVar317 * -fVar316 * auVar307._8_4_;
            auVar78._8_4_ = fVar243;
            fVar282 = fVar318 * -fVar248 * auVar307._12_4_;
            auVar78._12_4_ = fVar282;
            fVar284 = fVar170 * -fVar145 * auVar307._16_4_;
            auVar78._16_4_ = fVar284;
            fVar247 = fVar169 * -fVar227 * auVar307._20_4_;
            auVar78._20_4_ = fVar247;
            fVar337 = fVar209 * -fVar172 * auVar307._24_4_;
            auVar78._24_4_ = fVar337;
            auVar78._28_4_ = local_7c0._28_4_;
            auVar32 = vsubps_avx(auVar159,auVar76);
            auVar259._0_4_ = auVar277._0_4_ + fVar228;
            auVar259._4_4_ = auVar277._4_4_ + fVar241;
            auVar259._8_4_ = auVar277._8_4_ + fVar243;
            auVar259._12_4_ = auVar277._12_4_ + fVar282;
            auVar259._16_4_ = auVar277._16_4_ + fVar284;
            auVar259._20_4_ = auVar277._20_4_ + fVar247;
            auVar259._24_4_ = auVar277._24_4_ + fVar337;
            auVar259._28_4_ = auVar277._28_4_ + local_7c0._28_4_;
            fVar228 = fVar309 * 0.0 * auVar307._0_4_;
            fVar241 = fVar334 * 0.0 * auVar307._4_4_;
            auVar79._4_4_ = fVar241;
            auVar79._0_4_ = fVar228;
            fVar243 = fVar317 * 0.0 * auVar307._8_4_;
            auVar79._8_4_ = fVar243;
            fVar282 = fVar318 * 0.0 * auVar307._12_4_;
            auVar79._12_4_ = fVar282;
            fVar284 = fVar170 * 0.0 * auVar307._16_4_;
            auVar79._16_4_ = fVar284;
            fVar247 = fVar169 * 0.0 * auVar307._20_4_;
            auVar79._20_4_ = fVar247;
            fVar337 = fVar209 * 0.0 * auVar307._24_4_;
            auVar79._24_4_ = fVar337;
            auVar79._28_4_ = auVar159._28_4_;
            auVar167 = vsubps_avx(auVar292,auVar77);
            auVar129._4_4_ = fStack_57c;
            auVar129._0_4_ = local_580;
            auVar129._8_4_ = fStack_578;
            auVar129._12_4_ = fStack_574;
            auVar129._16_4_ = fStack_570;
            auVar129._20_4_ = fStack_56c;
            auVar129._24_4_ = fStack_568;
            auVar129._28_4_ = fStack_564;
            auVar323._0_4_ = local_580 + fVar228;
            auVar323._4_4_ = fStack_57c + fVar241;
            auVar323._8_4_ = fStack_578 + fVar243;
            auVar323._12_4_ = fStack_574 + fVar282;
            auVar323._16_4_ = fStack_570 + fVar284;
            auVar323._20_4_ = fStack_56c + fVar247;
            auVar323._24_4_ = fStack_568 + fVar337;
            auVar323._28_4_ = fStack_564 + auVar159._28_4_;
            auVar156 = vsubps_avx(auVar277,auVar78);
            auVar22 = vsubps_avx(auVar129,auVar79);
            auVar152 = vsubps_avx(auVar259,auVar31);
            auVar235 = vsubps_avx(auVar323,auVar32);
            auVar80._4_4_ = auVar32._4_4_ * auVar152._4_4_;
            auVar80._0_4_ = auVar32._0_4_ * auVar152._0_4_;
            auVar80._8_4_ = auVar32._8_4_ * auVar152._8_4_;
            auVar80._12_4_ = auVar32._12_4_ * auVar152._12_4_;
            auVar80._16_4_ = auVar32._16_4_ * auVar152._16_4_;
            auVar80._20_4_ = auVar32._20_4_ * auVar152._20_4_;
            auVar80._24_4_ = auVar32._24_4_ * auVar152._24_4_;
            auVar80._28_4_ = auVar347._28_4_;
            auVar81._4_4_ = auVar31._4_4_ * auVar235._4_4_;
            auVar81._0_4_ = auVar31._0_4_ * auVar235._0_4_;
            auVar81._8_4_ = auVar31._8_4_ * auVar235._8_4_;
            auVar81._12_4_ = auVar31._12_4_ * auVar235._12_4_;
            auVar81._16_4_ = auVar31._16_4_ * auVar235._16_4_;
            auVar81._20_4_ = auVar31._20_4_ * auVar235._20_4_;
            auVar81._24_4_ = auVar31._24_4_ * auVar235._24_4_;
            auVar81._28_4_ = fStack_564;
            auVar256 = vsubps_avx(auVar81,auVar80);
            auVar82._4_4_ = auVar236._4_4_ * auVar235._4_4_;
            auVar82._0_4_ = auVar236._0_4_ * auVar235._0_4_;
            auVar82._8_4_ = auVar236._8_4_ * auVar235._8_4_;
            auVar82._12_4_ = auVar236._12_4_ * auVar235._12_4_;
            auVar82._16_4_ = auVar236._16_4_ * auVar235._16_4_;
            auVar82._20_4_ = auVar236._20_4_ * auVar235._20_4_;
            auVar82._24_4_ = auVar236._24_4_ * auVar235._24_4_;
            auVar82._28_4_ = auVar235._28_4_;
            auVar235 = vsubps_avx(auVar354,auVar236);
            auVar83._4_4_ = auVar32._4_4_ * auVar235._4_4_;
            auVar83._0_4_ = auVar32._0_4_ * auVar235._0_4_;
            auVar83._8_4_ = auVar32._8_4_ * auVar235._8_4_;
            auVar83._12_4_ = auVar32._12_4_ * auVar235._12_4_;
            auVar83._16_4_ = auVar32._16_4_ * auVar235._16_4_;
            auVar83._20_4_ = auVar32._20_4_ * auVar235._20_4_;
            auVar83._24_4_ = auVar32._24_4_ * auVar235._24_4_;
            auVar83._28_4_ = auVar276._28_4_;
            auVar305 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = auVar31._4_4_ * auVar235._4_4_;
            auVar84._0_4_ = auVar31._0_4_ * auVar235._0_4_;
            auVar84._8_4_ = auVar31._8_4_ * auVar235._8_4_;
            auVar84._12_4_ = auVar31._12_4_ * auVar235._12_4_;
            auVar84._16_4_ = auVar31._16_4_ * auVar235._16_4_;
            auVar84._20_4_ = auVar31._20_4_ * auVar235._20_4_;
            auVar84._24_4_ = auVar31._24_4_ * auVar235._24_4_;
            auVar84._28_4_ = auVar276._28_4_;
            auVar85._4_4_ = auVar236._4_4_ * auVar152._4_4_;
            auVar85._0_4_ = auVar236._0_4_ * auVar152._0_4_;
            auVar85._8_4_ = auVar236._8_4_ * auVar152._8_4_;
            auVar85._12_4_ = auVar236._12_4_ * auVar152._12_4_;
            auVar85._16_4_ = auVar236._16_4_ * auVar152._16_4_;
            auVar85._20_4_ = auVar236._20_4_ * auVar152._20_4_;
            auVar85._24_4_ = auVar236._24_4_ * auVar152._24_4_;
            auVar85._28_4_ = auVar152._28_4_;
            auVar276 = vsubps_avx(auVar85,auVar84);
            auVar195._0_4_ = auVar256._0_4_ * 0.0 + auVar276._0_4_ + auVar305._0_4_ * 0.0;
            auVar195._4_4_ = auVar256._4_4_ * 0.0 + auVar276._4_4_ + auVar305._4_4_ * 0.0;
            auVar195._8_4_ = auVar256._8_4_ * 0.0 + auVar276._8_4_ + auVar305._8_4_ * 0.0;
            auVar195._12_4_ = auVar256._12_4_ * 0.0 + auVar276._12_4_ + auVar305._12_4_ * 0.0;
            auVar195._16_4_ = auVar256._16_4_ * 0.0 + auVar276._16_4_ + auVar305._16_4_ * 0.0;
            auVar195._20_4_ = auVar256._20_4_ * 0.0 + auVar276._20_4_ + auVar305._20_4_ * 0.0;
            auVar195._24_4_ = auVar256._24_4_ * 0.0 + auVar276._24_4_ + auVar305._24_4_ * 0.0;
            auVar195._28_4_ = auVar256._28_4_ + auVar276._28_4_ + auVar305._28_4_;
            auVar344 = vcmpps_avx(auVar195,ZEXT832(0) << 0x20,2);
            auVar220 = ZEXT3264(auVar344);
            auVar167 = vblendvps_avx(auVar167,_local_880,auVar344);
            auVar240 = ZEXT3264(auVar167);
            auVar276 = vblendvps_avx(auVar156,_local_8c0,auVar344);
            auVar156 = vblendvps_avx(auVar22,auVar369,auVar344);
            auVar22 = vblendvps_avx(auVar236,auVar354,auVar344);
            auVar152 = vblendvps_avx(auVar31,auVar259,auVar344);
            auVar235 = vblendvps_avx(auVar32,auVar323,auVar344);
            auVar236 = vblendvps_avx(auVar354,auVar236,auVar344);
            auVar256 = vblendvps_avx(auVar259,auVar31,auVar344);
            auVar305 = vblendvps_avx(auVar323,auVar32,auVar344);
            auVar197 = vandps_avx(auVar197,_local_360);
            auVar236 = vsubps_avx(auVar236,auVar167);
            auVar33 = vsubps_avx(auVar256,auVar276);
            auVar305 = vsubps_avx(auVar305,auVar156);
            auVar34 = vsubps_avx(auVar276,auVar152);
            fVar228 = auVar33._0_4_;
            fVar224 = auVar156._0_4_;
            fVar286 = auVar33._4_4_;
            fVar225 = auVar156._4_4_;
            auVar86._4_4_ = fVar225 * fVar286;
            auVar86._0_4_ = fVar224 * fVar228;
            fVar308 = auVar33._8_4_;
            fVar226 = auVar156._8_4_;
            auVar86._8_4_ = fVar226 * fVar308;
            fVar318 = auVar33._12_4_;
            fVar270 = auVar156._12_4_;
            auVar86._12_4_ = fVar270 * fVar318;
            fVar175 = auVar33._16_4_;
            fVar281 = auVar156._16_4_;
            auVar86._16_4_ = fVar281 * fVar175;
            fVar265 = auVar33._20_4_;
            fVar283 = auVar156._20_4_;
            auVar86._20_4_ = fVar283 * fVar265;
            fVar206 = auVar33._24_4_;
            fVar285 = auVar156._24_4_;
            auVar86._24_4_ = fVar285 * fVar206;
            auVar86._28_4_ = auVar256._28_4_;
            fVar241 = auVar276._0_4_;
            fVar208 = auVar305._0_4_;
            fVar338 = auVar276._4_4_;
            fVar324 = auVar305._4_4_;
            auVar87._4_4_ = fVar324 * fVar338;
            auVar87._0_4_ = fVar208 * fVar241;
            fVar309 = auVar276._8_4_;
            fVar325 = auVar305._8_4_;
            auVar87._8_4_ = fVar325 * fVar309;
            fVar145 = auVar276._12_4_;
            fVar326 = auVar305._12_4_;
            auVar87._12_4_ = fVar326 * fVar145;
            fVar178 = auVar276._16_4_;
            fVar327 = auVar305._16_4_;
            auVar87._16_4_ = fVar327 * fVar178;
            fVar267 = auVar276._20_4_;
            fVar341 = auVar305._20_4_;
            auVar87._20_4_ = fVar341 * fVar267;
            fVar181 = auVar276._24_4_;
            fVar350 = auVar305._24_4_;
            uVar310 = auVar31._28_4_;
            auVar87._24_4_ = fVar350 * fVar181;
            auVar87._28_4_ = uVar310;
            auVar256 = vsubps_avx(auVar87,auVar86);
            fVar243 = auVar167._0_4_;
            fVar177 = auVar167._4_4_;
            auVar88._4_4_ = fVar324 * fVar177;
            auVar88._0_4_ = fVar208 * fVar243;
            fVar246 = auVar167._8_4_;
            auVar88._8_4_ = fVar325 * fVar246;
            fVar170 = auVar167._12_4_;
            auVar88._12_4_ = fVar326 * fVar170;
            fVar230 = auVar167._16_4_;
            auVar88._16_4_ = fVar327 * fVar230;
            fVar294 = auVar167._20_4_;
            auVar88._20_4_ = fVar341 * fVar294;
            fVar210 = auVar167._24_4_;
            auVar88._24_4_ = fVar350 * fVar210;
            auVar88._28_4_ = uVar310;
            fVar282 = auVar236._0_4_;
            fVar339 = auVar236._4_4_;
            auVar89._4_4_ = fVar225 * fVar339;
            auVar89._0_4_ = fVar224 * fVar282;
            fVar334 = auVar236._8_4_;
            auVar89._8_4_ = fVar226 * fVar334;
            fVar227 = auVar236._12_4_;
            auVar89._12_4_ = fVar270 * fVar227;
            fVar242 = auVar236._16_4_;
            auVar89._16_4_ = fVar281 * fVar242;
            fVar295 = auVar236._20_4_;
            auVar89._20_4_ = fVar283 * fVar295;
            fVar298 = auVar236._24_4_;
            auVar89._24_4_ = fVar285 * fVar298;
            auVar89._28_4_ = auVar354._28_4_;
            auVar31 = vsubps_avx(auVar89,auVar88);
            auVar90._4_4_ = fVar338 * fVar339;
            auVar90._0_4_ = fVar241 * fVar282;
            auVar90._8_4_ = fVar309 * fVar334;
            auVar90._12_4_ = fVar145 * fVar227;
            auVar90._16_4_ = fVar178 * fVar242;
            auVar90._20_4_ = fVar267 * fVar295;
            auVar90._24_4_ = fVar181 * fVar298;
            auVar90._28_4_ = uVar310;
            auVar91._4_4_ = fVar177 * fVar286;
            auVar91._0_4_ = fVar243 * fVar228;
            auVar91._8_4_ = fVar246 * fVar308;
            auVar91._12_4_ = fVar170 * fVar318;
            auVar91._16_4_ = fVar230 * fVar175;
            auVar91._20_4_ = fVar294 * fVar265;
            auVar91._24_4_ = fVar210 * fVar206;
            auVar91._28_4_ = auVar32._28_4_;
            auVar32 = vsubps_avx(auVar91,auVar90);
            auVar35 = vsubps_avx(auVar156,auVar235);
            fVar247 = auVar32._28_4_ + auVar31._28_4_;
            auVar331._0_4_ = auVar32._0_4_ + auVar31._0_4_ * 0.0 + auVar256._0_4_ * 0.0;
            auVar331._4_4_ = auVar32._4_4_ + auVar31._4_4_ * 0.0 + auVar256._4_4_ * 0.0;
            auVar331._8_4_ = auVar32._8_4_ + auVar31._8_4_ * 0.0 + auVar256._8_4_ * 0.0;
            auVar331._12_4_ = auVar32._12_4_ + auVar31._12_4_ * 0.0 + auVar256._12_4_ * 0.0;
            auVar331._16_4_ = auVar32._16_4_ + auVar31._16_4_ * 0.0 + auVar256._16_4_ * 0.0;
            auVar331._20_4_ = auVar32._20_4_ + auVar31._20_4_ * 0.0 + auVar256._20_4_ * 0.0;
            auVar331._24_4_ = auVar32._24_4_ + auVar31._24_4_ * 0.0 + auVar256._24_4_ * 0.0;
            auVar331._28_4_ = fVar247 + auVar256._28_4_;
            fVar284 = auVar34._0_4_;
            fVar182 = auVar34._4_4_;
            auVar92._4_4_ = auVar235._4_4_ * fVar182;
            auVar92._0_4_ = auVar235._0_4_ * fVar284;
            fVar316 = auVar34._8_4_;
            auVar92._8_4_ = auVar235._8_4_ * fVar316;
            fVar169 = auVar34._12_4_;
            auVar92._12_4_ = auVar235._12_4_ * fVar169;
            fVar244 = auVar34._16_4_;
            auVar92._16_4_ = auVar235._16_4_ * fVar244;
            fVar296 = auVar34._20_4_;
            auVar92._20_4_ = auVar235._20_4_ * fVar296;
            fVar221 = auVar34._24_4_;
            auVar92._24_4_ = auVar235._24_4_ * fVar221;
            auVar92._28_4_ = fVar247;
            fVar247 = auVar35._0_4_;
            fVar340 = auVar35._4_4_;
            auVar93._4_4_ = auVar152._4_4_ * fVar340;
            auVar93._0_4_ = auVar152._0_4_ * fVar247;
            fVar317 = auVar35._8_4_;
            auVar93._8_4_ = auVar152._8_4_ * fVar317;
            fVar172 = auVar35._12_4_;
            auVar93._12_4_ = auVar152._12_4_ * fVar172;
            fVar251 = auVar35._16_4_;
            auVar93._16_4_ = auVar152._16_4_ * fVar251;
            fVar268 = auVar35._20_4_;
            auVar93._20_4_ = auVar152._20_4_ * fVar268;
            fVar222 = auVar35._24_4_;
            auVar93._24_4_ = auVar152._24_4_ * fVar222;
            auVar93._28_4_ = auVar32._28_4_;
            auVar31 = vsubps_avx(auVar93,auVar92);
            auVar32 = vsubps_avx(auVar167,auVar22);
            fVar337 = auVar32._0_4_;
            fVar333 = auVar32._4_4_;
            auVar94._4_4_ = auVar235._4_4_ * fVar333;
            auVar94._0_4_ = auVar235._0_4_ * fVar337;
            fVar248 = auVar32._8_4_;
            auVar94._8_4_ = auVar235._8_4_ * fVar248;
            fVar209 = auVar32._12_4_;
            auVar94._12_4_ = auVar235._12_4_ * fVar209;
            fVar263 = auVar32._16_4_;
            auVar94._16_4_ = auVar235._16_4_ * fVar263;
            fVar297 = auVar32._20_4_;
            auVar94._20_4_ = auVar235._20_4_ * fVar297;
            fVar223 = auVar32._24_4_;
            auVar94._24_4_ = auVar235._24_4_ * fVar223;
            auVar94._28_4_ = auVar235._28_4_;
            auVar95._4_4_ = fVar340 * auVar22._4_4_;
            auVar95._0_4_ = fVar247 * auVar22._0_4_;
            auVar95._8_4_ = fVar317 * auVar22._8_4_;
            auVar95._12_4_ = fVar172 * auVar22._12_4_;
            auVar95._16_4_ = fVar251 * auVar22._16_4_;
            auVar95._20_4_ = fVar268 * auVar22._20_4_;
            auVar95._24_4_ = fVar222 * auVar22._24_4_;
            auVar95._28_4_ = auVar256._28_4_;
            auVar235 = vsubps_avx(auVar94,auVar95);
            auVar96._4_4_ = auVar152._4_4_ * fVar333;
            auVar96._0_4_ = auVar152._0_4_ * fVar337;
            auVar96._8_4_ = auVar152._8_4_ * fVar248;
            auVar96._12_4_ = auVar152._12_4_ * fVar209;
            auVar96._16_4_ = auVar152._16_4_ * fVar263;
            auVar96._20_4_ = auVar152._20_4_ * fVar297;
            auVar96._24_4_ = auVar152._24_4_ * fVar223;
            auVar96._28_4_ = auVar152._28_4_;
            auVar97._4_4_ = fVar182 * auVar22._4_4_;
            auVar97._0_4_ = fVar284 * auVar22._0_4_;
            auVar97._8_4_ = fVar316 * auVar22._8_4_;
            auVar97._12_4_ = fVar169 * auVar22._12_4_;
            auVar97._16_4_ = fVar244 * auVar22._16_4_;
            auVar97._20_4_ = fVar296 * auVar22._20_4_;
            auVar97._24_4_ = fVar221 * auVar22._24_4_;
            auVar97._28_4_ = auVar22._28_4_;
            auVar22 = vsubps_avx(auVar97,auVar96);
            auVar160._0_4_ = auVar31._0_4_ * 0.0 + auVar22._0_4_ + auVar235._0_4_ * 0.0;
            auVar160._4_4_ = auVar31._4_4_ * 0.0 + auVar22._4_4_ + auVar235._4_4_ * 0.0;
            auVar160._8_4_ = auVar31._8_4_ * 0.0 + auVar22._8_4_ + auVar235._8_4_ * 0.0;
            auVar160._12_4_ = auVar31._12_4_ * 0.0 + auVar22._12_4_ + auVar235._12_4_ * 0.0;
            auVar160._16_4_ = auVar31._16_4_ * 0.0 + auVar22._16_4_ + auVar235._16_4_ * 0.0;
            auVar160._20_4_ = auVar31._20_4_ * 0.0 + auVar22._20_4_ + auVar235._20_4_ * 0.0;
            auVar160._24_4_ = auVar31._24_4_ * 0.0 + auVar22._24_4_ + auVar235._24_4_ * 0.0;
            auVar160._28_4_ = auVar235._28_4_ + auVar22._28_4_ + auVar235._28_4_;
            auVar168 = ZEXT3264(auVar160);
            auVar22 = vmaxps_avx(auVar331,auVar160);
            auVar22 = vcmpps_avx(auVar22,ZEXT832(0) << 0x20,2);
            auVar152 = auVar197 & auVar22;
            if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar152 >> 0x7f,0) == '\0') &&
                  (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar152 >> 0xbf,0) == '\0') &&
                (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar152[0x1f]) {
LAB_010858e6:
              auVar349 = ZEXT864(0) << 0x40;
              auVar203 = ZEXT3264(CONCAT824(uStack_5e8,
                                            CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
              auVar332 = ZEXT3264(CONCAT428(fVar180,CONCAT424(fVar179,CONCAT420(fVar176,CONCAT416(
                                                  fVar174,CONCAT412(fVar229,CONCAT48(fVar173,
                                                  CONCAT44(fVar171,fVar146))))))));
            }
            else {
              auVar152 = vandps_avx(auVar22,auVar197);
              auVar98._4_4_ = fVar340 * fVar286;
              auVar98._0_4_ = fVar247 * fVar228;
              auVar98._8_4_ = fVar317 * fVar308;
              auVar98._12_4_ = fVar172 * fVar318;
              auVar98._16_4_ = fVar251 * fVar175;
              auVar98._20_4_ = fVar268 * fVar265;
              auVar98._24_4_ = fVar222 * fVar206;
              auVar98._28_4_ = auVar197._28_4_;
              auVar99._4_4_ = fVar182 * fVar324;
              auVar99._0_4_ = fVar284 * fVar208;
              auVar99._8_4_ = fVar316 * fVar325;
              auVar99._12_4_ = fVar169 * fVar326;
              auVar99._16_4_ = fVar244 * fVar327;
              auVar99._20_4_ = fVar296 * fVar341;
              auVar99._24_4_ = fVar221 * fVar350;
              auVar99._28_4_ = auVar22._28_4_;
              auVar22 = vsubps_avx(auVar99,auVar98);
              auVar100._4_4_ = fVar333 * fVar324;
              auVar100._0_4_ = fVar337 * fVar208;
              auVar100._8_4_ = fVar248 * fVar325;
              auVar100._12_4_ = fVar209 * fVar326;
              auVar100._16_4_ = fVar263 * fVar327;
              auVar100._20_4_ = fVar297 * fVar341;
              auVar100._24_4_ = fVar223 * fVar350;
              auVar100._28_4_ = auVar305._28_4_;
              auVar101._4_4_ = fVar340 * fVar339;
              auVar101._0_4_ = fVar247 * fVar282;
              auVar101._8_4_ = fVar317 * fVar334;
              auVar101._12_4_ = fVar172 * fVar227;
              auVar101._16_4_ = fVar251 * fVar242;
              auVar101._20_4_ = fVar268 * fVar295;
              auVar101._24_4_ = fVar222 * fVar298;
              auVar101._28_4_ = auVar35._28_4_;
              auVar235 = vsubps_avx(auVar101,auVar100);
              auVar102._4_4_ = fVar182 * fVar339;
              auVar102._0_4_ = fVar284 * fVar282;
              auVar102._8_4_ = fVar316 * fVar334;
              auVar102._12_4_ = fVar169 * fVar227;
              auVar102._16_4_ = fVar244 * fVar242;
              auVar102._20_4_ = fVar296 * fVar295;
              auVar102._24_4_ = fVar221 * fVar298;
              auVar102._28_4_ = auVar236._28_4_;
              auVar103._4_4_ = fVar333 * fVar286;
              auVar103._0_4_ = fVar337 * fVar228;
              auVar103._8_4_ = fVar248 * fVar308;
              auVar103._12_4_ = fVar209 * fVar318;
              auVar103._16_4_ = fVar263 * fVar175;
              auVar103._20_4_ = fVar297 * fVar265;
              auVar103._24_4_ = fVar223 * fVar206;
              auVar103._28_4_ = auVar33._28_4_;
              auVar256 = vsubps_avx(auVar103,auVar102);
              auVar196._0_4_ = auVar22._0_4_ * 0.0 + auVar256._0_4_ + auVar235._0_4_ * 0.0;
              auVar196._4_4_ = auVar22._4_4_ * 0.0 + auVar256._4_4_ + auVar235._4_4_ * 0.0;
              auVar196._8_4_ = auVar22._8_4_ * 0.0 + auVar256._8_4_ + auVar235._8_4_ * 0.0;
              auVar196._12_4_ = auVar22._12_4_ * 0.0 + auVar256._12_4_ + auVar235._12_4_ * 0.0;
              auVar196._16_4_ = auVar22._16_4_ * 0.0 + auVar256._16_4_ + auVar235._16_4_ * 0.0;
              auVar196._20_4_ = auVar22._20_4_ * 0.0 + auVar256._20_4_ + auVar235._20_4_ * 0.0;
              auVar196._24_4_ = auVar22._24_4_ * 0.0 + auVar256._24_4_ + auVar235._24_4_ * 0.0;
              auVar196._28_4_ = auVar33._28_4_ + auVar256._28_4_ + auVar236._28_4_;
              auVar197 = vrcpps_avx(auVar196);
              fVar228 = auVar197._0_4_;
              fVar282 = auVar197._4_4_;
              auVar104._4_4_ = auVar196._4_4_ * fVar282;
              auVar104._0_4_ = auVar196._0_4_ * fVar228;
              fVar284 = auVar197._8_4_;
              auVar104._8_4_ = auVar196._8_4_ * fVar284;
              fVar247 = auVar197._12_4_;
              auVar104._12_4_ = auVar196._12_4_ * fVar247;
              fVar337 = auVar197._16_4_;
              auVar104._16_4_ = auVar196._16_4_ * fVar337;
              fVar286 = auVar197._20_4_;
              auVar104._20_4_ = auVar196._20_4_ * fVar286;
              fVar339 = auVar197._24_4_;
              auVar104._24_4_ = auVar196._24_4_ * fVar339;
              auVar104._28_4_ = auVar35._28_4_;
              auVar348._8_4_ = 0x3f800000;
              auVar348._0_8_ = &DAT_3f8000003f800000;
              auVar348._12_4_ = 0x3f800000;
              auVar348._16_4_ = 0x3f800000;
              auVar348._20_4_ = 0x3f800000;
              auVar348._24_4_ = 0x3f800000;
              auVar348._28_4_ = 0x3f800000;
              auVar197 = vsubps_avx(auVar348,auVar104);
              fVar228 = auVar197._0_4_ * fVar228 + fVar228;
              fVar282 = auVar197._4_4_ * fVar282 + fVar282;
              fVar284 = auVar197._8_4_ * fVar284 + fVar284;
              fVar247 = auVar197._12_4_ * fVar247 + fVar247;
              fVar337 = auVar197._16_4_ * fVar337 + fVar337;
              fVar286 = auVar197._20_4_ * fVar286 + fVar286;
              fVar339 = auVar197._24_4_ * fVar339 + fVar339;
              auVar105._4_4_ =
                   (fVar177 * auVar22._4_4_ + auVar235._4_4_ * fVar338 + auVar256._4_4_ * fVar225) *
                   fVar282;
              auVar105._0_4_ =
                   (fVar243 * auVar22._0_4_ + auVar235._0_4_ * fVar241 + auVar256._0_4_ * fVar224) *
                   fVar228;
              auVar105._8_4_ =
                   (fVar246 * auVar22._8_4_ + auVar235._8_4_ * fVar309 + auVar256._8_4_ * fVar226) *
                   fVar284;
              auVar105._12_4_ =
                   (fVar170 * auVar22._12_4_ + auVar235._12_4_ * fVar145 + auVar256._12_4_ * fVar270
                   ) * fVar247;
              auVar105._16_4_ =
                   (fVar230 * auVar22._16_4_ + auVar235._16_4_ * fVar178 + auVar256._16_4_ * fVar281
                   ) * fVar337;
              auVar105._20_4_ =
                   (fVar294 * auVar22._20_4_ + auVar235._20_4_ * fVar267 + auVar256._20_4_ * fVar283
                   ) * fVar286;
              auVar105._24_4_ =
                   (fVar210 * auVar22._24_4_ + auVar235._24_4_ * fVar181 + auVar256._24_4_ * fVar285
                   ) * fVar339;
              auVar105._28_4_ = auVar167._28_4_ + auVar276._28_4_ + auVar156._28_4_;
              auVar240 = ZEXT3264(auVar105);
              uVar310 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar260._4_4_ = uVar310;
              auVar260._0_4_ = uVar310;
              auVar260._8_4_ = uVar310;
              auVar260._12_4_ = uVar310;
              auVar260._16_4_ = uVar310;
              auVar260._20_4_ = uVar310;
              auVar260._24_4_ = uVar310;
              auVar260._28_4_ = uVar310;
              auVar197 = vcmpps_avx(local_c0,auVar105,2);
              auVar167 = vcmpps_avx(auVar105,auVar260,2);
              auVar197 = vandps_avx(auVar197,auVar167);
              auVar167 = auVar152 & auVar197;
              if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar167 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar167 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar167 >> 0x7f,0) == '\0') &&
                    (auVar167 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar167 >> 0xbf,0) == '\0') &&
                  (auVar167 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar167[0x1f]) goto LAB_010858e6;
              auVar197 = vandps_avx(auVar152,auVar197);
              auVar349 = ZEXT864(0) << 0x20;
              auVar167 = vcmpps_avx(ZEXT832(0) << 0x20,auVar196,4);
              auVar276 = auVar197 & auVar167;
              auVar203 = ZEXT3264(CONCAT824(uStack_5e8,
                                            CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
              auVar332 = ZEXT3264(CONCAT428(fVar180,CONCAT424(fVar179,CONCAT420(fVar176,CONCAT416(
                                                  fVar174,CONCAT412(fVar229,CONCAT48(fVar173,
                                                  CONCAT44(fVar171,fVar146))))))));
              if ((((((((auVar276 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar276 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar276 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar276 >> 0x7f,0) != '\0') ||
                    (auVar276 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar276 >> 0xbf,0) != '\0') ||
                  (auVar276 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar276[0x1f] < '\0') {
                auVar197 = vandps_avx(auVar167,auVar197);
                auVar203 = ZEXT3264(auVar197);
                auVar106._4_4_ = auVar331._4_4_ * fVar282;
                auVar106._0_4_ = auVar331._0_4_ * fVar228;
                auVar106._8_4_ = auVar331._8_4_ * fVar284;
                auVar106._12_4_ = auVar331._12_4_ * fVar247;
                auVar106._16_4_ = auVar331._16_4_ * fVar337;
                auVar106._20_4_ = auVar331._20_4_ * fVar286;
                auVar106._24_4_ = auVar331._24_4_ * fVar339;
                auVar106._28_4_ = local_5a0._28_4_;
                auVar107._4_4_ = auVar160._4_4_ * fVar282;
                auVar107._0_4_ = auVar160._0_4_ * fVar228;
                auVar107._8_4_ = auVar160._8_4_ * fVar284;
                auVar107._12_4_ = auVar160._12_4_ * fVar247;
                auVar107._16_4_ = auVar160._16_4_ * fVar337;
                auVar107._20_4_ = auVar160._20_4_ * fVar286;
                auVar107._24_4_ = auVar160._24_4_ * fVar339;
                auVar107._28_4_ = auVar160._28_4_;
                auVar168 = ZEXT3264(auVar107);
                auVar293._8_4_ = 0x3f800000;
                auVar293._0_8_ = &DAT_3f8000003f800000;
                auVar293._12_4_ = 0x3f800000;
                auVar293._16_4_ = 0x3f800000;
                auVar293._20_4_ = 0x3f800000;
                auVar293._24_4_ = 0x3f800000;
                auVar293._28_4_ = 0x3f800000;
                auVar197 = vsubps_avx(auVar293,auVar106);
                local_3c0 = vblendvps_avx(auVar197,auVar106,auVar344);
                auVar197 = vsubps_avx(auVar293,auVar107);
                _local_5a0 = vblendvps_avx(auVar197,auVar107,auVar344);
                local_620 = auVar105;
              }
            }
            auVar197 = auVar203._0_32_;
            fVar175 = (float)local_7a0._0_4_;
            fVar178 = (float)local_7a0._4_4_;
            fVar230 = fStack_798;
            fVar242 = fStack_794;
            fVar228 = fStack_790;
            fVar241 = fStack_78c;
            fVar243 = fStack_788;
            fVar244 = fStack_784;
            if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar197 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar197 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar197 >> 0x7f,0) != '\0') ||
                  (auVar203 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar197 >> 0xbf,0) != '\0') ||
                (auVar203 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar203[0x1f] < '\0') {
              auVar167 = vsubps_avx(auVar307,auVar332._0_32_);
              fVar284 = auVar332._0_4_ + local_3c0._0_4_ * auVar167._0_4_;
              fVar247 = auVar332._4_4_ + local_3c0._4_4_ * auVar167._4_4_;
              fVar337 = auVar332._8_4_ + local_3c0._8_4_ * auVar167._8_4_;
              fVar286 = auVar332._12_4_ + local_3c0._12_4_ * auVar167._12_4_;
              fVar338 = auVar332._16_4_ + local_3c0._16_4_ * auVar167._16_4_;
              fVar177 = auVar332._20_4_ + local_3c0._20_4_ * auVar167._20_4_;
              fVar339 = auVar332._24_4_ + local_3c0._24_4_ * auVar167._24_4_;
              fVar182 = auVar332._28_4_ + auVar167._28_4_;
              fVar282 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar220 = ZEXT3264(CONCAT428(fVar282,CONCAT424(fVar282,CONCAT420(fVar282,CONCAT416(
                                                  fVar282,CONCAT412(fVar282,CONCAT48(fVar282,
                                                  CONCAT44(fVar282,fVar282))))))));
              auVar108._4_4_ = (fVar247 + fVar247) * fVar282;
              auVar108._0_4_ = (fVar284 + fVar284) * fVar282;
              auVar108._8_4_ = (fVar337 + fVar337) * fVar282;
              auVar108._12_4_ = (fVar286 + fVar286) * fVar282;
              auVar108._16_4_ = (fVar338 + fVar338) * fVar282;
              auVar108._20_4_ = (fVar177 + fVar177) * fVar282;
              auVar108._24_4_ = (fVar339 + fVar339) * fVar282;
              auVar108._28_4_ = fVar182 + fVar182;
              auVar240 = ZEXT3264(local_620);
              auVar167 = vcmpps_avx(local_620,auVar108,6);
              auVar168 = ZEXT3264(auVar167);
              auVar276 = auVar197 & auVar167;
              if ((((((((auVar276 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar276 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar276 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar276 >> 0x7f,0) != '\0') ||
                    (auVar276 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar276 >> 0xbf,0) != '\0') ||
                  (auVar276 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar276[0x1f] < '\0') {
                local_440 = vandps_avx(auVar167,auVar197);
                auVar168 = ZEXT3264(local_440);
                auVar220 = ZEXT3264(CONCAT428(0xbf800000,
                                              CONCAT424(0xbf800000,
                                                        CONCAT420(0xbf800000,
                                                                  CONCAT416(0xbf800000,
                                                                            CONCAT412(0xbf800000,
                                                                                      CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
                local_4e0 = local_5a0._0_4_ + local_5a0._0_4_ + -1.0;
                fStack_4dc = local_5a0._4_4_ + local_5a0._4_4_ + -1.0;
                fStack_4d8 = local_5a0._8_4_ + local_5a0._8_4_ + -1.0;
                fStack_4d4 = local_5a0._12_4_ + local_5a0._12_4_ + -1.0;
                fStack_4d0 = local_5a0._16_4_ + local_5a0._16_4_ + -1.0;
                fStack_4cc = local_5a0._20_4_ + local_5a0._20_4_ + -1.0;
                fStack_4c8 = local_5a0._24_4_ + local_5a0._24_4_ + -1.0;
                fStack_4c4 = local_5a0._28_4_ + local_5a0._28_4_ + -1.0;
                local_4c0 = local_620;
                uStack_488 = uStack_928;
                local_480 = local_6b0;
                uStack_478 = uStack_6a8;
                local_470 = local_6c0;
                uStack_468 = uStack_6b8;
                local_460 = local_6d0;
                uStack_458 = uStack_6c8;
                auVar144 = (undefined1  [8])(context->scene->geometries).items[uVar14].ptr;
                local_5a0._4_4_ = fStack_4dc;
                local_5a0._0_4_ = local_4e0;
                fStack_598 = fStack_4d8;
                fStack_594 = fStack_4d4;
                fStack_590 = fStack_4d0;
                fStack_58c = fStack_4cc;
                fStack_588 = fStack_4c8;
                fStack_584 = fStack_4c4;
                if ((((Geometry *)auVar144)->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar189 = vshufps_avx(ZEXT416((uint)(float)(int)local_4a0),
                                         ZEXT416((uint)(float)(int)local_4a0),0);
                  local_420[0] = (auVar189._0_4_ + local_3c0._0_4_ + 0.0) * (float)local_e0._0_4_;
                  local_420[1] = (auVar189._4_4_ + local_3c0._4_4_ + 1.0) * (float)local_e0._4_4_;
                  local_420[2] = (auVar189._8_4_ + local_3c0._8_4_ + 2.0) * fStack_d8;
                  local_420[3] = (auVar189._12_4_ + local_3c0._12_4_ + 3.0) * fStack_d4;
                  fStack_410 = (auVar189._0_4_ + local_3c0._16_4_ + 4.0) * fStack_d0;
                  fStack_40c = (auVar189._4_4_ + local_3c0._20_4_ + 5.0) * fStack_cc;
                  fStack_408 = (auVar189._8_4_ + local_3c0._24_4_ + 6.0) * fStack_c8;
                  fStack_404 = auVar189._12_4_ + local_3c0._28_4_ + 7.0;
                  local_400 = CONCAT44(fStack_4dc,local_4e0);
                  uStack_3f8 = CONCAT44(fStack_4d4,fStack_4d8);
                  uStack_3f0 = CONCAT44(fStack_4cc,fStack_4d0);
                  uStack_3e8 = CONCAT44(fStack_4c4,fStack_4c8);
                  local_3e0 = local_620;
                  auVar198._8_4_ = 0x7f800000;
                  auVar198._0_8_ = 0x7f8000007f800000;
                  auVar198._12_4_ = 0x7f800000;
                  auVar198._16_4_ = 0x7f800000;
                  auVar198._20_4_ = 0x7f800000;
                  auVar198._24_4_ = 0x7f800000;
                  auVar198._28_4_ = 0x7f800000;
                  auVar197 = vblendvps_avx(auVar198,local_620,local_440);
                  auVar167 = vshufps_avx(auVar197,auVar197,0xb1);
                  auVar167 = vminps_avx(auVar197,auVar167);
                  auVar276 = vshufpd_avx(auVar167,auVar167,5);
                  auVar167 = vminps_avx(auVar167,auVar276);
                  auVar276 = vperm2f128_avx(auVar167,auVar167,1);
                  auVar167 = vminps_avx(auVar167,auVar276);
                  auVar167 = vcmpps_avx(auVar197,auVar167,0);
                  auVar276 = local_440 & auVar167;
                  auVar197 = local_440;
                  if ((((((((auVar276 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar276 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar276 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar276 >> 0x7f,0) != '\0') ||
                        (auVar276 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar276 >> 0xbf,0) != '\0') ||
                      (auVar276 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar276[0x1f] < '\0') {
                    auVar197 = vandps_avx(auVar167,local_440);
                  }
                  uVar138 = vmovmskps_avx(auVar197);
                  uVar141 = 0;
                  if (uVar138 != 0) {
                    for (; (uVar138 >> uVar141 & 1) == 0; uVar141 = uVar141 + 1) {
                    }
                  }
                  uVar139 = (ulong)uVar141;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (((Geometry *)auVar144)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar245 = local_420[uVar139];
                    auVar168 = ZEXT464((uint)fVar245);
                    fVar261 = 1.0 - fVar245;
                    fVar249 = fVar245 * 3.0;
                    auVar189 = ZEXT416((uint)((fVar261 * -2.0 * fVar245 + fVar245 * fVar245) * 0.5))
                    ;
                    auVar189 = vshufps_avx(auVar189,auVar189,0);
                    auVar215 = ZEXT416((uint)(((fVar261 + fVar261) * (fVar249 + 2.0) +
                                              fVar261 * fVar261 * -3.0) * 0.5));
                    auVar215 = vshufps_avx(auVar215,auVar215,0);
                    auVar216 = ZEXT416((uint)(((fVar245 + fVar245) * (fVar249 + -5.0) +
                                              fVar245 * fVar249) * 0.5));
                    auVar216 = vshufps_avx(auVar216,auVar216,0);
                    uVar141 = *(uint *)((long)&local_400 + uVar139 * 4);
                    auVar220 = ZEXT464(uVar141);
                    auVar234 = ZEXT416((uint)((fVar245 * (fVar261 + fVar261) - fVar261 * fVar261) *
                                             0.5));
                    auVar234 = vshufps_avx(auVar234,auVar234,0);
                    auVar190._0_4_ =
                         auVar234._0_4_ * fVar250 +
                         auVar216._0_4_ * (float)local_6b0._0_4_ +
                         auVar189._0_4_ * (float)local_6d0._0_4_ +
                         auVar215._0_4_ * (float)local_6c0._0_4_;
                    auVar190._4_4_ =
                         auVar234._4_4_ * fVar262 +
                         auVar216._4_4_ * (float)local_6b0._4_4_ +
                         auVar189._4_4_ * (float)local_6d0._4_4_ +
                         auVar215._4_4_ * (float)local_6c0._4_4_;
                    auVar190._8_4_ =
                         auVar234._8_4_ * auVar254._8_4_ +
                         auVar216._8_4_ * (float)uStack_6a8 +
                         auVar189._8_4_ * (float)uStack_6c8 + auVar215._8_4_ * (float)uStack_6b8;
                    auVar190._12_4_ =
                         auVar234._12_4_ * auVar254._12_4_ +
                         auVar216._12_4_ * uStack_6a8._4_4_ +
                         auVar189._12_4_ * uStack_6c8._4_4_ + auVar215._12_4_ * uStack_6b8._4_4_;
                    auVar240 = ZEXT464(*(uint *)(local_3e0 + uVar139 * 4));
                    *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3e0 + uVar139 * 4);
                    *(float *)(ray + k * 4 + 0x180) = auVar190._0_4_;
                    uVar310 = vextractps_avx(auVar190,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar310;
                    uVar310 = vextractps_avx(auVar190,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar310;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar245;
                    *(uint *)(ray + k * 4 + 0x200) = uVar141;
                    *(uint *)(ray + k * 4 + 0x220) = uVar15;
                    *(uint *)(ray + k * 4 + 0x240) = uVar14;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    auStack_7d0 = auVar292._16_16_;
                    _local_7e0 = _local_6b0;
                    auStack_850 = auVar277._16_16_;
                    _local_860 = _local_6c0;
                    _local_880 = _local_6d0;
                    local_760._16_8_ = *local_7f8;
                    local_760._0_16_ = *local_7f0;
                    local_760._24_8_ = local_7f8[1];
                    local_8c0 = auVar144;
                    _local_8e0 = auVar307;
                    _local_780 = *pauVar11;
                    local_660 = local_440;
                    _local_540 = *pauVar12;
                    local_500 = local_3c0;
                    local_49c = uVar16;
                    local_490 = auVar254._0_8_;
                    do {
                      uVar141 = *(uint *)(ray + k * 4 + 0x100);
                      local_1e0 = local_420[uVar139];
                      local_1c0 = *(undefined4 *)((long)&local_400 + uVar139 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_3e0 + uVar139 * 4);
                      fVar204 = 1.0 - local_1e0;
                      fVar183 = local_1e0 * 3.0;
                      auVar189 = ZEXT416((uint)((fVar204 * -2.0 * local_1e0 + local_1e0 * local_1e0)
                                               * 0.5));
                      auVar189 = vshufps_avx(auVar189,auVar189,0);
                      auVar215 = ZEXT416((uint)(((fVar204 + fVar204) * (fVar183 + 2.0) +
                                                fVar204 * fVar204 * -3.0) * 0.5));
                      auVar215 = vshufps_avx(auVar215,auVar215,0);
                      auVar216 = ZEXT416((uint)(((local_1e0 + local_1e0) * (fVar183 + -5.0) +
                                                local_1e0 * fVar183) * 0.5));
                      auVar216 = vshufps_avx(auVar216,auVar216,0);
                      local_910.context = context->user;
                      auVar234 = ZEXT416((uint)((local_1e0 * (fVar204 + fVar204) - fVar204 * fVar204
                                                ) * 0.5));
                      auVar234 = vshufps_avx(auVar234,auVar234,0);
                      auVar217._0_4_ =
                           auVar234._0_4_ * fVar250 +
                           auVar216._0_4_ * (float)local_7e0._0_4_ +
                           auVar189._0_4_ * (float)local_880._0_4_ +
                           auVar215._0_4_ * (float)local_860._0_4_;
                      auVar217._4_4_ =
                           auVar234._4_4_ * fVar262 +
                           auVar216._4_4_ * (float)local_7e0._4_4_ +
                           auVar189._4_4_ * (float)local_880._4_4_ +
                           auVar215._4_4_ * (float)local_860._4_4_;
                      auVar217._8_4_ =
                           auVar234._8_4_ * auVar254._8_4_ +
                           auVar216._8_4_ * fStack_7d8 +
                           auVar189._8_4_ * (float)uStack_878 + auVar215._8_4_ * fStack_858;
                      auVar217._12_4_ =
                           auVar234._12_4_ * auVar254._12_4_ +
                           auVar216._12_4_ * fStack_7d4 +
                           auVar189._12_4_ * uStack_878._4_4_ + auVar215._12_4_ * fStack_854;
                      auStack_230 = vshufps_avx(auVar217,auVar217,0);
                      local_240[0] = (RTCHitN)auStack_230[0];
                      local_240[1] = (RTCHitN)auStack_230[1];
                      local_240[2] = (RTCHitN)auStack_230[2];
                      local_240[3] = (RTCHitN)auStack_230[3];
                      local_240[4] = (RTCHitN)auStack_230[4];
                      local_240[5] = (RTCHitN)auStack_230[5];
                      local_240[6] = (RTCHitN)auStack_230[6];
                      local_240[7] = (RTCHitN)auStack_230[7];
                      local_240[8] = (RTCHitN)auStack_230[8];
                      local_240[9] = (RTCHitN)auStack_230[9];
                      local_240[10] = (RTCHitN)auStack_230[10];
                      local_240[0xb] = (RTCHitN)auStack_230[0xb];
                      local_240[0xc] = (RTCHitN)auStack_230[0xc];
                      local_240[0xd] = (RTCHitN)auStack_230[0xd];
                      local_240[0xe] = (RTCHitN)auStack_230[0xe];
                      local_240[0xf] = (RTCHitN)auStack_230[0xf];
                      auStack_210 = vshufps_avx(auVar217,auVar217,0x55);
                      auVar240 = ZEXT1664(auStack_210);
                      local_220 = auStack_210;
                      auStack_1f0 = vshufps_avx(auVar217,auVar217,0xaa);
                      local_200 = auStack_1f0;
                      fStack_1dc = local_1e0;
                      fStack_1d8 = local_1e0;
                      fStack_1d4 = local_1e0;
                      fStack_1d0 = local_1e0;
                      fStack_1cc = local_1e0;
                      fStack_1c8 = local_1e0;
                      fStack_1c4 = local_1e0;
                      uStack_1bc = local_1c0;
                      uStack_1b8 = local_1c0;
                      uStack_1b4 = local_1c0;
                      uStack_1b0 = local_1c0;
                      uStack_1ac = local_1c0;
                      uStack_1a8 = local_1c0;
                      uStack_1a4 = local_1c0;
                      local_1a0 = local_120._0_8_;
                      uStack_198 = local_120._8_8_;
                      uStack_190 = local_120._16_8_;
                      uStack_188 = local_120._24_8_;
                      local_180 = local_100._0_8_;
                      uStack_178 = local_100._8_8_;
                      uStack_170 = local_100._16_8_;
                      uStack_168 = local_100._24_8_;
                      auVar197 = vcmpps_avx(auVar349._0_32_,auVar349._0_32_,0xf);
                      local_7e8[1] = auVar197;
                      *local_7e8 = auVar197;
                      local_160 = (local_910.context)->instID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_140 = (local_910.context)->instPrimID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_820 = local_760._0_8_;
                      uStack_818 = local_760._8_8_;
                      uStack_810 = local_760._16_8_;
                      uStack_808 = local_760._24_8_;
                      local_910.valid = (int *)&local_820;
                      local_910.geometryUserPtr = ((Geometry *)auVar144)->userPtr;
                      local_910.hit = local_240;
                      local_910.N = 8;
                      local_910.ray = (RTCRayN *)ray;
                      if (((Geometry *)auVar144)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar240 = ZEXT1664(auStack_210);
                        local_7c0 = auVar197;
                        (*((Geometry *)auVar144)->intersectionFilterN)(&local_910);
                        auVar349 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar144 = local_8c0;
                        auVar197 = local_7c0;
                        fVar175 = (float)local_7a0._0_4_;
                        fVar178 = (float)local_7a0._4_4_;
                        fVar230 = fStack_798;
                        fVar242 = fStack_794;
                        fVar228 = fStack_790;
                        fVar241 = fStack_78c;
                        fVar243 = fStack_788;
                        fVar244 = fStack_784;
                      }
                      auVar120._8_8_ = uStack_818;
                      auVar120._0_8_ = local_820;
                      auVar189 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar120);
                      auVar124._8_8_ = uStack_808;
                      auVar124._0_8_ = uStack_810;
                      auVar215 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar124);
                      auVar161._16_16_ = auVar215;
                      auVar161._0_16_ = auVar189;
                      auVar167 = auVar197 & ~auVar161;
                      if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar167 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar167 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar167 >> 0x7f,0) == '\0') &&
                            (auVar167 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar167 >> 0xbf,0) == '\0') &&
                          (auVar167 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar167[0x1f]) {
                        auVar162._0_4_ = auVar189._0_4_ ^ auVar197._0_4_;
                        auVar162._4_4_ = auVar189._4_4_ ^ auVar197._4_4_;
                        auVar162._8_4_ = auVar189._8_4_ ^ auVar197._8_4_;
                        auVar162._12_4_ = auVar189._12_4_ ^ auVar197._12_4_;
                        auVar162._16_4_ = auVar215._0_4_ ^ auVar197._16_4_;
                        auVar162._20_4_ = auVar215._4_4_ ^ auVar197._20_4_;
                        auVar162._24_4_ = auVar215._8_4_ ^ auVar197._24_4_;
                        auVar162._28_4_ = auVar215._12_4_ ^ auVar197._28_4_;
                        fVar366 = (float)local_8a0._0_4_;
                        fVar370 = (float)local_8a0._4_4_;
                        fVar371 = fStack_898;
                        fVar372 = fStack_894;
                        fVar183 = fStack_890;
                        fVar204 = fStack_88c;
                        fVar205 = fStack_888;
                        fVar207 = fStack_884;
                      }
                      else {
                        p_Var20 = context->args->filter;
                        if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((((Geometry *)auVar144)->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar240 = ZEXT1664(auVar240._0_16_);
                          local_7c0 = auVar197;
                          (*p_Var20)(&local_910);
                          auVar349 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar144 = local_8c0;
                          auVar197 = local_7c0;
                          fVar175 = (float)local_7a0._0_4_;
                          fVar178 = (float)local_7a0._4_4_;
                          fVar230 = fStack_798;
                          fVar242 = fStack_794;
                          fVar228 = fStack_790;
                          fVar241 = fStack_78c;
                          fVar243 = fStack_788;
                          fVar244 = fStack_784;
                        }
                        auVar121._8_8_ = uStack_818;
                        auVar121._0_8_ = local_820;
                        auVar189 = vpcmpeqd_avx((undefined1  [16])0x0,auVar121);
                        auVar125._8_8_ = uStack_808;
                        auVar125._0_8_ = uStack_810;
                        auVar215 = vpcmpeqd_avx((undefined1  [16])0x0,auVar125);
                        auVar199._16_16_ = auVar215;
                        auVar199._0_16_ = auVar189;
                        auVar162._0_4_ = auVar189._0_4_ ^ auVar197._0_4_;
                        auVar162._4_4_ = auVar189._4_4_ ^ auVar197._4_4_;
                        auVar162._8_4_ = auVar189._8_4_ ^ auVar197._8_4_;
                        auVar162._12_4_ = auVar189._12_4_ ^ auVar197._12_4_;
                        auVar162._16_4_ = auVar215._0_4_ ^ auVar197._16_4_;
                        auVar162._20_4_ = auVar215._4_4_ ^ auVar197._20_4_;
                        auVar162._24_4_ = auVar215._8_4_ ^ auVar197._24_4_;
                        auVar162._28_4_ = auVar215._12_4_ ^ auVar197._28_4_;
                        auVar197 = auVar197 & ~auVar199;
                        fVar366 = (float)local_8a0._0_4_;
                        fVar370 = (float)local_8a0._4_4_;
                        fVar371 = fStack_898;
                        fVar372 = fStack_894;
                        fVar183 = fStack_890;
                        fVar204 = fStack_88c;
                        fVar205 = fStack_888;
                        fVar207 = fStack_884;
                        if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar197 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar197 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar197 >> 0x7f,0) != '\0')
                              || (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar197 >> 0xbf,0) != '\0') ||
                            (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar197[0x1f] < '\0') {
                          auVar197 = vmaskmovps_avx(auVar162,*(undefined1 (*) [32])local_910.hit);
                          *(undefined1 (*) [32])(local_910.ray + 0x180) = auVar197;
                          auVar197 = vmaskmovps_avx(auVar162,*(undefined1 (*) [32])
                                                              (local_910.hit + 0x20));
                          *(undefined1 (*) [32])(local_910.ray + 0x1a0) = auVar197;
                          auVar197 = vmaskmovps_avx(auVar162,*(undefined1 (*) [32])
                                                              (local_910.hit + 0x40));
                          *(undefined1 (*) [32])(local_910.ray + 0x1c0) = auVar197;
                          auVar197 = vmaskmovps_avx(auVar162,*(undefined1 (*) [32])
                                                              (local_910.hit + 0x60));
                          *(undefined1 (*) [32])(local_910.ray + 0x1e0) = auVar197;
                          auVar197 = vmaskmovps_avx(auVar162,*(undefined1 (*) [32])
                                                              (local_910.hit + 0x80));
                          *(undefined1 (*) [32])(local_910.ray + 0x200) = auVar197;
                          auVar197 = vmaskmovps_avx(auVar162,*(undefined1 (*) [32])
                                                              (local_910.hit + 0xa0));
                          *(undefined1 (*) [32])(local_910.ray + 0x220) = auVar197;
                          auVar197 = vmaskmovps_avx(auVar162,*(undefined1 (*) [32])
                                                              (local_910.hit + 0xc0));
                          *(undefined1 (*) [32])(local_910.ray + 0x240) = auVar197;
                          auVar197 = vmaskmovps_avx(auVar162,*(undefined1 (*) [32])
                                                              (local_910.hit + 0xe0));
                          *(undefined1 (*) [32])(local_910.ray + 0x260) = auVar197;
                          auVar197 = vmaskmovps_avx(auVar162,*(undefined1 (*) [32])
                                                              (local_910.hit + 0x100));
                          *(undefined1 (*) [32])(local_910.ray + 0x280) = auVar197;
                        }
                      }
                      auVar197 = local_620;
                      auVar332 = ZEXT464(uVar141);
                      if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar162 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar162 >> 0x7f,0) == '\0') &&
                            (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar162 >> 0xbf,0) == '\0') &&
                          (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar162[0x1f]) {
                        *(uint *)(ray + k * 4 + 0x100) = uVar141;
                      }
                      *(undefined4 *)(local_660 + uVar139 * 4) = 0;
                      uVar310 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar163._4_4_ = uVar310;
                      auVar163._0_4_ = uVar310;
                      auVar163._8_4_ = uVar310;
                      auVar163._12_4_ = uVar310;
                      auVar163._16_4_ = uVar310;
                      auVar163._20_4_ = uVar310;
                      auVar163._24_4_ = uVar310;
                      auVar163._28_4_ = uVar310;
                      auVar167 = vcmpps_avx(auVar197,auVar163,2);
                      auVar197 = vandps_avx(auVar167,local_660);
                      auVar168 = ZEXT3264(auVar197);
                      auVar167 = local_660 & auVar167;
                      bVar115 = (auVar167 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar116 = (auVar167 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar114 = (auVar167 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar113 = SUB321(auVar167 >> 0x7f,0) != '\0';
                      bVar112 = (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar111 = SUB321(auVar167 >> 0xbf,0) != '\0';
                      bVar110 = (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar109 = auVar167[0x1f] < '\0';
                      if (((((((bVar115 || bVar116) || bVar114) || bVar113) || bVar112) || bVar111)
                          || bVar110) || bVar109) {
                        auVar200._8_4_ = 0x7f800000;
                        auVar200._0_8_ = 0x7f8000007f800000;
                        auVar200._12_4_ = 0x7f800000;
                        auVar200._16_4_ = 0x7f800000;
                        auVar200._20_4_ = 0x7f800000;
                        auVar200._24_4_ = 0x7f800000;
                        auVar200._28_4_ = 0x7f800000;
                        auVar167 = vblendvps_avx(auVar200,local_620,auVar197);
                        auVar276 = vshufps_avx(auVar167,auVar167,0xb1);
                        auVar276 = vminps_avx(auVar167,auVar276);
                        auVar156 = vshufpd_avx(auVar276,auVar276,5);
                        auVar276 = vminps_avx(auVar276,auVar156);
                        auVar156 = vperm2f128_avx(auVar276,auVar276,1);
                        auVar240 = ZEXT3264(auVar156);
                        local_660 = vminps_avx(auVar276,auVar156);
                        auVar167 = vcmpps_avx(auVar167,local_660,0);
                        auVar276 = auVar197 & auVar167;
                        if ((((((((auVar276 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar276 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar276 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar276 >> 0x7f,0) != '\0')
                              || (auVar276 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar276 >> 0xbf,0) != '\0') ||
                            (auVar276 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar276[0x1f] < '\0') {
                          auVar167 = vandps_avx(auVar167,auVar197);
                          auVar168 = ZEXT3264(auVar167);
                        }
                        uVar138 = vmovmskps_avx(auVar168._0_32_);
                        uVar141 = 0;
                        if (uVar138 != 0) {
                          for (; (uVar138 >> uVar141 & 1) == 0; uVar141 = uVar141 + 1) {
                          }
                        }
                        uVar139 = (ulong)uVar141;
                      }
                      auVar220 = ZEXT3264(local_660);
                      local_660 = auVar197;
                    } while (((((((bVar115 || bVar116) || bVar114) || bVar113) || bVar112) ||
                              bVar111) || bVar110) || bVar109);
                  }
                }
                fVar245 = (float)local_720._0_4_;
                fVar249 = (float)local_720._4_4_;
                fVar261 = fStack_718;
                fVar264 = fStack_714;
                fVar266 = fStack_710;
                fVar269 = fStack_70c;
                fVar280 = fStack_708;
              }
            }
          }
          lVar142 = lVar142 + 8;
          fVar251 = (float)local_740._0_4_;
          fVar263 = (float)local_740._4_4_;
          fVar265 = fStack_738;
          fVar267 = fStack_734;
          fVar294 = fStack_730;
          fVar295 = fStack_72c;
          fVar296 = fStack_728;
        } while ((int)lVar142 < (int)uVar16);
      }
      uVar310 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar150._4_4_ = uVar310;
      auVar150._0_4_ = uVar310;
      auVar150._8_4_ = uVar310;
      auVar150._12_4_ = uVar310;
      auVar189 = vcmpps_avx(local_2f0,auVar150,2);
      uVar141 = vmovmskps_avx(auVar189);
      uVar136 = uVar136 & uVar136 + 0xf & uVar141;
    } while (uVar136 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }